

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx512_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  ulong uVar26;
  undefined8 uVar27;
  ushort uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [40];
  undefined1 auVar277 [48];
  undefined1 auVar278 [56];
  undefined1 auVar279 [40];
  undefined1 auVar280 [48];
  undefined1 auVar281 [56];
  undefined1 auVar282 [24];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  float fVar286;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar287 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  __m128 _outp_5;
  __m128 _b_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m256 _p_4;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_3;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m256 _p_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_rpow op;
  __m512 pow2n_3;
  __m512 y_7;
  __mmask16 mask_7;
  __m512 one_7;
  __m512i imm0_7;
  __m512 fx_3;
  __m512 tmp_7;
  __m512 y_6;
  __m512 z_3;
  __m512 tmp_6;
  __mmask16 mask_6;
  __m512 e_3;
  __mmask16 invalid_mask_3;
  __m512 one_6;
  __m512i imm0_6;
  __m512 pow2n_1;
  __m512 y_3;
  __mmask16 mask_3;
  __m512 one_3;
  __m512i imm0_3;
  __m512 fx_1;
  __m512 tmp_3;
  __m512 y_2;
  __m512 z_1;
  __m512 tmp_2;
  __mmask16 mask_2;
  __m512 e_1;
  __mmask16 invalid_mask_1;
  __m512 one_2;
  __m512i imm0_2;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx;
  __m512 tmp_1;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 pow2n_4;
  __m256 y_9;
  __m256 mask_9;
  __m256 one_9;
  __m256i imm0_9;
  __m256 fx_4;
  __m256 tmp_9;
  __m256 y_8;
  __m256 z_4;
  __m256 tmp_8;
  __m256 mask_8;
  __m256 e_4;
  __m256 invalid_mask_4;
  __m256 one_8;
  __m256i imm0_8;
  __m256 pow2n_2;
  __m256 y_5;
  __m256 mask_5;
  __m256 one_5;
  __m256i imm0_5;
  __m256 fx_2;
  __m256 tmp_5;
  __m256 y_4;
  __m256 z_2;
  __m256 tmp_4;
  __m256 mask_4;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_4;
  __m256i imm0_4;
  v4sf pow2n_5;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_11;
  v4si emm0_1;
  v4sf fx_5;
  v4sf tmp_11;
  v4sf y_10;
  v4sf z_5;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_5;
  v4sf invalid_mask_5;
  v4sf one_10;
  v4si emm0;
  int local_a864;
  int local_a6c4;
  int local_a600;
  undefined8 *local_a5f0;
  uint *local_a5e8;
  undefined1 (*local_a5e0) [64];
  undefined8 uStack_a210;
  undefined8 uStack_a208;
  undefined8 uStack_a1d0;
  undefined8 uStack_a1c8;
  undefined8 uStack_a190;
  undefined8 uStack_a188;
  undefined1 local_a000 [8];
  undefined8 uStack_9ff8;
  undefined8 uStack_9ff0;
  undefined8 uStack_9fe8;
  undefined8 uStack_9fe0;
  undefined8 uStack_9fd8;
  undefined8 uStack_9fd0;
  undefined8 uStack_9fc8;
  undefined1 local_9f00 [16];
  undefined8 uStack_9ef0;
  undefined8 uStack_9ee8;
  undefined8 uStack_9ee0;
  undefined8 uStack_9ed8;
  undefined8 uStack_9ed0;
  undefined8 uStack_9ec8;
  undefined1 local_9bc0 [256];
  undefined1 local_9ac0 [16];
  undefined8 uStack_9ab0;
  undefined8 uStack_9aa8;
  undefined8 uStack_9aa0;
  undefined8 uStack_9a98;
  undefined8 uStack_9a90;
  undefined8 uStack_9a88;
  undefined1 local_99c0 [16];
  undefined8 uStack_99b0;
  undefined8 uStack_99a8;
  undefined8 uStack_99a0;
  undefined8 uStack_9998;
  undefined8 uStack_9990;
  undefined8 uStack_9988;
  int local_8800;
  int iStack_87fc;
  int iStack_87f8;
  int iStack_87f4;
  int iStack_87f0;
  int iStack_87ec;
  int iStack_87e8;
  int iStack_87e4;
  int iStack_87e0;
  int iStack_87dc;
  int iStack_87d8;
  int iStack_87d4;
  int iStack_87d0;
  int iStack_87cc;
  int iStack_87c8;
  int iStack_87c4;
  int local_8680;
  int iStack_867c;
  int iStack_8678;
  int iStack_8674;
  int iStack_8670;
  int iStack_866c;
  int iStack_8668;
  int iStack_8664;
  int iStack_8660;
  int iStack_865c;
  int iStack_8658;
  int iStack_8654;
  int iStack_8650;
  int iStack_864c;
  int iStack_8648;
  int iStack_8644;
  int local_7dc0;
  int iStack_7dbc;
  int iStack_7db8;
  int iStack_7db4;
  int iStack_7db0;
  int iStack_7dac;
  int iStack_7da8;
  int iStack_7da4;
  int iStack_7da0;
  int iStack_7d9c;
  int iStack_7d98;
  int iStack_7d94;
  int iStack_7d90;
  int iStack_7d8c;
  int iStack_7d88;
  int iStack_7d84;
  undefined1 local_7b80 [8];
  undefined8 uStack_7b78;
  undefined8 uStack_7b70;
  undefined8 uStack_7b68;
  undefined8 uStack_7b60;
  undefined8 uStack_7b58;
  undefined8 uStack_7b50;
  undefined8 uStack_7b48;
  undefined1 local_7a80 [16];
  undefined8 uStack_7a70;
  undefined8 uStack_7a68;
  undefined8 uStack_7a60;
  undefined8 uStack_7a58;
  undefined8 uStack_7a50;
  undefined8 uStack_7a48;
  undefined1 local_7740 [256];
  undefined1 local_7640 [16];
  undefined8 uStack_7630;
  undefined8 uStack_7628;
  undefined8 uStack_7620;
  undefined8 uStack_7618;
  undefined8 uStack_7610;
  undefined8 uStack_7608;
  undefined1 local_7540 [16];
  undefined8 uStack_7530;
  undefined8 uStack_7528;
  undefined8 uStack_7520;
  undefined8 uStack_7518;
  undefined8 uStack_7510;
  undefined8 uStack_7508;
  int local_6380;
  int iStack_637c;
  int iStack_6378;
  int iStack_6374;
  int iStack_6370;
  int iStack_636c;
  int iStack_6368;
  int iStack_6364;
  int iStack_6360;
  int iStack_635c;
  int iStack_6358;
  int iStack_6354;
  int iStack_6350;
  int iStack_634c;
  int iStack_6348;
  int iStack_6344;
  int local_6200;
  int iStack_61fc;
  int iStack_61f8;
  int iStack_61f4;
  int iStack_61f0;
  int iStack_61ec;
  int iStack_61e8;
  int iStack_61e4;
  int iStack_61e0;
  int iStack_61dc;
  int iStack_61d8;
  int iStack_61d4;
  int iStack_61d0;
  int iStack_61cc;
  int iStack_61c8;
  int iStack_61c4;
  int local_5940;
  int iStack_593c;
  int iStack_5938;
  int iStack_5934;
  int iStack_5930;
  int iStack_592c;
  int iStack_5928;
  int iStack_5924;
  int iStack_5920;
  int iStack_591c;
  int iStack_5918;
  int iStack_5914;
  int iStack_5910;
  int iStack_590c;
  int iStack_5908;
  int iStack_5904;
  undefined1 local_5700 [8];
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined8 uStack_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  undefined1 local_5600 [16];
  undefined8 uStack_55f0;
  undefined8 uStack_55e8;
  undefined8 uStack_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  undefined1 local_52c0 [256];
  undefined1 local_51c0 [16];
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 uStack_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  undefined1 local_50c0 [16];
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 uStack_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  int local_3f00;
  int iStack_3efc;
  int iStack_3ef8;
  int iStack_3ef4;
  int iStack_3ef0;
  int iStack_3eec;
  int iStack_3ee8;
  int iStack_3ee4;
  int iStack_3ee0;
  int iStack_3edc;
  int iStack_3ed8;
  int iStack_3ed4;
  int iStack_3ed0;
  int iStack_3ecc;
  int iStack_3ec8;
  int iStack_3ec4;
  int local_3d80;
  int iStack_3d7c;
  int iStack_3d78;
  int iStack_3d74;
  int iStack_3d70;
  int iStack_3d6c;
  int iStack_3d68;
  int iStack_3d64;
  int iStack_3d60;
  int iStack_3d5c;
  int iStack_3d58;
  int iStack_3d54;
  int iStack_3d50;
  int iStack_3d4c;
  int iStack_3d48;
  int iStack_3d44;
  int local_34c0;
  int iStack_34bc;
  int iStack_34b8;
  int iStack_34b4;
  int iStack_34b0;
  int iStack_34ac;
  int iStack_34a8;
  int iStack_34a4;
  int iStack_34a0;
  int iStack_349c;
  int iStack_3498;
  int iStack_3494;
  int iStack_3490;
  int iStack_348c;
  int iStack_3488;
  int iStack_3484;
  float local_3380;
  float fStack_337c;
  float fStack_3378;
  float fStack_3374;
  float fStack_3370;
  float fStack_336c;
  float fStack_3368;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  float fStack_3350;
  float fStack_334c;
  float fStack_3348;
  undefined4 uStack_3344;
  undefined1 local_3320 [8];
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined1 local_32c0 [16];
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined1 local_3280 [8];
  float fStack_3278;
  float fStack_3274;
  undefined1 local_3260 [8];
  float fStack_3258;
  float fStack_3254;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  float local_3220;
  float fStack_321c;
  float fStack_3218;
  float fStack_3214;
  float local_31c0;
  float fStack_31bc;
  float fStack_31b8;
  float fStack_31b4;
  float fStack_31b0;
  float fStack_31ac;
  float fStack_31a8;
  float local_3160;
  float fStack_315c;
  float fStack_3158;
  float fStack_3154;
  undefined1 local_30c0 [8];
  float fStack_30b8;
  float fStack_30b4;
  float fStack_30b0;
  float fStack_30ac;
  float fStack_30a8;
  undefined4 uStack_30a4;
  undefined1 local_3040 [8];
  float fStack_3038;
  float fStack_3034;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined1 local_2fc0 [8];
  float fStack_2fb8;
  float fStack_2fb4;
  float fStack_2fb0;
  float fStack_2fac;
  float fStack_2fa8;
  float fStack_2fa4;
  float local_2fa0;
  float fStack_2f9c;
  float fStack_2f98;
  float fStack_2f94;
  float local_2f60;
  float fStack_2f5c;
  float fStack_2f58;
  float fStack_2f54;
  float fStack_2f50;
  float fStack_2f4c;
  float fStack_2f48;
  float fStack_2f44;
  float local_2f40;
  float fStack_2f3c;
  float fStack_2f38;
  float fStack_2f34;
  float fStack_2f30;
  float fStack_2f2c;
  float fStack_2f28;
  float fStack_2f24;
  float local_2f00;
  float fStack_2efc;
  float fStack_2ef8;
  float fStack_2ef4;
  float fStack_2ef0;
  float fStack_2eec;
  float fStack_2ee8;
  float fStack_2ee4;
  float local_2e00;
  float fStack_2dfc;
  float fStack_2df8;
  float fStack_2df4;
  float local_2a20;
  float fStack_2a1c;
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  float fStack_2a04;
  float local_1f40;
  float fStack_1f3c;
  float fStack_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  float fStack_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  undefined4 uStack_1f04;
  undefined1 local_1ee0 [8];
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1e80 [16];
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e40 [8];
  float fStack_1e38;
  float fStack_1e34;
  undefined1 local_1e20 [8];
  float fStack_1e18;
  float fStack_1e14;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  undefined1 local_1c80 [8];
  float fStack_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  undefined4 uStack_1c64;
  undefined1 local_1c00 [8];
  float fStack_1bf8;
  float fStack_1bf4;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined1 local_1b80 [8];
  float fStack_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  float fStack_1b68;
  float fStack_1b64;
  float local_1b60;
  float fStack_1b5c;
  float fStack_1b58;
  float fStack_1b54;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  float local_1b00;
  float fStack_1afc;
  float fStack_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  float local_1ac0;
  float fStack_1abc;
  float fStack_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa8;
  float fStack_1aa4;
  float local_19c0;
  float fStack_19bc;
  float fStack_19b8;
  float fStack_19b4;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float local_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 local_af0 [8];
  undefined8 uStack_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined8 local_a90;
  undefined8 uStack_a88;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  
  local_a5f0 = in_RDX;
  local_a5e8 = in_RSI;
  local_a5e0 = in_RDI;
  if (in_R8D == 0x10) {
    for (local_a600 = 0; local_a600 < in_ECX; local_a600 = local_a600 + 1) {
      auVar283 = vbroadcastss_avx512f(ZEXT416(*local_a5e8));
      uVar26 = vcmpps_avx512f(auVar283,ZEXT1664(ZEXT816(0)),2);
      auVar134._8_4_ = 0x800000;
      auVar134._12_4_ = 0x800000;
      auVar134._0_4_ = 0x800000;
      auVar134._4_4_ = 0x800000;
      auVar134._16_4_ = 0x800000;
      auVar134._20_4_ = 0x800000;
      auVar134._24_4_ = 0x800000;
      auVar134._28_4_ = 0x800000;
      auVar134._32_4_ = 0x800000;
      auVar134._36_4_ = 0x800000;
      auVar134._40_4_ = 0x800000;
      auVar134._44_4_ = 0x800000;
      auVar134._48_4_ = 0x800000;
      auVar134._52_4_ = 0x800000;
      auVar134._56_4_ = 0x800000;
      auVar134._60_4_ = 0x800000;
      auVar284 = vmaxps_avx512f(auVar283,auVar134);
      auVar283 = vmovdqa64_avx512f(auVar284);
      auVar283 = vpsrld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar172._8_4_ = -0x7f800001;
      auVar172._12_4_ = -0x7f800001;
      auVar172._0_4_ = -0x7f800001;
      auVar172._4_4_ = -0x7f800001;
      auVar172._16_4_ = -0x7f800001;
      auVar172._20_4_ = -0x7f800001;
      auVar172._24_4_ = -0x7f800001;
      auVar172._28_4_ = -0x7f800001;
      auVar172._32_4_ = -0x7f800001;
      auVar172._36_4_ = -0x7f800001;
      auVar172._40_4_ = -0x7f800001;
      auVar172._44_4_ = -0x7f800001;
      auVar172._48_4_ = -0x7f800001;
      auVar172._52_4_ = -0x7f800001;
      auVar172._56_4_ = -0x7f800001;
      auVar172._60_4_ = -0x7f800001;
      auVar285 = vmovdqa64_avx512f(auVar172);
      auVar284 = vpandd_avx512f(auVar284,auVar285);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar173._8_4_ = 0.5;
      auVar173._12_4_ = 0.5;
      auVar173._0_4_ = 0.5;
      auVar173._4_4_ = 0.5;
      auVar173._16_4_ = 0.5;
      auVar173._20_4_ = 0.5;
      auVar173._24_4_ = 0.5;
      auVar173._28_4_ = 0.5;
      auVar173._32_4_ = 0.5;
      auVar173._36_4_ = 0.5;
      auVar173._40_4_ = 0.5;
      auVar173._44_4_ = 0.5;
      auVar173._48_4_ = 0.5;
      auVar173._52_4_ = 0.5;
      auVar173._56_4_ = 0.5;
      auVar173._60_4_ = 0.5;
      auVar285 = vmovdqa64_avx512f(auVar173);
      auVar284 = vpord_avx512f(auVar284,auVar285);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar285 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar285 = vmovdqa64_avx512f(auVar285);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar285 = vmovdqa64_avx512f(auVar285);
      auVar283 = vpsubd_avx512f(auVar283,auVar285);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vcvtdq2ps_avx512f(auVar283);
      auVar129._8_4_ = 1.0;
      auVar129._12_4_ = 1.0;
      auVar129._0_4_ = 1.0;
      auVar129._4_4_ = 1.0;
      auVar129._16_4_ = 1.0;
      auVar129._20_4_ = 1.0;
      auVar129._24_4_ = 1.0;
      auVar129._28_4_ = 1.0;
      auVar129._32_4_ = 1.0;
      auVar129._36_4_ = 1.0;
      auVar129._40_4_ = 1.0;
      auVar129._44_4_ = 1.0;
      auVar129._48_4_ = 1.0;
      auVar129._52_4_ = 1.0;
      auVar129._56_4_ = 1.0;
      auVar129._60_4_ = 1.0;
      auVar283 = vaddps_avx512f(auVar283,auVar129);
      uVar27 = vcmpps_avx512f(auVar284,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar28 = (ushort)uVar27;
      auVar130._8_4_ = 1.0;
      auVar130._12_4_ = 1.0;
      auVar130._0_4_ = 1.0;
      auVar130._4_4_ = 1.0;
      auVar130._16_4_ = 1.0;
      auVar130._20_4_ = 1.0;
      auVar130._24_4_ = 1.0;
      auVar130._28_4_ = 1.0;
      auVar130._32_4_ = 1.0;
      auVar130._36_4_ = 1.0;
      auVar130._40_4_ = 1.0;
      auVar130._44_4_ = 1.0;
      auVar130._48_4_ = 1.0;
      auVar130._52_4_ = 1.0;
      auVar130._56_4_ = 1.0;
      auVar130._60_4_ = 1.0;
      auVar285 = vsubps_avx512f(auVar284,auVar130);
      auVar164._8_4_ = 1.0;
      auVar164._12_4_ = 1.0;
      auVar164._0_4_ = 1.0;
      auVar164._4_4_ = 1.0;
      auVar164._16_4_ = 1.0;
      auVar164._20_4_ = 1.0;
      auVar164._24_4_ = 1.0;
      auVar164._28_4_ = 1.0;
      auVar164._32_4_ = 1.0;
      auVar164._36_4_ = 1.0;
      auVar164._40_4_ = 1.0;
      auVar164._44_4_ = 1.0;
      auVar164._48_4_ = 1.0;
      auVar164._52_4_ = 1.0;
      auVar164._56_4_ = 1.0;
      auVar164._60_4_ = 1.0;
      local_3f00 = auVar283._0_4_;
      iStack_3efc = auVar283._4_4_;
      iStack_3ef8 = auVar283._8_4_;
      iStack_3ef4 = auVar283._12_4_;
      iStack_3ef0 = auVar283._16_4_;
      iStack_3eec = auVar283._20_4_;
      iStack_3ee8 = auVar283._24_4_;
      iStack_3ee4 = auVar283._28_4_;
      iStack_3ee0 = auVar283._32_4_;
      iStack_3edc = auVar283._36_4_;
      iStack_3ed8 = auVar283._40_4_;
      iStack_3ed4 = auVar283._44_4_;
      iStack_3ed0 = auVar283._48_4_;
      iStack_3ecc = auVar283._52_4_;
      iStack_3ec8 = auVar283._56_4_;
      iStack_3ec4 = auVar283._60_4_;
      auVar283 = vsubps_avx512f(auVar283,auVar164);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar27 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_51c0._4_4_ = (uint)bVar5 * auVar283._4_4_ | (uint)!bVar5 * iStack_3efc;
      local_51c0._0_4_ = (uint)bVar4 * auVar283._0_4_ | (uint)!bVar4 * local_3f00;
      local_51c0._8_4_ = (uint)bVar6 * auVar283._8_4_ | (uint)!bVar6 * iStack_3ef8;
      local_51c0._12_4_ = (uint)bVar7 * auVar283._12_4_ | (uint)!bVar7 * iStack_3ef4;
      uStack_51b0._0_4_ = (uint)bVar8 * auVar283._16_4_ | (uint)!bVar8 * iStack_3ef0;
      uStack_51b0._4_4_ = (uint)bVar9 * auVar283._20_4_ | (uint)!bVar9 * iStack_3eec;
      uStack_51a8._0_4_ = (uint)bVar10 * auVar283._24_4_ | (uint)!bVar10 * iStack_3ee8;
      uStack_51a8._4_4_ = (uint)bVar11 * auVar283._28_4_ | (uint)!bVar11 * iStack_3ee4;
      auVar19 = _local_51c0;
      uStack_51a0._0_4_ =
           (uint)(bVar12 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_3ee0;
      uStack_51a0._4_4_ = (uint)bVar13 * auVar283._36_4_ | (uint)!bVar13 * iStack_3edc;
      auVar276 = _local_51c0;
      uStack_5198._0_4_ = (uint)bVar14 * auVar283._40_4_ | (uint)!bVar14 * iStack_3ed8;
      uStack_5198._4_4_ = (uint)bVar15 * auVar283._44_4_ | (uint)!bVar15 * iStack_3ed4;
      auVar277 = _local_51c0;
      uStack_5190._0_4_ = (uint)bVar16 * auVar283._48_4_ | (uint)!bVar16 * iStack_3ed0;
      uStack_5190._4_4_ = (uint)bVar17 * auVar283._52_4_ | (uint)!bVar17 * iStack_3ecc;
      auVar278 = _local_51c0;
      uStack_5188._0_4_ = (uint)bVar18 * auVar283._56_4_ | (uint)!bVar18 * iStack_3ec8;
      uStack_5188._4_4_ =
           (uint)(bVar12 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3ec4;
      auVar283 = _local_51c0;
      local_34c0 = auVar285._0_4_;
      iStack_34bc = auVar285._4_4_;
      iStack_34b8 = auVar285._8_4_;
      iStack_34b4 = auVar285._12_4_;
      iStack_34b0 = auVar285._16_4_;
      iStack_34ac = auVar285._20_4_;
      iStack_34a8 = auVar285._24_4_;
      iStack_34a4 = auVar285._28_4_;
      iStack_34a0 = auVar285._32_4_;
      iStack_349c = auVar285._36_4_;
      iStack_3498 = auVar285._40_4_;
      iStack_3494 = auVar285._44_4_;
      iStack_3490 = auVar285._48_4_;
      iStack_348c = auVar285._52_4_;
      iStack_3488 = auVar285._56_4_;
      iStack_3484 = auVar285._60_4_;
      auVar284 = vaddps_avx512f(auVar285,auVar284);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_50c0._4_4_ = (uint)bVar5 * auVar284._4_4_ | (uint)!bVar5 * iStack_34bc;
      local_50c0._0_4_ = (uint)bVar4 * auVar284._0_4_ | (uint)!bVar4 * local_34c0;
      local_50c0._8_4_ = (uint)bVar6 * auVar284._8_4_ | (uint)!bVar6 * iStack_34b8;
      local_50c0._12_4_ = (uint)bVar7 * auVar284._12_4_ | (uint)!bVar7 * iStack_34b4;
      uStack_50b0._0_4_ = (uint)bVar8 * auVar284._16_4_ | (uint)!bVar8 * iStack_34b0;
      uStack_50b0._4_4_ = (uint)bVar9 * auVar284._20_4_ | (uint)!bVar9 * iStack_34ac;
      uStack_50a8._0_4_ = (uint)bVar10 * auVar284._24_4_ | (uint)!bVar10 * iStack_34a8;
      uStack_50a8._4_4_ = (uint)bVar11 * auVar284._28_4_ | (uint)!bVar11 * iStack_34a4;
      auVar287 = _local_50c0;
      uStack_50a0._0_4_ =
           (uint)(bVar12 & 1) * auVar284._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_34a0;
      uStack_50a0._4_4_ = (uint)bVar13 * auVar284._36_4_ | (uint)!bVar13 * iStack_349c;
      auVar279 = _local_50c0;
      uStack_5098._0_4_ = (uint)bVar14 * auVar284._40_4_ | (uint)!bVar14 * iStack_3498;
      uStack_5098._4_4_ = (uint)bVar15 * auVar284._44_4_ | (uint)!bVar15 * iStack_3494;
      auVar280 = _local_50c0;
      uStack_5090._0_4_ = (uint)bVar16 * auVar284._48_4_ | (uint)!bVar16 * iStack_3490;
      uStack_5090._4_4_ = (uint)bVar17 * auVar284._52_4_ | (uint)!bVar17 * iStack_348c;
      auVar281 = _local_50c0;
      uStack_5088._0_4_ = (uint)bVar18 * auVar284._56_4_ | (uint)!bVar18 * iStack_3488;
      uStack_5088._4_4_ =
           (uint)(bVar12 >> 7) * auVar284._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3484;
      auVar284 = _local_50c0;
      uStack_50a8 = auVar287._24_8_;
      uStack_50a0 = auVar279._32_8_;
      uStack_5098 = auVar280._40_8_;
      uStack_5090 = auVar281._48_8_;
      uStack_5088 = auVar284._56_8_;
      auVar133._16_8_ = uStack_50b0;
      auVar133._0_16_ = local_50c0;
      auVar133._24_8_ = uStack_50a8;
      auVar133._32_8_ = uStack_50a0;
      auVar133._40_8_ = uStack_5098;
      auVar133._48_8_ = uStack_5090;
      auVar133._56_8_ = uStack_5088;
      auVar132._16_8_ = uStack_50b0;
      auVar132._0_16_ = local_50c0;
      auVar132._24_8_ = uStack_50a8;
      auVar132._32_8_ = uStack_50a0;
      auVar132._40_8_ = uStack_5098;
      auVar132._48_8_ = uStack_5090;
      auVar132._56_8_ = uStack_5088;
      auVar284 = vmulps_avx512f(auVar133,auVar132);
      local_52c0._8_4_ = 0.070376836;
      local_52c0._12_4_ = 0.070376836;
      local_52c0._0_4_ = 0.070376836;
      local_52c0._4_4_ = 0.070376836;
      auVar155._16_4_ = 0.070376836;
      auVar155._20_4_ = 0.070376836;
      auVar155._0_16_ = local_52c0._0_16_;
      auVar155._24_4_ = 0.070376836;
      auVar155._28_4_ = 0.070376836;
      auVar155._32_4_ = 0.070376836;
      auVar155._36_4_ = 0.070376836;
      auVar155._40_4_ = 0.070376836;
      auVar155._44_4_ = 0.070376836;
      auVar155._48_4_ = 0.070376836;
      auVar155._52_4_ = 0.070376836;
      auVar155._56_4_ = 0.070376836;
      auVar155._60_4_ = 0.070376836;
      auVar154._16_8_ = uStack_50b0;
      auVar154._0_16_ = local_50c0;
      auVar154._24_8_ = uStack_50a8;
      auVar154._32_8_ = uStack_50a0;
      auVar154._40_8_ = uStack_5098;
      auVar154._48_8_ = uStack_5090;
      auVar154._56_8_ = uStack_5088;
      auVar153._8_4_ = -0.1151461;
      auVar153._12_4_ = -0.1151461;
      auVar153._0_4_ = -0.1151461;
      auVar153._4_4_ = -0.1151461;
      auVar153._16_4_ = -0.1151461;
      auVar153._20_4_ = -0.1151461;
      auVar153._24_4_ = -0.1151461;
      auVar153._28_4_ = -0.1151461;
      auVar153._32_4_ = -0.1151461;
      auVar153._36_4_ = -0.1151461;
      auVar153._40_4_ = -0.1151461;
      auVar153._44_4_ = -0.1151461;
      auVar153._48_4_ = -0.1151461;
      auVar153._52_4_ = -0.1151461;
      auVar153._56_4_ = -0.1151461;
      auVar153._60_4_ = -0.1151461;
      auVar285 = vfmadd213ps_avx512f(auVar154,auVar155,auVar153);
      auVar152._16_8_ = uStack_50b0;
      auVar152._0_16_ = local_50c0;
      auVar152._24_8_ = uStack_50a8;
      auVar152._32_8_ = uStack_50a0;
      auVar152._40_8_ = uStack_5098;
      auVar152._48_8_ = uStack_5090;
      auVar152._56_8_ = uStack_5088;
      auVar151._8_4_ = 0.116769984;
      auVar151._12_4_ = 0.116769984;
      auVar151._0_4_ = 0.116769984;
      auVar151._4_4_ = 0.116769984;
      auVar151._16_4_ = 0.116769984;
      auVar151._20_4_ = 0.116769984;
      auVar151._24_4_ = 0.116769984;
      auVar151._28_4_ = 0.116769984;
      auVar151._32_4_ = 0.116769984;
      auVar151._36_4_ = 0.116769984;
      auVar151._40_4_ = 0.116769984;
      auVar151._44_4_ = 0.116769984;
      auVar151._48_4_ = 0.116769984;
      auVar151._52_4_ = 0.116769984;
      auVar151._56_4_ = 0.116769984;
      auVar151._60_4_ = 0.116769984;
      auVar285 = vfmadd213ps_avx512f(auVar152,auVar285,auVar151);
      auVar150._16_8_ = uStack_50b0;
      auVar150._0_16_ = local_50c0;
      auVar150._24_8_ = uStack_50a8;
      auVar150._32_8_ = uStack_50a0;
      auVar150._40_8_ = uStack_5098;
      auVar150._48_8_ = uStack_5090;
      auVar150._56_8_ = uStack_5088;
      auVar149._8_4_ = -0.12420141;
      auVar149._12_4_ = -0.12420141;
      auVar149._0_4_ = -0.12420141;
      auVar149._4_4_ = -0.12420141;
      auVar149._16_4_ = -0.12420141;
      auVar149._20_4_ = -0.12420141;
      auVar149._24_4_ = -0.12420141;
      auVar149._28_4_ = -0.12420141;
      auVar149._32_4_ = -0.12420141;
      auVar149._36_4_ = -0.12420141;
      auVar149._40_4_ = -0.12420141;
      auVar149._44_4_ = -0.12420141;
      auVar149._48_4_ = -0.12420141;
      auVar149._52_4_ = -0.12420141;
      auVar149._56_4_ = -0.12420141;
      auVar149._60_4_ = -0.12420141;
      auVar285 = vfmadd213ps_avx512f(auVar150,auVar285,auVar149);
      auVar148._16_8_ = uStack_50b0;
      auVar148._0_16_ = local_50c0;
      auVar148._24_8_ = uStack_50a8;
      auVar148._32_8_ = uStack_50a0;
      auVar148._40_8_ = uStack_5098;
      auVar148._48_8_ = uStack_5090;
      auVar148._56_8_ = uStack_5088;
      auVar147._8_4_ = 0.14249323;
      auVar147._12_4_ = 0.14249323;
      auVar147._0_4_ = 0.14249323;
      auVar147._4_4_ = 0.14249323;
      auVar147._16_4_ = 0.14249323;
      auVar147._20_4_ = 0.14249323;
      auVar147._24_4_ = 0.14249323;
      auVar147._28_4_ = 0.14249323;
      auVar147._32_4_ = 0.14249323;
      auVar147._36_4_ = 0.14249323;
      auVar147._40_4_ = 0.14249323;
      auVar147._44_4_ = 0.14249323;
      auVar147._48_4_ = 0.14249323;
      auVar147._52_4_ = 0.14249323;
      auVar147._56_4_ = 0.14249323;
      auVar147._60_4_ = 0.14249323;
      auVar285 = vfmadd213ps_avx512f(auVar148,auVar285,auVar147);
      auVar146._16_8_ = uStack_50b0;
      auVar146._0_16_ = local_50c0;
      auVar146._24_8_ = uStack_50a8;
      auVar146._32_8_ = uStack_50a0;
      auVar146._40_8_ = uStack_5098;
      auVar146._48_8_ = uStack_5090;
      auVar146._56_8_ = uStack_5088;
      auVar145._8_4_ = -0.16668057;
      auVar145._12_4_ = -0.16668057;
      auVar145._0_4_ = -0.16668057;
      auVar145._4_4_ = -0.16668057;
      auVar145._16_4_ = -0.16668057;
      auVar145._20_4_ = -0.16668057;
      auVar145._24_4_ = -0.16668057;
      auVar145._28_4_ = -0.16668057;
      auVar145._32_4_ = -0.16668057;
      auVar145._36_4_ = -0.16668057;
      auVar145._40_4_ = -0.16668057;
      auVar145._44_4_ = -0.16668057;
      auVar145._48_4_ = -0.16668057;
      auVar145._52_4_ = -0.16668057;
      auVar145._56_4_ = -0.16668057;
      auVar145._60_4_ = -0.16668057;
      auVar285 = vfmadd213ps_avx512f(auVar146,auVar285,auVar145);
      auVar144._16_8_ = uStack_50b0;
      auVar144._0_16_ = local_50c0;
      auVar144._24_8_ = uStack_50a8;
      auVar144._32_8_ = uStack_50a0;
      auVar144._40_8_ = uStack_5098;
      auVar144._48_8_ = uStack_5090;
      auVar144._56_8_ = uStack_5088;
      auVar143._8_4_ = 0.20000714;
      auVar143._12_4_ = 0.20000714;
      auVar143._0_4_ = 0.20000714;
      auVar143._4_4_ = 0.20000714;
      auVar143._16_4_ = 0.20000714;
      auVar143._20_4_ = 0.20000714;
      auVar143._24_4_ = 0.20000714;
      auVar143._28_4_ = 0.20000714;
      auVar143._32_4_ = 0.20000714;
      auVar143._36_4_ = 0.20000714;
      auVar143._40_4_ = 0.20000714;
      auVar143._44_4_ = 0.20000714;
      auVar143._48_4_ = 0.20000714;
      auVar143._52_4_ = 0.20000714;
      auVar143._56_4_ = 0.20000714;
      auVar143._60_4_ = 0.20000714;
      auVar285 = vfmadd213ps_avx512f(auVar144,auVar285,auVar143);
      auVar142._16_8_ = uStack_50b0;
      auVar142._0_16_ = local_50c0;
      auVar142._24_8_ = uStack_50a8;
      auVar142._32_8_ = uStack_50a0;
      auVar142._40_8_ = uStack_5098;
      auVar142._48_8_ = uStack_5090;
      auVar142._56_8_ = uStack_5088;
      auVar141._8_4_ = -0.24999994;
      auVar141._12_4_ = -0.24999994;
      auVar141._0_4_ = -0.24999994;
      auVar141._4_4_ = -0.24999994;
      auVar141._16_4_ = -0.24999994;
      auVar141._20_4_ = -0.24999994;
      auVar141._24_4_ = -0.24999994;
      auVar141._28_4_ = -0.24999994;
      auVar141._32_4_ = -0.24999994;
      auVar141._36_4_ = -0.24999994;
      auVar141._40_4_ = -0.24999994;
      auVar141._44_4_ = -0.24999994;
      auVar141._48_4_ = -0.24999994;
      auVar141._52_4_ = -0.24999994;
      auVar141._56_4_ = -0.24999994;
      auVar141._60_4_ = -0.24999994;
      auVar285 = vfmadd213ps_avx512f(auVar142,auVar285,auVar141);
      auVar140._16_8_ = uStack_50b0;
      auVar140._0_16_ = local_50c0;
      auVar140._24_8_ = uStack_50a8;
      auVar140._32_8_ = uStack_50a0;
      auVar140._40_8_ = uStack_5098;
      auVar140._48_8_ = uStack_5090;
      auVar140._56_8_ = uStack_5088;
      auVar139._8_4_ = 0.3333333;
      auVar139._12_4_ = 0.3333333;
      auVar139._0_4_ = 0.3333333;
      auVar139._4_4_ = 0.3333333;
      auVar139._16_4_ = 0.3333333;
      auVar139._20_4_ = 0.3333333;
      auVar139._24_4_ = 0.3333333;
      auVar139._28_4_ = 0.3333333;
      auVar139._32_4_ = 0.3333333;
      auVar139._36_4_ = 0.3333333;
      auVar139._40_4_ = 0.3333333;
      auVar139._44_4_ = 0.3333333;
      auVar139._48_4_ = 0.3333333;
      auVar139._52_4_ = 0.3333333;
      auVar139._56_4_ = 0.3333333;
      auVar139._60_4_ = 0.3333333;
      auVar285 = vfmadd213ps_avx512f(auVar140,auVar285,auVar139);
      auVar131._16_8_ = uStack_50b0;
      auVar131._0_16_ = local_50c0;
      auVar131._24_8_ = uStack_50a8;
      auVar131._32_8_ = uStack_50a0;
      auVar131._40_8_ = uStack_5098;
      auVar131._48_8_ = uStack_5090;
      auVar131._56_8_ = uStack_5088;
      auVar285 = vmulps_avx512f(auVar285,auVar131);
      auVar285 = vmulps_avx512f(auVar285,auVar284);
      uStack_51a8 = auVar19._24_8_;
      uStack_51a0 = auVar276._32_8_;
      uStack_5198 = auVar277._40_8_;
      uStack_5190 = auVar278._48_8_;
      uStack_5188 = auVar283._56_8_;
      auVar138._16_8_ = uStack_51b0;
      auVar138._0_16_ = local_51c0;
      auVar138._24_8_ = uStack_51a8;
      auVar138._32_8_ = uStack_51a0;
      auVar138._40_8_ = uStack_5198;
      auVar138._48_8_ = uStack_5190;
      auVar138._56_8_ = uStack_5188;
      auVar137._8_4_ = -0.00021219444;
      auVar137._12_4_ = -0.00021219444;
      auVar137._0_4_ = -0.00021219444;
      auVar137._4_4_ = -0.00021219444;
      auVar137._16_4_ = -0.00021219444;
      auVar137._20_4_ = -0.00021219444;
      auVar137._24_4_ = -0.00021219444;
      auVar137._28_4_ = -0.00021219444;
      auVar137._32_4_ = -0.00021219444;
      auVar137._36_4_ = -0.00021219444;
      auVar137._40_4_ = -0.00021219444;
      auVar137._44_4_ = -0.00021219444;
      auVar137._48_4_ = -0.00021219444;
      auVar137._52_4_ = -0.00021219444;
      auVar137._56_4_ = -0.00021219444;
      auVar137._60_4_ = -0.00021219444;
      auVar283 = vfmadd213ps_avx512f(auVar137,auVar138,auVar285);
      auVar166._8_4_ = 0.5;
      auVar166._12_4_ = 0.5;
      auVar166._0_4_ = 0.5;
      auVar166._4_4_ = 0.5;
      auVar166._16_4_ = 0.5;
      auVar166._20_4_ = 0.5;
      auVar166._24_4_ = 0.5;
      auVar166._28_4_ = 0.5;
      auVar166._32_4_ = 0.5;
      auVar166._36_4_ = 0.5;
      auVar166._40_4_ = 0.5;
      auVar166._44_4_ = 0.5;
      auVar166._48_4_ = 0.5;
      auVar166._52_4_ = 0.5;
      auVar166._56_4_ = 0.5;
      auVar166._60_4_ = 0.5;
      auVar283 = vfnmadd213ps_avx512f(auVar166,auVar284,auVar283);
      auVar128._16_8_ = uStack_50b0;
      auVar128._0_16_ = local_50c0;
      auVar128._24_8_ = uStack_50a8;
      auVar128._32_8_ = uStack_50a0;
      auVar128._40_8_ = uStack_5098;
      auVar128._48_8_ = uStack_5090;
      auVar128._56_8_ = uStack_5088;
      auVar283 = vaddps_avx512f(auVar128,auVar283);
      auVar136._16_8_ = uStack_51b0;
      auVar136._0_16_ = local_51c0;
      auVar136._24_8_ = uStack_51a8;
      auVar136._32_8_ = uStack_51a0;
      auVar136._40_8_ = uStack_5198;
      auVar136._48_8_ = uStack_5190;
      auVar136._56_8_ = uStack_5188;
      auVar135._8_4_ = 0.6933594;
      auVar135._12_4_ = 0.6933594;
      auVar135._0_4_ = 0.6933594;
      auVar135._4_4_ = 0.6933594;
      auVar135._16_4_ = 0.6933594;
      auVar135._20_4_ = 0.6933594;
      auVar135._24_4_ = 0.6933594;
      auVar135._28_4_ = 0.6933594;
      auVar135._32_4_ = 0.6933594;
      auVar135._36_4_ = 0.6933594;
      auVar135._40_4_ = 0.6933594;
      auVar135._44_4_ = 0.6933594;
      auVar135._48_4_ = 0.6933594;
      auVar135._52_4_ = 0.6933594;
      auVar135._56_4_ = 0.6933594;
      auVar135._60_4_ = 0.6933594;
      auVar284 = vfmadd213ps_avx512f(auVar135,auVar136,auVar283);
      auVar283 = vpmovm2d_avx512dq(uVar26 & 0xffff);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpord_avx512f(auVar284,auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(*local_a5e0,auVar283);
      auVar285._8_4_ = 88.37626;
      auVar285._12_4_ = 88.37626;
      auVar285._0_4_ = 88.37626;
      auVar285._4_4_ = 88.37626;
      auVar285._16_4_ = 88.37626;
      auVar285._20_4_ = 88.37626;
      auVar285._24_4_ = 88.37626;
      auVar285._28_4_ = 88.37626;
      auVar285._32_4_ = 88.37626;
      auVar285._36_4_ = 88.37626;
      auVar285._40_4_ = 88.37626;
      auVar285._44_4_ = 88.37626;
      auVar285._48_4_ = 88.37626;
      auVar285._52_4_ = 88.37626;
      auVar285._56_4_ = 88.37626;
      auVar285._60_4_ = 88.37626;
      auVar283 = vminps_avx512f(auVar283,auVar285);
      auVar284._8_4_ = -88.37626;
      auVar284._12_4_ = -88.37626;
      auVar284._0_4_ = -88.37626;
      auVar284._4_4_ = -88.37626;
      auVar284._16_4_ = -88.37626;
      auVar284._20_4_ = -88.37626;
      auVar284._24_4_ = -88.37626;
      auVar284._28_4_ = -88.37626;
      auVar284._32_4_ = -88.37626;
      auVar284._36_4_ = -88.37626;
      auVar284._40_4_ = -88.37626;
      auVar284._44_4_ = -88.37626;
      auVar284._48_4_ = -88.37626;
      auVar284._52_4_ = -88.37626;
      auVar284._56_4_ = -88.37626;
      auVar284._60_4_ = -88.37626;
      auVar284 = vmaxps_avx512f(auVar283,auVar284);
      auVar163._8_4_ = 1.442695;
      auVar163._12_4_ = 1.442695;
      auVar163._0_4_ = 1.442695;
      auVar163._4_4_ = 1.442695;
      auVar163._16_4_ = 1.442695;
      auVar163._20_4_ = 1.442695;
      auVar163._24_4_ = 1.442695;
      auVar163._28_4_ = 1.442695;
      auVar163._32_4_ = 1.442695;
      auVar163._36_4_ = 1.442695;
      auVar163._40_4_ = 1.442695;
      auVar163._44_4_ = 1.442695;
      auVar163._48_4_ = 1.442695;
      auVar163._52_4_ = 1.442695;
      auVar163._56_4_ = 1.442695;
      auVar163._60_4_ = 1.442695;
      auVar162._8_4_ = 0.5;
      auVar162._12_4_ = 0.5;
      auVar162._0_4_ = 0.5;
      auVar162._4_4_ = 0.5;
      auVar162._16_4_ = 0.5;
      auVar162._20_4_ = 0.5;
      auVar162._24_4_ = 0.5;
      auVar162._28_4_ = 0.5;
      auVar162._32_4_ = 0.5;
      auVar162._36_4_ = 0.5;
      auVar162._40_4_ = 0.5;
      auVar162._44_4_ = 0.5;
      auVar162._48_4_ = 0.5;
      auVar162._52_4_ = 0.5;
      auVar162._56_4_ = 0.5;
      auVar162._60_4_ = 0.5;
      auVar283 = vfmadd213ps_avx512f(auVar163,auVar284,auVar162);
      auVar285 = vrndscaleps_avx512f(auVar283,1);
      uVar27 = vcmpps_avx512f(auVar283,auVar285,1);
      uVar28 = (ushort)uVar27;
      auVar165._8_4_ = 1.0;
      auVar165._12_4_ = 1.0;
      auVar165._0_4_ = 1.0;
      auVar165._4_4_ = 1.0;
      auVar165._16_4_ = 1.0;
      auVar165._20_4_ = 1.0;
      auVar165._24_4_ = 1.0;
      auVar165._28_4_ = 1.0;
      auVar165._32_4_ = 1.0;
      auVar165._36_4_ = 1.0;
      auVar165._40_4_ = 1.0;
      auVar165._44_4_ = 1.0;
      auVar165._48_4_ = 1.0;
      auVar165._52_4_ = 1.0;
      auVar165._56_4_ = 1.0;
      auVar165._60_4_ = 1.0;
      local_3d80 = auVar285._0_4_;
      iStack_3d7c = auVar285._4_4_;
      iStack_3d78 = auVar285._8_4_;
      iStack_3d74 = auVar285._12_4_;
      iStack_3d70 = auVar285._16_4_;
      iStack_3d6c = auVar285._20_4_;
      iStack_3d68 = auVar285._24_4_;
      iStack_3d64 = auVar285._28_4_;
      iStack_3d60 = auVar285._32_4_;
      iStack_3d5c = auVar285._36_4_;
      iStack_3d58 = auVar285._40_4_;
      iStack_3d54 = auVar285._44_4_;
      iStack_3d50 = auVar285._48_4_;
      iStack_3d4c = auVar285._52_4_;
      iStack_3d48 = auVar285._56_4_;
      iStack_3d44 = auVar285._60_4_;
      auVar283 = vsubps_avx512f(auVar285,auVar165);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar27 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_5600._4_4_ = (uint)bVar5 * auVar283._4_4_ | (uint)!bVar5 * iStack_3d7c;
      local_5600._0_4_ = (uint)bVar4 * auVar283._0_4_ | (uint)!bVar4 * local_3d80;
      local_5600._8_4_ = (uint)bVar6 * auVar283._8_4_ | (uint)!bVar6 * iStack_3d78;
      local_5600._12_4_ = (uint)bVar7 * auVar283._12_4_ | (uint)!bVar7 * iStack_3d74;
      uStack_55f0._0_4_ = (uint)bVar8 * auVar283._16_4_ | (uint)!bVar8 * iStack_3d70;
      uStack_55f0._4_4_ = (uint)bVar9 * auVar283._20_4_ | (uint)!bVar9 * iStack_3d6c;
      uStack_55e8._0_4_ = (uint)bVar10 * auVar283._24_4_ | (uint)!bVar10 * iStack_3d68;
      uStack_55e8._4_4_ = (uint)bVar11 * auVar283._28_4_ | (uint)!bVar11 * iStack_3d64;
      auVar19 = _local_5600;
      uStack_55e0._0_4_ =
           (uint)(bVar12 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_3d60;
      uStack_55e0._4_4_ = (uint)bVar13 * auVar283._36_4_ | (uint)!bVar13 * iStack_3d5c;
      auVar276 = _local_5600;
      uStack_55d8._0_4_ = (uint)bVar14 * auVar283._40_4_ | (uint)!bVar14 * iStack_3d58;
      uStack_55d8._4_4_ = (uint)bVar15 * auVar283._44_4_ | (uint)!bVar15 * iStack_3d54;
      auVar277 = _local_5600;
      uStack_55d0._0_4_ = (uint)bVar16 * auVar283._48_4_ | (uint)!bVar16 * iStack_3d50;
      uStack_55d0._4_4_ = (uint)bVar17 * auVar283._52_4_ | (uint)!bVar17 * iStack_3d4c;
      auVar278 = _local_5600;
      uStack_55c8._0_4_ = (uint)bVar18 * auVar283._56_4_ | (uint)!bVar18 * iStack_3d48;
      uStack_55c8._4_4_ =
           (uint)(bVar12 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3d44;
      auVar283 = _local_5600;
      uStack_55e8 = auVar19._24_8_;
      uStack_55e0 = auVar276._32_8_;
      uStack_55d8 = auVar277._40_8_;
      uStack_55d0 = auVar278._48_8_;
      uStack_55c8 = auVar283._56_8_;
      auVar170._16_8_ = uStack_55f0;
      auVar170._0_16_ = local_5600;
      auVar170._24_8_ = uStack_55e8;
      auVar170._32_8_ = uStack_55e0;
      auVar170._40_8_ = uStack_55d8;
      auVar170._48_8_ = uStack_55d0;
      auVar170._56_8_ = uStack_55c8;
      auVar169._8_4_ = 0.6933594;
      auVar169._12_4_ = 0.6933594;
      auVar169._0_4_ = 0.6933594;
      auVar169._4_4_ = 0.6933594;
      auVar169._16_4_ = 0.6933594;
      auVar169._20_4_ = 0.6933594;
      auVar169._24_4_ = 0.6933594;
      auVar169._28_4_ = 0.6933594;
      auVar169._32_4_ = 0.6933594;
      auVar169._36_4_ = 0.6933594;
      auVar169._40_4_ = 0.6933594;
      auVar169._44_4_ = 0.6933594;
      auVar169._48_4_ = 0.6933594;
      auVar169._52_4_ = 0.6933594;
      auVar169._56_4_ = 0.6933594;
      auVar169._60_4_ = 0.6933594;
      auVar283 = vfnmadd213ps_avx512f(auVar169,auVar170,auVar284);
      auVar168._16_8_ = uStack_55f0;
      auVar168._0_16_ = local_5600;
      auVar168._24_8_ = uStack_55e8;
      auVar168._32_8_ = uStack_55e0;
      auVar168._40_8_ = uStack_55d8;
      auVar168._48_8_ = uStack_55d0;
      auVar168._56_8_ = uStack_55c8;
      auVar167._8_4_ = -0.00021219444;
      auVar167._12_4_ = -0.00021219444;
      auVar167._0_4_ = -0.00021219444;
      auVar167._4_4_ = -0.00021219444;
      auVar167._16_4_ = -0.00021219444;
      auVar167._20_4_ = -0.00021219444;
      auVar167._24_4_ = -0.00021219444;
      auVar167._28_4_ = -0.00021219444;
      auVar167._32_4_ = -0.00021219444;
      auVar167._36_4_ = -0.00021219444;
      auVar167._40_4_ = -0.00021219444;
      auVar167._44_4_ = -0.00021219444;
      auVar167._48_4_ = -0.00021219444;
      auVar167._52_4_ = -0.00021219444;
      auVar167._56_4_ = -0.00021219444;
      auVar167._60_4_ = -0.00021219444;
      auVar283 = vfnmadd213ps_avx512f(auVar167,auVar168,auVar283);
      auVar284 = vmulps_avx512f(auVar283,auVar283);
      uStack_56f8._0_4_ = 0.00019875691;
      uStack_56f8._4_4_ = 0.00019875691;
      local_5700._0_4_ = 0.00019875691;
      local_5700._4_4_ = 0.00019875691;
      auVar161._16_4_ = 0.00019875691;
      auVar161._20_4_ = 0.00019875691;
      auVar161._0_16_ = _local_5700;
      auVar161._24_4_ = 0.00019875691;
      auVar161._28_4_ = 0.00019875691;
      auVar161._32_4_ = 0.00019875691;
      auVar161._36_4_ = 0.00019875691;
      auVar161._40_4_ = 0.00019875691;
      auVar161._44_4_ = 0.00019875691;
      auVar161._48_4_ = 0.00019875691;
      auVar161._52_4_ = 0.00019875691;
      auVar161._56_4_ = 0.00019875691;
      auVar161._60_4_ = 0.00019875691;
      auVar160._8_4_ = 0.0013981999;
      auVar160._12_4_ = 0.0013981999;
      auVar160._0_4_ = 0.0013981999;
      auVar160._4_4_ = 0.0013981999;
      auVar160._16_4_ = 0.0013981999;
      auVar160._20_4_ = 0.0013981999;
      auVar160._24_4_ = 0.0013981999;
      auVar160._28_4_ = 0.0013981999;
      auVar160._32_4_ = 0.0013981999;
      auVar160._36_4_ = 0.0013981999;
      auVar160._40_4_ = 0.0013981999;
      auVar160._44_4_ = 0.0013981999;
      auVar160._48_4_ = 0.0013981999;
      auVar160._52_4_ = 0.0013981999;
      auVar160._56_4_ = 0.0013981999;
      auVar160._60_4_ = 0.0013981999;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar161,auVar160);
      auVar159._8_4_ = 0.008333452;
      auVar159._12_4_ = 0.008333452;
      auVar159._0_4_ = 0.008333452;
      auVar159._4_4_ = 0.008333452;
      auVar159._16_4_ = 0.008333452;
      auVar159._20_4_ = 0.008333452;
      auVar159._24_4_ = 0.008333452;
      auVar159._28_4_ = 0.008333452;
      auVar159._32_4_ = 0.008333452;
      auVar159._36_4_ = 0.008333452;
      auVar159._40_4_ = 0.008333452;
      auVar159._44_4_ = 0.008333452;
      auVar159._48_4_ = 0.008333452;
      auVar159._52_4_ = 0.008333452;
      auVar159._56_4_ = 0.008333452;
      auVar159._60_4_ = 0.008333452;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar159);
      auVar158._8_4_ = 0.041665796;
      auVar158._12_4_ = 0.041665796;
      auVar158._0_4_ = 0.041665796;
      auVar158._4_4_ = 0.041665796;
      auVar158._16_4_ = 0.041665796;
      auVar158._20_4_ = 0.041665796;
      auVar158._24_4_ = 0.041665796;
      auVar158._28_4_ = 0.041665796;
      auVar158._32_4_ = 0.041665796;
      auVar158._36_4_ = 0.041665796;
      auVar158._40_4_ = 0.041665796;
      auVar158._44_4_ = 0.041665796;
      auVar158._48_4_ = 0.041665796;
      auVar158._52_4_ = 0.041665796;
      auVar158._56_4_ = 0.041665796;
      auVar158._60_4_ = 0.041665796;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar158);
      auVar157._8_4_ = 0.16666666;
      auVar157._12_4_ = 0.16666666;
      auVar157._0_4_ = 0.16666666;
      auVar157._4_4_ = 0.16666666;
      auVar157._16_4_ = 0.16666666;
      auVar157._20_4_ = 0.16666666;
      auVar157._24_4_ = 0.16666666;
      auVar157._28_4_ = 0.16666666;
      auVar157._32_4_ = 0.16666666;
      auVar157._36_4_ = 0.16666666;
      auVar157._40_4_ = 0.16666666;
      auVar157._44_4_ = 0.16666666;
      auVar157._48_4_ = 0.16666666;
      auVar157._52_4_ = 0.16666666;
      auVar157._56_4_ = 0.16666666;
      auVar157._60_4_ = 0.16666666;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar157);
      auVar156._8_4_ = 0.5;
      auVar156._12_4_ = 0.5;
      auVar156._0_4_ = 0.5;
      auVar156._4_4_ = 0.5;
      auVar156._16_4_ = 0.5;
      auVar156._20_4_ = 0.5;
      auVar156._24_4_ = 0.5;
      auVar156._28_4_ = 0.5;
      auVar156._32_4_ = 0.5;
      auVar156._36_4_ = 0.5;
      auVar156._40_4_ = 0.5;
      auVar156._44_4_ = 0.5;
      auVar156._48_4_ = 0.5;
      auVar156._52_4_ = 0.5;
      auVar156._56_4_ = 0.5;
      auVar156._60_4_ = 0.5;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar156);
      auVar284 = vfmadd213ps_avx512f(auVar284,auVar285,auVar283);
      auVar283._8_4_ = 1.0;
      auVar283._12_4_ = 1.0;
      auVar283._0_4_ = 1.0;
      auVar283._4_4_ = 1.0;
      auVar283._16_4_ = 1.0;
      auVar283._20_4_ = 1.0;
      auVar283._24_4_ = 1.0;
      auVar283._28_4_ = 1.0;
      auVar283._32_4_ = 1.0;
      auVar283._36_4_ = 1.0;
      auVar283._40_4_ = 1.0;
      auVar283._44_4_ = 1.0;
      auVar283._48_4_ = 1.0;
      auVar283._52_4_ = 1.0;
      auVar283._56_4_ = 1.0;
      auVar283._60_4_ = 1.0;
      auVar285 = vaddps_avx512f(auVar284,auVar283);
      auVar171._16_8_ = uStack_55f0;
      auVar171._0_16_ = local_5600;
      auVar171._24_8_ = uStack_55e8;
      auVar171._32_8_ = uStack_55e0;
      auVar171._40_8_ = uStack_55d8;
      auVar171._48_8_ = uStack_55d0;
      auVar171._56_8_ = uStack_55c8;
      auVar283 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar283);
      auVar283 = vcvttps2dq_avx512f(auVar171);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vpaddd_avx512f(auVar283,auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpslld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(auVar285,auVar283);
      local_5700 = auVar283._0_8_;
      uStack_56f8 = auVar283._8_8_;
      uStack_56f0 = auVar283._16_8_;
      uStack_56e8 = auVar283._24_8_;
      uStack_56e0 = auVar283._32_8_;
      uStack_56d8 = auVar283._40_8_;
      uStack_56d0 = auVar283._48_8_;
      uStack_56c8 = auVar283._56_8_;
      *local_a5f0 = local_5700;
      local_a5f0[1] = uStack_56f8;
      local_a5f0[2] = uStack_56f0;
      local_a5f0[3] = uStack_56e8;
      local_a5f0[4] = uStack_56e0;
      local_a5f0[5] = uStack_56d8;
      local_a5f0[6] = uStack_56d0;
      local_a5f0[7] = uStack_56c8;
      local_a5e0 = local_a5e0 + 1;
      local_a5e8 = local_a5e8 + 1;
      local_a5f0 = local_a5f0 + 8;
    }
  }
  if (in_R8D == 8) {
    for (local_a6c4 = 0; local_a6c4 + 1 < in_ECX; local_a6c4 = local_a6c4 + 2) {
      uVar1 = *local_a5e8;
      auVar20 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(uVar1),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(uVar1),0x30);
      auVar21 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x30);
      uStack_a210 = auVar21._0_8_;
      uStack_a208 = auVar21._8_8_;
      uVar1 = local_a5e8[1];
      auVar21 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x30);
      auVar22 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(uVar1),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(uVar1),0x30);
      uStack_a1d0 = auVar22._0_8_;
      uStack_a1c8 = auVar22._8_8_;
      auVar19._16_8_ = uStack_a1d0;
      auVar19._0_16_ = auVar21;
      auVar19._24_8_ = uStack_a1c8;
      auVar283 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_a208,CONCAT816(uStack_a210,auVar20))),auVar19,
                            1);
      uVar26 = vcmpps_avx512f(auVar283,ZEXT1664(ZEXT816(0)),2);
      auVar88._8_4_ = 0x800000;
      auVar88._12_4_ = 0x800000;
      auVar88._0_4_ = 0x800000;
      auVar88._4_4_ = 0x800000;
      auVar88._16_4_ = 0x800000;
      auVar88._20_4_ = 0x800000;
      auVar88._24_4_ = 0x800000;
      auVar88._28_4_ = 0x800000;
      auVar88._32_4_ = 0x800000;
      auVar88._36_4_ = 0x800000;
      auVar88._40_4_ = 0x800000;
      auVar88._44_4_ = 0x800000;
      auVar88._48_4_ = 0x800000;
      auVar88._52_4_ = 0x800000;
      auVar88._56_4_ = 0x800000;
      auVar88._60_4_ = 0x800000;
      auVar284 = vmaxps_avx512f(auVar283,auVar88);
      auVar283 = vmovdqa64_avx512f(auVar284);
      auVar283 = vpsrld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar126._8_4_ = -0x7f800001;
      auVar126._12_4_ = -0x7f800001;
      auVar126._0_4_ = -0x7f800001;
      auVar126._4_4_ = -0x7f800001;
      auVar126._16_4_ = -0x7f800001;
      auVar126._20_4_ = -0x7f800001;
      auVar126._24_4_ = -0x7f800001;
      auVar126._28_4_ = -0x7f800001;
      auVar126._32_4_ = -0x7f800001;
      auVar126._36_4_ = -0x7f800001;
      auVar126._40_4_ = -0x7f800001;
      auVar126._44_4_ = -0x7f800001;
      auVar126._48_4_ = -0x7f800001;
      auVar126._52_4_ = -0x7f800001;
      auVar126._56_4_ = -0x7f800001;
      auVar126._60_4_ = -0x7f800001;
      auVar285 = vmovdqa64_avx512f(auVar126);
      auVar284 = vpandd_avx512f(auVar284,auVar285);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar127._8_4_ = 0.5;
      auVar127._12_4_ = 0.5;
      auVar127._0_4_ = 0.5;
      auVar127._4_4_ = 0.5;
      auVar127._16_4_ = 0.5;
      auVar127._20_4_ = 0.5;
      auVar127._24_4_ = 0.5;
      auVar127._28_4_ = 0.5;
      auVar127._32_4_ = 0.5;
      auVar127._36_4_ = 0.5;
      auVar127._40_4_ = 0.5;
      auVar127._44_4_ = 0.5;
      auVar127._48_4_ = 0.5;
      auVar127._52_4_ = 0.5;
      auVar127._56_4_ = 0.5;
      auVar127._60_4_ = 0.5;
      auVar285 = vmovdqa64_avx512f(auVar127);
      auVar284 = vpord_avx512f(auVar284,auVar285);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar285 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar285 = vmovdqa64_avx512f(auVar285);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar285 = vmovdqa64_avx512f(auVar285);
      auVar283 = vpsubd_avx512f(auVar283,auVar285);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vcvtdq2ps_avx512f(auVar283);
      auVar83._8_4_ = 1.0;
      auVar83._12_4_ = 1.0;
      auVar83._0_4_ = 1.0;
      auVar83._4_4_ = 1.0;
      auVar83._16_4_ = 1.0;
      auVar83._20_4_ = 1.0;
      auVar83._24_4_ = 1.0;
      auVar83._28_4_ = 1.0;
      auVar83._32_4_ = 1.0;
      auVar83._36_4_ = 1.0;
      auVar83._40_4_ = 1.0;
      auVar83._44_4_ = 1.0;
      auVar83._48_4_ = 1.0;
      auVar83._52_4_ = 1.0;
      auVar83._56_4_ = 1.0;
      auVar83._60_4_ = 1.0;
      auVar283 = vaddps_avx512f(auVar283,auVar83);
      uVar27 = vcmpps_avx512f(auVar284,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar28 = (ushort)uVar27;
      auVar84._8_4_ = 1.0;
      auVar84._12_4_ = 1.0;
      auVar84._0_4_ = 1.0;
      auVar84._4_4_ = 1.0;
      auVar84._16_4_ = 1.0;
      auVar84._20_4_ = 1.0;
      auVar84._24_4_ = 1.0;
      auVar84._28_4_ = 1.0;
      auVar84._32_4_ = 1.0;
      auVar84._36_4_ = 1.0;
      auVar84._40_4_ = 1.0;
      auVar84._44_4_ = 1.0;
      auVar84._48_4_ = 1.0;
      auVar84._52_4_ = 1.0;
      auVar84._56_4_ = 1.0;
      auVar84._60_4_ = 1.0;
      auVar285 = vsubps_avx512f(auVar284,auVar84);
      auVar118._8_4_ = 1.0;
      auVar118._12_4_ = 1.0;
      auVar118._0_4_ = 1.0;
      auVar118._4_4_ = 1.0;
      auVar118._16_4_ = 1.0;
      auVar118._20_4_ = 1.0;
      auVar118._24_4_ = 1.0;
      auVar118._28_4_ = 1.0;
      auVar118._32_4_ = 1.0;
      auVar118._36_4_ = 1.0;
      auVar118._40_4_ = 1.0;
      auVar118._44_4_ = 1.0;
      auVar118._48_4_ = 1.0;
      auVar118._52_4_ = 1.0;
      auVar118._56_4_ = 1.0;
      auVar118._60_4_ = 1.0;
      local_6380 = auVar283._0_4_;
      iStack_637c = auVar283._4_4_;
      iStack_6378 = auVar283._8_4_;
      iStack_6374 = auVar283._12_4_;
      iStack_6370 = auVar283._16_4_;
      iStack_636c = auVar283._20_4_;
      iStack_6368 = auVar283._24_4_;
      iStack_6364 = auVar283._28_4_;
      iStack_6360 = auVar283._32_4_;
      iStack_635c = auVar283._36_4_;
      iStack_6358 = auVar283._40_4_;
      iStack_6354 = auVar283._44_4_;
      iStack_6350 = auVar283._48_4_;
      iStack_634c = auVar283._52_4_;
      iStack_6348 = auVar283._56_4_;
      iStack_6344 = auVar283._60_4_;
      auVar283 = vsubps_avx512f(auVar283,auVar118);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar27 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_7640._4_4_ = (uint)bVar5 * auVar283._4_4_ | (uint)!bVar5 * iStack_637c;
      local_7640._0_4_ = (uint)bVar4 * auVar283._0_4_ | (uint)!bVar4 * local_6380;
      local_7640._8_4_ = (uint)bVar6 * auVar283._8_4_ | (uint)!bVar6 * iStack_6378;
      local_7640._12_4_ = (uint)bVar7 * auVar283._12_4_ | (uint)!bVar7 * iStack_6374;
      uStack_7630._0_4_ = (uint)bVar8 * auVar283._16_4_ | (uint)!bVar8 * iStack_6370;
      uStack_7630._4_4_ = (uint)bVar9 * auVar283._20_4_ | (uint)!bVar9 * iStack_636c;
      uStack_7628._0_4_ = (uint)bVar10 * auVar283._24_4_ | (uint)!bVar10 * iStack_6368;
      uStack_7628._4_4_ = (uint)bVar11 * auVar283._28_4_ | (uint)!bVar11 * iStack_6364;
      auVar19 = _local_7640;
      uStack_7620._0_4_ =
           (uint)(bVar12 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_6360;
      uStack_7620._4_4_ = (uint)bVar13 * auVar283._36_4_ | (uint)!bVar13 * iStack_635c;
      auVar276 = _local_7640;
      uStack_7618._0_4_ = (uint)bVar14 * auVar283._40_4_ | (uint)!bVar14 * iStack_6358;
      uStack_7618._4_4_ = (uint)bVar15 * auVar283._44_4_ | (uint)!bVar15 * iStack_6354;
      auVar277 = _local_7640;
      uStack_7610._0_4_ = (uint)bVar16 * auVar283._48_4_ | (uint)!bVar16 * iStack_6350;
      uStack_7610._4_4_ = (uint)bVar17 * auVar283._52_4_ | (uint)!bVar17 * iStack_634c;
      auVar278 = _local_7640;
      uStack_7608._0_4_ = (uint)bVar18 * auVar283._56_4_ | (uint)!bVar18 * iStack_6348;
      uStack_7608._4_4_ =
           (uint)(bVar12 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_6344;
      auVar283 = _local_7640;
      local_5940 = auVar285._0_4_;
      iStack_593c = auVar285._4_4_;
      iStack_5938 = auVar285._8_4_;
      iStack_5934 = auVar285._12_4_;
      iStack_5930 = auVar285._16_4_;
      iStack_592c = auVar285._20_4_;
      iStack_5928 = auVar285._24_4_;
      iStack_5924 = auVar285._28_4_;
      iStack_5920 = auVar285._32_4_;
      iStack_591c = auVar285._36_4_;
      iStack_5918 = auVar285._40_4_;
      iStack_5914 = auVar285._44_4_;
      iStack_5910 = auVar285._48_4_;
      iStack_590c = auVar285._52_4_;
      iStack_5908 = auVar285._56_4_;
      iStack_5904 = auVar285._60_4_;
      auVar284 = vaddps_avx512f(auVar285,auVar284);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_7540._4_4_ = (uint)bVar5 * auVar284._4_4_ | (uint)!bVar5 * iStack_593c;
      local_7540._0_4_ = (uint)bVar4 * auVar284._0_4_ | (uint)!bVar4 * local_5940;
      local_7540._8_4_ = (uint)bVar6 * auVar284._8_4_ | (uint)!bVar6 * iStack_5938;
      local_7540._12_4_ = (uint)bVar7 * auVar284._12_4_ | (uint)!bVar7 * iStack_5934;
      uStack_7530._0_4_ = (uint)bVar8 * auVar284._16_4_ | (uint)!bVar8 * iStack_5930;
      uStack_7530._4_4_ = (uint)bVar9 * auVar284._20_4_ | (uint)!bVar9 * iStack_592c;
      uStack_7528._0_4_ = (uint)bVar10 * auVar284._24_4_ | (uint)!bVar10 * iStack_5928;
      uStack_7528._4_4_ = (uint)bVar11 * auVar284._28_4_ | (uint)!bVar11 * iStack_5924;
      auVar287 = _local_7540;
      uStack_7520._0_4_ =
           (uint)(bVar12 & 1) * auVar284._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_5920;
      uStack_7520._4_4_ = (uint)bVar13 * auVar284._36_4_ | (uint)!bVar13 * iStack_591c;
      auVar279 = _local_7540;
      uStack_7518._0_4_ = (uint)bVar14 * auVar284._40_4_ | (uint)!bVar14 * iStack_5918;
      uStack_7518._4_4_ = (uint)bVar15 * auVar284._44_4_ | (uint)!bVar15 * iStack_5914;
      auVar280 = _local_7540;
      uStack_7510._0_4_ = (uint)bVar16 * auVar284._48_4_ | (uint)!bVar16 * iStack_5910;
      uStack_7510._4_4_ = (uint)bVar17 * auVar284._52_4_ | (uint)!bVar17 * iStack_590c;
      auVar281 = _local_7540;
      uStack_7508._0_4_ = (uint)bVar18 * auVar284._56_4_ | (uint)!bVar18 * iStack_5908;
      uStack_7508._4_4_ =
           (uint)(bVar12 >> 7) * auVar284._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_5904;
      auVar284 = _local_7540;
      uStack_7528 = auVar287._24_8_;
      uStack_7520 = auVar279._32_8_;
      uStack_7518 = auVar280._40_8_;
      uStack_7510 = auVar281._48_8_;
      uStack_7508 = auVar284._56_8_;
      auVar87._16_8_ = uStack_7530;
      auVar87._0_16_ = local_7540;
      auVar87._24_8_ = uStack_7528;
      auVar87._32_8_ = uStack_7520;
      auVar87._40_8_ = uStack_7518;
      auVar87._48_8_ = uStack_7510;
      auVar87._56_8_ = uStack_7508;
      auVar86._16_8_ = uStack_7530;
      auVar86._0_16_ = local_7540;
      auVar86._24_8_ = uStack_7528;
      auVar86._32_8_ = uStack_7520;
      auVar86._40_8_ = uStack_7518;
      auVar86._48_8_ = uStack_7510;
      auVar86._56_8_ = uStack_7508;
      auVar284 = vmulps_avx512f(auVar87,auVar86);
      local_7740._8_4_ = 0.070376836;
      local_7740._12_4_ = 0.070376836;
      local_7740._0_4_ = 0.070376836;
      local_7740._4_4_ = 0.070376836;
      auVar109._16_4_ = 0.070376836;
      auVar109._20_4_ = 0.070376836;
      auVar109._0_16_ = local_7740._0_16_;
      auVar109._24_4_ = 0.070376836;
      auVar109._28_4_ = 0.070376836;
      auVar109._32_4_ = 0.070376836;
      auVar109._36_4_ = 0.070376836;
      auVar109._40_4_ = 0.070376836;
      auVar109._44_4_ = 0.070376836;
      auVar109._48_4_ = 0.070376836;
      auVar109._52_4_ = 0.070376836;
      auVar109._56_4_ = 0.070376836;
      auVar109._60_4_ = 0.070376836;
      auVar108._16_8_ = uStack_7530;
      auVar108._0_16_ = local_7540;
      auVar108._24_8_ = uStack_7528;
      auVar108._32_8_ = uStack_7520;
      auVar108._40_8_ = uStack_7518;
      auVar108._48_8_ = uStack_7510;
      auVar108._56_8_ = uStack_7508;
      auVar107._8_4_ = -0.1151461;
      auVar107._12_4_ = -0.1151461;
      auVar107._0_4_ = -0.1151461;
      auVar107._4_4_ = -0.1151461;
      auVar107._16_4_ = -0.1151461;
      auVar107._20_4_ = -0.1151461;
      auVar107._24_4_ = -0.1151461;
      auVar107._28_4_ = -0.1151461;
      auVar107._32_4_ = -0.1151461;
      auVar107._36_4_ = -0.1151461;
      auVar107._40_4_ = -0.1151461;
      auVar107._44_4_ = -0.1151461;
      auVar107._48_4_ = -0.1151461;
      auVar107._52_4_ = -0.1151461;
      auVar107._56_4_ = -0.1151461;
      auVar107._60_4_ = -0.1151461;
      auVar285 = vfmadd213ps_avx512f(auVar108,auVar109,auVar107);
      auVar106._16_8_ = uStack_7530;
      auVar106._0_16_ = local_7540;
      auVar106._24_8_ = uStack_7528;
      auVar106._32_8_ = uStack_7520;
      auVar106._40_8_ = uStack_7518;
      auVar106._48_8_ = uStack_7510;
      auVar106._56_8_ = uStack_7508;
      auVar105._8_4_ = 0.116769984;
      auVar105._12_4_ = 0.116769984;
      auVar105._0_4_ = 0.116769984;
      auVar105._4_4_ = 0.116769984;
      auVar105._16_4_ = 0.116769984;
      auVar105._20_4_ = 0.116769984;
      auVar105._24_4_ = 0.116769984;
      auVar105._28_4_ = 0.116769984;
      auVar105._32_4_ = 0.116769984;
      auVar105._36_4_ = 0.116769984;
      auVar105._40_4_ = 0.116769984;
      auVar105._44_4_ = 0.116769984;
      auVar105._48_4_ = 0.116769984;
      auVar105._52_4_ = 0.116769984;
      auVar105._56_4_ = 0.116769984;
      auVar105._60_4_ = 0.116769984;
      auVar285 = vfmadd213ps_avx512f(auVar106,auVar285,auVar105);
      auVar104._16_8_ = uStack_7530;
      auVar104._0_16_ = local_7540;
      auVar104._24_8_ = uStack_7528;
      auVar104._32_8_ = uStack_7520;
      auVar104._40_8_ = uStack_7518;
      auVar104._48_8_ = uStack_7510;
      auVar104._56_8_ = uStack_7508;
      auVar103._8_4_ = -0.12420141;
      auVar103._12_4_ = -0.12420141;
      auVar103._0_4_ = -0.12420141;
      auVar103._4_4_ = -0.12420141;
      auVar103._16_4_ = -0.12420141;
      auVar103._20_4_ = -0.12420141;
      auVar103._24_4_ = -0.12420141;
      auVar103._28_4_ = -0.12420141;
      auVar103._32_4_ = -0.12420141;
      auVar103._36_4_ = -0.12420141;
      auVar103._40_4_ = -0.12420141;
      auVar103._44_4_ = -0.12420141;
      auVar103._48_4_ = -0.12420141;
      auVar103._52_4_ = -0.12420141;
      auVar103._56_4_ = -0.12420141;
      auVar103._60_4_ = -0.12420141;
      auVar285 = vfmadd213ps_avx512f(auVar104,auVar285,auVar103);
      auVar102._16_8_ = uStack_7530;
      auVar102._0_16_ = local_7540;
      auVar102._24_8_ = uStack_7528;
      auVar102._32_8_ = uStack_7520;
      auVar102._40_8_ = uStack_7518;
      auVar102._48_8_ = uStack_7510;
      auVar102._56_8_ = uStack_7508;
      auVar101._8_4_ = 0.14249323;
      auVar101._12_4_ = 0.14249323;
      auVar101._0_4_ = 0.14249323;
      auVar101._4_4_ = 0.14249323;
      auVar101._16_4_ = 0.14249323;
      auVar101._20_4_ = 0.14249323;
      auVar101._24_4_ = 0.14249323;
      auVar101._28_4_ = 0.14249323;
      auVar101._32_4_ = 0.14249323;
      auVar101._36_4_ = 0.14249323;
      auVar101._40_4_ = 0.14249323;
      auVar101._44_4_ = 0.14249323;
      auVar101._48_4_ = 0.14249323;
      auVar101._52_4_ = 0.14249323;
      auVar101._56_4_ = 0.14249323;
      auVar101._60_4_ = 0.14249323;
      auVar285 = vfmadd213ps_avx512f(auVar102,auVar285,auVar101);
      auVar100._16_8_ = uStack_7530;
      auVar100._0_16_ = local_7540;
      auVar100._24_8_ = uStack_7528;
      auVar100._32_8_ = uStack_7520;
      auVar100._40_8_ = uStack_7518;
      auVar100._48_8_ = uStack_7510;
      auVar100._56_8_ = uStack_7508;
      auVar99._8_4_ = -0.16668057;
      auVar99._12_4_ = -0.16668057;
      auVar99._0_4_ = -0.16668057;
      auVar99._4_4_ = -0.16668057;
      auVar99._16_4_ = -0.16668057;
      auVar99._20_4_ = -0.16668057;
      auVar99._24_4_ = -0.16668057;
      auVar99._28_4_ = -0.16668057;
      auVar99._32_4_ = -0.16668057;
      auVar99._36_4_ = -0.16668057;
      auVar99._40_4_ = -0.16668057;
      auVar99._44_4_ = -0.16668057;
      auVar99._48_4_ = -0.16668057;
      auVar99._52_4_ = -0.16668057;
      auVar99._56_4_ = -0.16668057;
      auVar99._60_4_ = -0.16668057;
      auVar285 = vfmadd213ps_avx512f(auVar100,auVar285,auVar99);
      auVar98._16_8_ = uStack_7530;
      auVar98._0_16_ = local_7540;
      auVar98._24_8_ = uStack_7528;
      auVar98._32_8_ = uStack_7520;
      auVar98._40_8_ = uStack_7518;
      auVar98._48_8_ = uStack_7510;
      auVar98._56_8_ = uStack_7508;
      auVar97._8_4_ = 0.20000714;
      auVar97._12_4_ = 0.20000714;
      auVar97._0_4_ = 0.20000714;
      auVar97._4_4_ = 0.20000714;
      auVar97._16_4_ = 0.20000714;
      auVar97._20_4_ = 0.20000714;
      auVar97._24_4_ = 0.20000714;
      auVar97._28_4_ = 0.20000714;
      auVar97._32_4_ = 0.20000714;
      auVar97._36_4_ = 0.20000714;
      auVar97._40_4_ = 0.20000714;
      auVar97._44_4_ = 0.20000714;
      auVar97._48_4_ = 0.20000714;
      auVar97._52_4_ = 0.20000714;
      auVar97._56_4_ = 0.20000714;
      auVar97._60_4_ = 0.20000714;
      auVar285 = vfmadd213ps_avx512f(auVar98,auVar285,auVar97);
      auVar96._16_8_ = uStack_7530;
      auVar96._0_16_ = local_7540;
      auVar96._24_8_ = uStack_7528;
      auVar96._32_8_ = uStack_7520;
      auVar96._40_8_ = uStack_7518;
      auVar96._48_8_ = uStack_7510;
      auVar96._56_8_ = uStack_7508;
      auVar95._8_4_ = -0.24999994;
      auVar95._12_4_ = -0.24999994;
      auVar95._0_4_ = -0.24999994;
      auVar95._4_4_ = -0.24999994;
      auVar95._16_4_ = -0.24999994;
      auVar95._20_4_ = -0.24999994;
      auVar95._24_4_ = -0.24999994;
      auVar95._28_4_ = -0.24999994;
      auVar95._32_4_ = -0.24999994;
      auVar95._36_4_ = -0.24999994;
      auVar95._40_4_ = -0.24999994;
      auVar95._44_4_ = -0.24999994;
      auVar95._48_4_ = -0.24999994;
      auVar95._52_4_ = -0.24999994;
      auVar95._56_4_ = -0.24999994;
      auVar95._60_4_ = -0.24999994;
      auVar285 = vfmadd213ps_avx512f(auVar96,auVar285,auVar95);
      auVar94._16_8_ = uStack_7530;
      auVar94._0_16_ = local_7540;
      auVar94._24_8_ = uStack_7528;
      auVar94._32_8_ = uStack_7520;
      auVar94._40_8_ = uStack_7518;
      auVar94._48_8_ = uStack_7510;
      auVar94._56_8_ = uStack_7508;
      auVar93._8_4_ = 0.3333333;
      auVar93._12_4_ = 0.3333333;
      auVar93._0_4_ = 0.3333333;
      auVar93._4_4_ = 0.3333333;
      auVar93._16_4_ = 0.3333333;
      auVar93._20_4_ = 0.3333333;
      auVar93._24_4_ = 0.3333333;
      auVar93._28_4_ = 0.3333333;
      auVar93._32_4_ = 0.3333333;
      auVar93._36_4_ = 0.3333333;
      auVar93._40_4_ = 0.3333333;
      auVar93._44_4_ = 0.3333333;
      auVar93._48_4_ = 0.3333333;
      auVar93._52_4_ = 0.3333333;
      auVar93._56_4_ = 0.3333333;
      auVar93._60_4_ = 0.3333333;
      auVar285 = vfmadd213ps_avx512f(auVar94,auVar285,auVar93);
      auVar85._16_8_ = uStack_7530;
      auVar85._0_16_ = local_7540;
      auVar85._24_8_ = uStack_7528;
      auVar85._32_8_ = uStack_7520;
      auVar85._40_8_ = uStack_7518;
      auVar85._48_8_ = uStack_7510;
      auVar85._56_8_ = uStack_7508;
      auVar285 = vmulps_avx512f(auVar285,auVar85);
      auVar285 = vmulps_avx512f(auVar285,auVar284);
      uStack_7628 = auVar19._24_8_;
      uStack_7620 = auVar276._32_8_;
      uStack_7618 = auVar277._40_8_;
      uStack_7610 = auVar278._48_8_;
      uStack_7608 = auVar283._56_8_;
      auVar92._16_8_ = uStack_7630;
      auVar92._0_16_ = local_7640;
      auVar92._24_8_ = uStack_7628;
      auVar92._32_8_ = uStack_7620;
      auVar92._40_8_ = uStack_7618;
      auVar92._48_8_ = uStack_7610;
      auVar92._56_8_ = uStack_7608;
      auVar91._8_4_ = -0.00021219444;
      auVar91._12_4_ = -0.00021219444;
      auVar91._0_4_ = -0.00021219444;
      auVar91._4_4_ = -0.00021219444;
      auVar91._16_4_ = -0.00021219444;
      auVar91._20_4_ = -0.00021219444;
      auVar91._24_4_ = -0.00021219444;
      auVar91._28_4_ = -0.00021219444;
      auVar91._32_4_ = -0.00021219444;
      auVar91._36_4_ = -0.00021219444;
      auVar91._40_4_ = -0.00021219444;
      auVar91._44_4_ = -0.00021219444;
      auVar91._48_4_ = -0.00021219444;
      auVar91._52_4_ = -0.00021219444;
      auVar91._56_4_ = -0.00021219444;
      auVar91._60_4_ = -0.00021219444;
      auVar283 = vfmadd213ps_avx512f(auVar91,auVar92,auVar285);
      auVar120._8_4_ = 0.5;
      auVar120._12_4_ = 0.5;
      auVar120._0_4_ = 0.5;
      auVar120._4_4_ = 0.5;
      auVar120._16_4_ = 0.5;
      auVar120._20_4_ = 0.5;
      auVar120._24_4_ = 0.5;
      auVar120._28_4_ = 0.5;
      auVar120._32_4_ = 0.5;
      auVar120._36_4_ = 0.5;
      auVar120._40_4_ = 0.5;
      auVar120._44_4_ = 0.5;
      auVar120._48_4_ = 0.5;
      auVar120._52_4_ = 0.5;
      auVar120._56_4_ = 0.5;
      auVar120._60_4_ = 0.5;
      auVar283 = vfnmadd213ps_avx512f(auVar120,auVar284,auVar283);
      auVar82._16_8_ = uStack_7530;
      auVar82._0_16_ = local_7540;
      auVar82._24_8_ = uStack_7528;
      auVar82._32_8_ = uStack_7520;
      auVar82._40_8_ = uStack_7518;
      auVar82._48_8_ = uStack_7510;
      auVar82._56_8_ = uStack_7508;
      auVar283 = vaddps_avx512f(auVar82,auVar283);
      auVar90._16_8_ = uStack_7630;
      auVar90._0_16_ = local_7640;
      auVar90._24_8_ = uStack_7628;
      auVar90._32_8_ = uStack_7620;
      auVar90._40_8_ = uStack_7618;
      auVar90._48_8_ = uStack_7610;
      auVar90._56_8_ = uStack_7608;
      auVar89._8_4_ = 0.6933594;
      auVar89._12_4_ = 0.6933594;
      auVar89._0_4_ = 0.6933594;
      auVar89._4_4_ = 0.6933594;
      auVar89._16_4_ = 0.6933594;
      auVar89._20_4_ = 0.6933594;
      auVar89._24_4_ = 0.6933594;
      auVar89._28_4_ = 0.6933594;
      auVar89._32_4_ = 0.6933594;
      auVar89._36_4_ = 0.6933594;
      auVar89._40_4_ = 0.6933594;
      auVar89._44_4_ = 0.6933594;
      auVar89._48_4_ = 0.6933594;
      auVar89._52_4_ = 0.6933594;
      auVar89._56_4_ = 0.6933594;
      auVar89._60_4_ = 0.6933594;
      auVar284 = vfmadd213ps_avx512f(auVar89,auVar90,auVar283);
      auVar283 = vpmovm2d_avx512dq(uVar26 & 0xffff);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpord_avx512f(auVar284,auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(*local_a5e0,auVar283);
      auVar81._8_4_ = 88.37626;
      auVar81._12_4_ = 88.37626;
      auVar81._0_4_ = 88.37626;
      auVar81._4_4_ = 88.37626;
      auVar81._16_4_ = 88.37626;
      auVar81._20_4_ = 88.37626;
      auVar81._24_4_ = 88.37626;
      auVar81._28_4_ = 88.37626;
      auVar81._32_4_ = 88.37626;
      auVar81._36_4_ = 88.37626;
      auVar81._40_4_ = 88.37626;
      auVar81._44_4_ = 88.37626;
      auVar81._48_4_ = 88.37626;
      auVar81._52_4_ = 88.37626;
      auVar81._56_4_ = 88.37626;
      auVar81._60_4_ = 88.37626;
      auVar283 = vminps_avx512f(auVar283,auVar81);
      auVar80._8_4_ = -88.37626;
      auVar80._12_4_ = -88.37626;
      auVar80._0_4_ = -88.37626;
      auVar80._4_4_ = -88.37626;
      auVar80._16_4_ = -88.37626;
      auVar80._20_4_ = -88.37626;
      auVar80._24_4_ = -88.37626;
      auVar80._28_4_ = -88.37626;
      auVar80._32_4_ = -88.37626;
      auVar80._36_4_ = -88.37626;
      auVar80._40_4_ = -88.37626;
      auVar80._44_4_ = -88.37626;
      auVar80._48_4_ = -88.37626;
      auVar80._52_4_ = -88.37626;
      auVar80._56_4_ = -88.37626;
      auVar80._60_4_ = -88.37626;
      auVar284 = vmaxps_avx512f(auVar283,auVar80);
      auVar117._8_4_ = 1.442695;
      auVar117._12_4_ = 1.442695;
      auVar117._0_4_ = 1.442695;
      auVar117._4_4_ = 1.442695;
      auVar117._16_4_ = 1.442695;
      auVar117._20_4_ = 1.442695;
      auVar117._24_4_ = 1.442695;
      auVar117._28_4_ = 1.442695;
      auVar117._32_4_ = 1.442695;
      auVar117._36_4_ = 1.442695;
      auVar117._40_4_ = 1.442695;
      auVar117._44_4_ = 1.442695;
      auVar117._48_4_ = 1.442695;
      auVar117._52_4_ = 1.442695;
      auVar117._56_4_ = 1.442695;
      auVar117._60_4_ = 1.442695;
      auVar116._8_4_ = 0.5;
      auVar116._12_4_ = 0.5;
      auVar116._0_4_ = 0.5;
      auVar116._4_4_ = 0.5;
      auVar116._16_4_ = 0.5;
      auVar116._20_4_ = 0.5;
      auVar116._24_4_ = 0.5;
      auVar116._28_4_ = 0.5;
      auVar116._32_4_ = 0.5;
      auVar116._36_4_ = 0.5;
      auVar116._40_4_ = 0.5;
      auVar116._44_4_ = 0.5;
      auVar116._48_4_ = 0.5;
      auVar116._52_4_ = 0.5;
      auVar116._56_4_ = 0.5;
      auVar116._60_4_ = 0.5;
      auVar283 = vfmadd213ps_avx512f(auVar117,auVar284,auVar116);
      auVar285 = vrndscaleps_avx512f(auVar283,1);
      uVar27 = vcmpps_avx512f(auVar283,auVar285,1);
      uVar28 = (ushort)uVar27;
      auVar119._8_4_ = 1.0;
      auVar119._12_4_ = 1.0;
      auVar119._0_4_ = 1.0;
      auVar119._4_4_ = 1.0;
      auVar119._16_4_ = 1.0;
      auVar119._20_4_ = 1.0;
      auVar119._24_4_ = 1.0;
      auVar119._28_4_ = 1.0;
      auVar119._32_4_ = 1.0;
      auVar119._36_4_ = 1.0;
      auVar119._40_4_ = 1.0;
      auVar119._44_4_ = 1.0;
      auVar119._48_4_ = 1.0;
      auVar119._52_4_ = 1.0;
      auVar119._56_4_ = 1.0;
      auVar119._60_4_ = 1.0;
      local_6200 = auVar285._0_4_;
      iStack_61fc = auVar285._4_4_;
      iStack_61f8 = auVar285._8_4_;
      iStack_61f4 = auVar285._12_4_;
      iStack_61f0 = auVar285._16_4_;
      iStack_61ec = auVar285._20_4_;
      iStack_61e8 = auVar285._24_4_;
      iStack_61e4 = auVar285._28_4_;
      iStack_61e0 = auVar285._32_4_;
      iStack_61dc = auVar285._36_4_;
      iStack_61d8 = auVar285._40_4_;
      iStack_61d4 = auVar285._44_4_;
      iStack_61d0 = auVar285._48_4_;
      iStack_61cc = auVar285._52_4_;
      iStack_61c8 = auVar285._56_4_;
      iStack_61c4 = auVar285._60_4_;
      auVar283 = vsubps_avx512f(auVar285,auVar119);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar27 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_7a80._4_4_ = (uint)bVar5 * auVar283._4_4_ | (uint)!bVar5 * iStack_61fc;
      local_7a80._0_4_ = (uint)bVar4 * auVar283._0_4_ | (uint)!bVar4 * local_6200;
      local_7a80._8_4_ = (uint)bVar6 * auVar283._8_4_ | (uint)!bVar6 * iStack_61f8;
      local_7a80._12_4_ = (uint)bVar7 * auVar283._12_4_ | (uint)!bVar7 * iStack_61f4;
      uStack_7a70._0_4_ = (uint)bVar8 * auVar283._16_4_ | (uint)!bVar8 * iStack_61f0;
      uStack_7a70._4_4_ = (uint)bVar9 * auVar283._20_4_ | (uint)!bVar9 * iStack_61ec;
      uStack_7a68._0_4_ = (uint)bVar10 * auVar283._24_4_ | (uint)!bVar10 * iStack_61e8;
      uStack_7a68._4_4_ = (uint)bVar11 * auVar283._28_4_ | (uint)!bVar11 * iStack_61e4;
      auVar19 = _local_7a80;
      uStack_7a60._0_4_ =
           (uint)(bVar12 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_61e0;
      uStack_7a60._4_4_ = (uint)bVar13 * auVar283._36_4_ | (uint)!bVar13 * iStack_61dc;
      auVar276 = _local_7a80;
      uStack_7a58._0_4_ = (uint)bVar14 * auVar283._40_4_ | (uint)!bVar14 * iStack_61d8;
      uStack_7a58._4_4_ = (uint)bVar15 * auVar283._44_4_ | (uint)!bVar15 * iStack_61d4;
      auVar277 = _local_7a80;
      uStack_7a50._0_4_ = (uint)bVar16 * auVar283._48_4_ | (uint)!bVar16 * iStack_61d0;
      uStack_7a50._4_4_ = (uint)bVar17 * auVar283._52_4_ | (uint)!bVar17 * iStack_61cc;
      auVar278 = _local_7a80;
      uStack_7a48._0_4_ = (uint)bVar18 * auVar283._56_4_ | (uint)!bVar18 * iStack_61c8;
      uStack_7a48._4_4_ =
           (uint)(bVar12 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_61c4;
      auVar283 = _local_7a80;
      uStack_7a68 = auVar19._24_8_;
      uStack_7a60 = auVar276._32_8_;
      uStack_7a58 = auVar277._40_8_;
      uStack_7a50 = auVar278._48_8_;
      uStack_7a48 = auVar283._56_8_;
      auVar124._16_8_ = uStack_7a70;
      auVar124._0_16_ = local_7a80;
      auVar124._24_8_ = uStack_7a68;
      auVar124._32_8_ = uStack_7a60;
      auVar124._40_8_ = uStack_7a58;
      auVar124._48_8_ = uStack_7a50;
      auVar124._56_8_ = uStack_7a48;
      auVar123._8_4_ = 0.6933594;
      auVar123._12_4_ = 0.6933594;
      auVar123._0_4_ = 0.6933594;
      auVar123._4_4_ = 0.6933594;
      auVar123._16_4_ = 0.6933594;
      auVar123._20_4_ = 0.6933594;
      auVar123._24_4_ = 0.6933594;
      auVar123._28_4_ = 0.6933594;
      auVar123._32_4_ = 0.6933594;
      auVar123._36_4_ = 0.6933594;
      auVar123._40_4_ = 0.6933594;
      auVar123._44_4_ = 0.6933594;
      auVar123._48_4_ = 0.6933594;
      auVar123._52_4_ = 0.6933594;
      auVar123._56_4_ = 0.6933594;
      auVar123._60_4_ = 0.6933594;
      auVar283 = vfnmadd213ps_avx512f(auVar123,auVar124,auVar284);
      auVar122._16_8_ = uStack_7a70;
      auVar122._0_16_ = local_7a80;
      auVar122._24_8_ = uStack_7a68;
      auVar122._32_8_ = uStack_7a60;
      auVar122._40_8_ = uStack_7a58;
      auVar122._48_8_ = uStack_7a50;
      auVar122._56_8_ = uStack_7a48;
      auVar121._8_4_ = -0.00021219444;
      auVar121._12_4_ = -0.00021219444;
      auVar121._0_4_ = -0.00021219444;
      auVar121._4_4_ = -0.00021219444;
      auVar121._16_4_ = -0.00021219444;
      auVar121._20_4_ = -0.00021219444;
      auVar121._24_4_ = -0.00021219444;
      auVar121._28_4_ = -0.00021219444;
      auVar121._32_4_ = -0.00021219444;
      auVar121._36_4_ = -0.00021219444;
      auVar121._40_4_ = -0.00021219444;
      auVar121._44_4_ = -0.00021219444;
      auVar121._48_4_ = -0.00021219444;
      auVar121._52_4_ = -0.00021219444;
      auVar121._56_4_ = -0.00021219444;
      auVar121._60_4_ = -0.00021219444;
      auVar283 = vfnmadd213ps_avx512f(auVar121,auVar122,auVar283);
      auVar284 = vmulps_avx512f(auVar283,auVar283);
      uStack_7b78._0_4_ = 0.00019875691;
      uStack_7b78._4_4_ = 0.00019875691;
      local_7b80._0_4_ = 0.00019875691;
      local_7b80._4_4_ = 0.00019875691;
      auVar115._16_4_ = 0.00019875691;
      auVar115._20_4_ = 0.00019875691;
      auVar115._0_16_ = _local_7b80;
      auVar115._24_4_ = 0.00019875691;
      auVar115._28_4_ = 0.00019875691;
      auVar115._32_4_ = 0.00019875691;
      auVar115._36_4_ = 0.00019875691;
      auVar115._40_4_ = 0.00019875691;
      auVar115._44_4_ = 0.00019875691;
      auVar115._48_4_ = 0.00019875691;
      auVar115._52_4_ = 0.00019875691;
      auVar115._56_4_ = 0.00019875691;
      auVar115._60_4_ = 0.00019875691;
      auVar114._8_4_ = 0.0013981999;
      auVar114._12_4_ = 0.0013981999;
      auVar114._0_4_ = 0.0013981999;
      auVar114._4_4_ = 0.0013981999;
      auVar114._16_4_ = 0.0013981999;
      auVar114._20_4_ = 0.0013981999;
      auVar114._24_4_ = 0.0013981999;
      auVar114._28_4_ = 0.0013981999;
      auVar114._32_4_ = 0.0013981999;
      auVar114._36_4_ = 0.0013981999;
      auVar114._40_4_ = 0.0013981999;
      auVar114._44_4_ = 0.0013981999;
      auVar114._48_4_ = 0.0013981999;
      auVar114._52_4_ = 0.0013981999;
      auVar114._56_4_ = 0.0013981999;
      auVar114._60_4_ = 0.0013981999;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar115,auVar114);
      auVar113._8_4_ = 0.008333452;
      auVar113._12_4_ = 0.008333452;
      auVar113._0_4_ = 0.008333452;
      auVar113._4_4_ = 0.008333452;
      auVar113._16_4_ = 0.008333452;
      auVar113._20_4_ = 0.008333452;
      auVar113._24_4_ = 0.008333452;
      auVar113._28_4_ = 0.008333452;
      auVar113._32_4_ = 0.008333452;
      auVar113._36_4_ = 0.008333452;
      auVar113._40_4_ = 0.008333452;
      auVar113._44_4_ = 0.008333452;
      auVar113._48_4_ = 0.008333452;
      auVar113._52_4_ = 0.008333452;
      auVar113._56_4_ = 0.008333452;
      auVar113._60_4_ = 0.008333452;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar113);
      auVar112._8_4_ = 0.041665796;
      auVar112._12_4_ = 0.041665796;
      auVar112._0_4_ = 0.041665796;
      auVar112._4_4_ = 0.041665796;
      auVar112._16_4_ = 0.041665796;
      auVar112._20_4_ = 0.041665796;
      auVar112._24_4_ = 0.041665796;
      auVar112._28_4_ = 0.041665796;
      auVar112._32_4_ = 0.041665796;
      auVar112._36_4_ = 0.041665796;
      auVar112._40_4_ = 0.041665796;
      auVar112._44_4_ = 0.041665796;
      auVar112._48_4_ = 0.041665796;
      auVar112._52_4_ = 0.041665796;
      auVar112._56_4_ = 0.041665796;
      auVar112._60_4_ = 0.041665796;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar112);
      auVar111._8_4_ = 0.16666666;
      auVar111._12_4_ = 0.16666666;
      auVar111._0_4_ = 0.16666666;
      auVar111._4_4_ = 0.16666666;
      auVar111._16_4_ = 0.16666666;
      auVar111._20_4_ = 0.16666666;
      auVar111._24_4_ = 0.16666666;
      auVar111._28_4_ = 0.16666666;
      auVar111._32_4_ = 0.16666666;
      auVar111._36_4_ = 0.16666666;
      auVar111._40_4_ = 0.16666666;
      auVar111._44_4_ = 0.16666666;
      auVar111._48_4_ = 0.16666666;
      auVar111._52_4_ = 0.16666666;
      auVar111._56_4_ = 0.16666666;
      auVar111._60_4_ = 0.16666666;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar111);
      auVar110._8_4_ = 0.5;
      auVar110._12_4_ = 0.5;
      auVar110._0_4_ = 0.5;
      auVar110._4_4_ = 0.5;
      auVar110._16_4_ = 0.5;
      auVar110._20_4_ = 0.5;
      auVar110._24_4_ = 0.5;
      auVar110._28_4_ = 0.5;
      auVar110._32_4_ = 0.5;
      auVar110._36_4_ = 0.5;
      auVar110._40_4_ = 0.5;
      auVar110._44_4_ = 0.5;
      auVar110._48_4_ = 0.5;
      auVar110._52_4_ = 0.5;
      auVar110._56_4_ = 0.5;
      auVar110._60_4_ = 0.5;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar110);
      auVar283 = vfmadd213ps_avx512f(auVar284,auVar285,auVar283);
      auVar79._8_4_ = 1.0;
      auVar79._12_4_ = 1.0;
      auVar79._0_4_ = 1.0;
      auVar79._4_4_ = 1.0;
      auVar79._16_4_ = 1.0;
      auVar79._20_4_ = 1.0;
      auVar79._24_4_ = 1.0;
      auVar79._28_4_ = 1.0;
      auVar79._32_4_ = 1.0;
      auVar79._36_4_ = 1.0;
      auVar79._40_4_ = 1.0;
      auVar79._44_4_ = 1.0;
      auVar79._48_4_ = 1.0;
      auVar79._52_4_ = 1.0;
      auVar79._56_4_ = 1.0;
      auVar79._60_4_ = 1.0;
      auVar285 = vaddps_avx512f(auVar283,auVar79);
      auVar125._16_8_ = uStack_7a70;
      auVar125._0_16_ = local_7a80;
      auVar125._24_8_ = uStack_7a68;
      auVar125._32_8_ = uStack_7a60;
      auVar125._40_8_ = uStack_7a58;
      auVar125._48_8_ = uStack_7a50;
      auVar125._56_8_ = uStack_7a48;
      auVar283 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar283);
      auVar283 = vcvttps2dq_avx512f(auVar125);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vpaddd_avx512f(auVar283,auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpslld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(auVar285,auVar283);
      local_7b80 = auVar283._0_8_;
      uStack_7b78 = auVar283._8_8_;
      uStack_7b70 = auVar283._16_8_;
      uStack_7b68 = auVar283._24_8_;
      uStack_7b60 = auVar283._32_8_;
      uStack_7b58 = auVar283._40_8_;
      uStack_7b50 = auVar283._48_8_;
      uStack_7b48 = auVar283._56_8_;
      *local_a5f0 = local_7b80;
      local_a5f0[1] = uStack_7b78;
      local_a5f0[2] = uStack_7b70;
      local_a5f0[3] = uStack_7b68;
      local_a5f0[4] = uStack_7b60;
      local_a5f0[5] = uStack_7b58;
      local_a5f0[6] = uStack_7b50;
      local_a5f0[7] = uStack_7b48;
      local_a5e0 = local_a5e0 + 1;
      local_a5e8 = local_a5e8 + 2;
      local_a5f0 = local_a5f0 + 8;
    }
    for (; local_a6c4 < in_ECX; local_a6c4 = local_a6c4 + 1) {
      uVar1 = *local_a5e8;
      auVar20 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(uVar1),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(uVar1),0x30);
      auVar21 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x30);
      uStack_a190 = auVar21._0_8_;
      uStack_a188 = auVar21._8_8_;
      auVar272._16_8_ = uStack_a190;
      auVar272._0_16_ = auVar20;
      auVar272._24_8_ = uStack_a188;
      auVar271._16_8_ = uStack_a190;
      auVar271._0_16_ = auVar20;
      auVar271._24_8_ = uStack_a188;
      auVar19 = vcmpps_avx(auVar271,ZEXT1632(ZEXT816(0)),2);
      auVar209._8_4_ = 0x800000;
      auVar209._0_8_ = 0x80000000800000;
      auVar209._12_4_ = 0x800000;
      auVar209._16_4_ = 0x800000;
      auVar209._20_4_ = 0x800000;
      auVar209._24_4_ = 0x800000;
      auVar209._28_4_ = 0x800000;
      auVar287 = vmaxps_avx(auVar272,auVar209);
      auVar25 = vpsrld_avx2(auVar287,ZEXT416(0x17));
      auVar211._8_4_ = 0x807fffff;
      auVar211._0_8_ = 0x807fffff807fffff;
      auVar211._12_4_ = 0x807fffff;
      auVar211._16_4_ = 0x807fffff;
      auVar211._20_4_ = 0x807fffff;
      auVar211._24_4_ = 0x807fffff;
      auVar211._28_4_ = 0x807fffff;
      auVar287 = vpand_avx2(auVar287,auVar211);
      auVar235._8_4_ = 0x3f000000;
      auVar235._0_8_ = 0x3f0000003f000000;
      auVar235._12_4_ = 0x3f000000;
      auVar235._16_4_ = 0x3f000000;
      auVar235._20_4_ = 0x3f000000;
      auVar235._24_4_ = 0x3f000000;
      auVar235._28_4_ = 0x3f000000;
      auVar24 = vpor_avx2(auVar287,auVar235);
      auVar236._8_8_ = 0x7f0000007f;
      auVar236._0_8_ = 0x7f0000007f;
      auVar236._16_8_ = 0x7f0000007f;
      auVar236._24_8_ = 0x7f0000007f;
      auVar287 = vpsubd_avx2(auVar25,auVar236);
      auVar287 = vcvtdq2ps_avx(auVar287);
      local_1ac0 = auVar287._0_4_;
      fStack_1abc = auVar287._4_4_;
      fStack_1ab8 = auVar287._8_4_;
      fStack_1ab4 = auVar287._12_4_;
      fStack_1ab0 = auVar287._16_4_;
      fStack_1aac = auVar287._20_4_;
      fStack_1aa8 = auVar287._24_4_;
      fStack_1aa4 = auVar287._28_4_;
      local_1c00._4_4_ = fStack_1abc + 1.0;
      local_1c00._0_4_ = local_1ac0 + 1.0;
      fStack_1bf8 = fStack_1ab8 + 1.0;
      fStack_1bf4 = fStack_1ab4 + 1.0;
      uStack_1bf0._0_4_ = fStack_1ab0 + 1.0;
      uStack_1bf0._4_4_ = fStack_1aac + 1.0;
      uStack_1be8._0_4_ = fStack_1aa8 + 1.0;
      uStack_1be8._4_4_ = fStack_1aa4 + 1.0;
      auVar207 = _local_1c00;
      auVar291._8_4_ = 0x3f3504f3;
      auVar291._0_8_ = 0x3f3504f33f3504f3;
      auVar291._12_4_ = 0x3f3504f3;
      auVar291._16_4_ = 0x3f3504f3;
      auVar291._20_4_ = 0x3f3504f3;
      auVar291._24_4_ = 0x3f3504f3;
      auVar291._28_4_ = 0x3f3504f3;
      auVar287 = vcmpps_avx(auVar24,auVar291,1);
      auVar25 = vpand_avx2(auVar24,auVar287);
      auVar208._8_8_ = 0x3f8000003f800000;
      auVar208._0_8_ = 0x3f8000003f800000;
      auVar208._16_8_ = 0x3f8000003f800000;
      auVar208._24_8_ = 0x3f8000003f800000;
      auVar24 = vsubps_avx(auVar24,auVar208);
      uStack_1be8 = auVar207._24_8_;
      auVar210._8_8_ = 0x3f8000003f800000;
      auVar210._0_8_ = 0x3f8000003f800000;
      auVar210._16_8_ = 0x3f8000003f800000;
      auVar210._24_8_ = 0x3f8000003f800000;
      auVar287 = vpand_avx2(auVar210,auVar287);
      auVar207._16_8_ = uStack_1bf0;
      auVar207._0_16_ = _local_1c00;
      auVar207._24_8_ = uStack_1be8;
      auVar287 = vsubps_avx(auVar207,auVar287);
      local_1b00 = auVar24._0_4_;
      fStack_1afc = auVar24._4_4_;
      fStack_1af8 = auVar24._8_4_;
      fStack_1af4 = auVar24._12_4_;
      fStack_1af0 = auVar24._16_4_;
      fStack_1aec = auVar24._20_4_;
      fStack_1ae8 = auVar24._24_4_;
      fStack_1ae4 = auVar24._28_4_;
      local_1b20 = auVar25._0_4_;
      fStack_1b1c = auVar25._4_4_;
      fStack_1b18 = auVar25._8_4_;
      fStack_1b14 = auVar25._12_4_;
      fStack_1b10 = auVar25._16_4_;
      fStack_1b0c = auVar25._20_4_;
      fStack_1b08 = auVar25._24_4_;
      fStack_1b04 = auVar25._28_4_;
      local_1b80._0_4_ = local_1b00 + local_1b20;
      local_1b80._4_4_ = fStack_1afc + fStack_1b1c;
      fStack_1b78 = fStack_1af8 + fStack_1b18;
      fStack_1b74 = fStack_1af4 + fStack_1b14;
      fStack_1b70 = fStack_1af0 + fStack_1b10;
      fStack_1b6c = fStack_1aec + fStack_1b0c;
      fStack_1b68 = fStack_1ae8 + fStack_1b08;
      fStack_1b64 = fStack_1ae4 + fStack_1b04;
      fStack_1c78 = 0.070376836;
      local_1c80 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_1c74 = 0.070376836;
      fStack_1c70 = 0.070376836;
      fStack_1c6c = 0.070376836;
      fStack_1c68 = 0.070376836;
      uStack_1c64 = 0x3d9021bb;
      auVar220._8_4_ = -0.1151461;
      auVar220._12_4_ = -0.1151461;
      auVar220._0_4_ = -0.1151461;
      auVar220._4_4_ = -0.1151461;
      auVar220._16_4_ = -0.1151461;
      auVar220._20_4_ = -0.1151461;
      auVar220._24_4_ = -0.1151461;
      auVar220._28_4_ = -0.1151461;
      auVar20 = vfmadd213ps_fma(_local_1b80,_local_1c80,auVar220);
      auVar221._8_4_ = 0.116769984;
      auVar221._12_4_ = 0.116769984;
      auVar221._0_4_ = 0.116769984;
      auVar221._4_4_ = 0.116769984;
      auVar221._16_4_ = 0.116769984;
      auVar221._20_4_ = 0.116769984;
      auVar221._24_4_ = 0.116769984;
      auVar221._28_4_ = 0.116769984;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar221);
      auVar222._8_4_ = -0.12420141;
      auVar222._12_4_ = -0.12420141;
      auVar222._0_4_ = -0.12420141;
      auVar222._4_4_ = -0.12420141;
      auVar222._16_4_ = -0.12420141;
      auVar222._20_4_ = -0.12420141;
      auVar222._24_4_ = -0.12420141;
      auVar222._28_4_ = -0.12420141;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar222);
      auVar223._8_4_ = 0.14249323;
      auVar223._12_4_ = 0.14249323;
      auVar223._0_4_ = 0.14249323;
      auVar223._4_4_ = 0.14249323;
      auVar223._16_4_ = 0.14249323;
      auVar223._20_4_ = 0.14249323;
      auVar223._24_4_ = 0.14249323;
      auVar223._28_4_ = 0.14249323;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar223);
      auVar224._8_4_ = -0.16668057;
      auVar224._12_4_ = -0.16668057;
      auVar224._0_4_ = -0.16668057;
      auVar224._4_4_ = -0.16668057;
      auVar224._16_4_ = -0.16668057;
      auVar224._20_4_ = -0.16668057;
      auVar224._24_4_ = -0.16668057;
      auVar224._28_4_ = -0.16668057;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar224);
      auVar225._8_4_ = 0.20000714;
      auVar225._12_4_ = 0.20000714;
      auVar225._0_4_ = 0.20000714;
      auVar225._4_4_ = 0.20000714;
      auVar225._16_4_ = 0.20000714;
      auVar225._20_4_ = 0.20000714;
      auVar225._24_4_ = 0.20000714;
      auVar225._28_4_ = 0.20000714;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar225);
      auVar226._8_4_ = -0.24999994;
      auVar226._12_4_ = -0.24999994;
      auVar226._0_4_ = -0.24999994;
      auVar226._4_4_ = -0.24999994;
      auVar226._16_4_ = -0.24999994;
      auVar226._20_4_ = -0.24999994;
      auVar226._24_4_ = -0.24999994;
      auVar226._28_4_ = -0.24999994;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar226);
      auVar227._8_4_ = 0.3333333;
      auVar227._12_4_ = 0.3333333;
      auVar227._0_4_ = 0.3333333;
      auVar227._4_4_ = 0.3333333;
      auVar227._16_4_ = 0.3333333;
      auVar227._20_4_ = 0.3333333;
      auVar227._24_4_ = 0.3333333;
      auVar227._28_4_ = 0.3333333;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar227);
      local_19c0 = auVar20._0_4_;
      fStack_19bc = auVar20._4_4_;
      fStack_19b8 = auVar20._8_4_;
      fStack_19b4 = auVar20._12_4_;
      local_1c80._4_4_ =
           fStack_19bc * (float)local_1b80._4_4_ * (float)local_1b80._4_4_ * (float)local_1b80._4_4_
      ;
      local_1c80._0_4_ =
           local_19c0 * (float)local_1b80._0_4_ * (float)local_1b80._0_4_ * (float)local_1b80._0_4_;
      fStack_1c78 = fStack_19b8 * fStack_1b78 * fStack_1b78 * fStack_1b78;
      fStack_1c74 = fStack_19b4 * fStack_1b74 * fStack_1b74 * fStack_1b74;
      fStack_1c70 = fStack_1b70 * 0.0 * fStack_1b70 * fStack_1b70;
      fStack_1c6c = fStack_1b6c * 0.0 * fStack_1b6c * fStack_1b6c;
      fStack_1c68 = fStack_1b68 * 0.0 * fStack_1b68 * fStack_1b68;
      uStack_1c64 = 0;
      auVar228._8_4_ = -0.00021219444;
      auVar228._12_4_ = -0.00021219444;
      auVar228._0_4_ = -0.00021219444;
      auVar228._4_4_ = -0.00021219444;
      auVar228._16_4_ = -0.00021219444;
      auVar228._20_4_ = -0.00021219444;
      auVar228._24_4_ = -0.00021219444;
      auVar228._28_4_ = -0.00021219444;
      auVar20 = vfmadd213ps_fma(auVar228,auVar287,_local_1c80);
      auVar274._4_4_ = (float)local_1b80._4_4_ * (float)local_1b80._4_4_;
      auVar274._0_4_ = (float)local_1b80._0_4_ * (float)local_1b80._0_4_;
      auVar274._8_4_ = fStack_1b78 * fStack_1b78;
      auVar274._12_4_ = fStack_1b74 * fStack_1b74;
      auVar274._16_4_ = fStack_1b70 * fStack_1b70;
      auVar274._20_4_ = fStack_1b6c * fStack_1b6c;
      auVar274._24_4_ = fStack_1b68 * fStack_1b68;
      auVar274._28_4_ = fStack_1b64;
      auVar232._8_4_ = 0.5;
      auVar232._12_4_ = 0.5;
      auVar232._0_4_ = 0.5;
      auVar232._4_4_ = 0.5;
      auVar232._16_4_ = 0.5;
      auVar232._20_4_ = 0.5;
      auVar232._24_4_ = 0.5;
      auVar232._28_4_ = 0.5;
      auVar20 = vfnmadd213ps_fma(auVar232,auVar274,ZEXT1632(auVar20));
      local_1b60 = auVar20._0_4_;
      fStack_1b5c = auVar20._4_4_;
      fStack_1b58 = auVar20._8_4_;
      fStack_1b54 = auVar20._12_4_;
      local_1b80._4_4_ = (float)local_1b80._4_4_ + fStack_1b5c;
      local_1b80._0_4_ = (float)local_1b80._0_4_ + local_1b60;
      fStack_1b78 = fStack_1b78 + fStack_1b58;
      fStack_1b74 = fStack_1b74 + fStack_1b54;
      fStack_1b70 = fStack_1b70 + 0.0;
      fStack_1b6c = fStack_1b6c + 0.0;
      fStack_1b68 = fStack_1b68 + 0.0;
      fStack_1b64 = fStack_1b64 + 0.0;
      auVar229._8_4_ = 0.6933594;
      auVar229._12_4_ = 0.6933594;
      auVar229._0_4_ = 0.6933594;
      auVar229._4_4_ = 0.6933594;
      auVar229._16_4_ = 0.6933594;
      auVar229._20_4_ = 0.6933594;
      auVar229._24_4_ = 0.6933594;
      auVar229._28_4_ = 0.6933594;
      auVar20 = vfmadd213ps_fma(auVar229,auVar287,_local_1b80);
      auVar19 = vpor_avx2(ZEXT1632(auVar20),auVar19);
      local_1f20 = (float)*(undefined8 *)*local_a5e0;
      fStack_1f1c = (float)((ulong)*(undefined8 *)*local_a5e0 >> 0x20);
      fStack_1f18 = (float)*(undefined8 *)(*local_a5e0 + 8);
      fStack_1f14 = (float)((ulong)*(undefined8 *)(*local_a5e0 + 8) >> 0x20);
      fStack_1f10 = (float)*(undefined8 *)(*local_a5e0 + 0x10);
      fStack_1f0c = (float)((ulong)*(undefined8 *)(*local_a5e0 + 0x10) >> 0x20);
      fStack_1f08 = (float)*(undefined8 *)(*local_a5e0 + 0x18);
      uStack_1f04 = (undefined4)((ulong)*(undefined8 *)(*local_a5e0 + 0x18) >> 0x20);
      local_1f40 = auVar19._0_4_;
      fStack_1f3c = auVar19._4_4_;
      fStack_1f38 = auVar19._8_4_;
      fStack_1f34 = auVar19._12_4_;
      fStack_1f30 = auVar19._16_4_;
      fStack_1f2c = auVar19._20_4_;
      fStack_1f28 = auVar19._24_4_;
      local_1e20._4_4_ = fStack_1f1c * fStack_1f3c;
      local_1e20._0_4_ = local_1f20 * local_1f40;
      fStack_1e18 = fStack_1f18 * fStack_1f38;
      fStack_1e14 = fStack_1f14 * fStack_1f34;
      uStack_1e10._0_4_ = fStack_1f10 * fStack_1f30;
      uStack_1e10._4_4_ = fStack_1f0c * fStack_1f2c;
      uStack_1e08._0_4_ = fStack_1f08 * fStack_1f28;
      uStack_1e08._4_4_ = uStack_1f04;
      auVar19 = _local_1e20;
      uStack_1e08 = auVar19._24_8_;
      auVar25._16_8_ = uStack_1e10;
      auVar25._0_16_ = _local_1e20;
      auVar25._24_8_ = uStack_1e08;
      auVar24._8_4_ = 0x42b0c0a5;
      auVar24._0_8_ = 0x42b0c0a542b0c0a5;
      auVar24._12_4_ = 0x42b0c0a5;
      auVar24._16_4_ = 0x42b0c0a5;
      auVar24._20_4_ = 0x42b0c0a5;
      auVar24._24_4_ = 0x42b0c0a5;
      auVar24._28_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx(auVar25,auVar24);
      auVar287._8_4_ = 0xc2b0c0a5;
      auVar287._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar287._12_4_ = 0xc2b0c0a5;
      auVar287._16_4_ = 0xc2b0c0a5;
      auVar287._20_4_ = 0xc2b0c0a5;
      auVar287._24_4_ = 0xc2b0c0a5;
      auVar287._28_4_ = 0xc2b0c0a5;
      auVar287 = vmaxps_avx(auVar19,auVar287);
      auVar214._8_4_ = 1.442695;
      auVar214._12_4_ = 1.442695;
      auVar214._0_4_ = 1.442695;
      auVar214._4_4_ = 1.442695;
      auVar214._16_4_ = 1.442695;
      auVar214._20_4_ = 1.442695;
      auVar214._24_4_ = 1.442695;
      auVar214._28_4_ = 1.442695;
      auVar213._8_4_ = 0.5;
      auVar213._12_4_ = 0.5;
      auVar213._0_4_ = 0.5;
      auVar213._4_4_ = 0.5;
      auVar213._16_4_ = 0.5;
      auVar213._20_4_ = 0.5;
      auVar213._24_4_ = 0.5;
      auVar213._28_4_ = 0.5;
      auVar20 = vfmadd213ps_fma(auVar214,auVar287,auVar213);
      auVar24 = vroundps_avx(ZEXT1632(auVar20),1);
      auVar19 = vcmpps_avx(ZEXT1632(auVar20),auVar24,1);
      auVar212._8_8_ = 0x3f8000003f800000;
      auVar212._0_8_ = 0x3f8000003f800000;
      auVar212._16_8_ = 0x3f8000003f800000;
      auVar212._24_8_ = 0x3f8000003f800000;
      auVar19 = vpand_avx2(auVar19,auVar212);
      auVar19 = vsubps_avx(auVar24,auVar19);
      auVar230._8_4_ = 0.6933594;
      auVar230._12_4_ = 0.6933594;
      auVar230._0_4_ = 0.6933594;
      auVar230._4_4_ = 0.6933594;
      auVar230._16_4_ = 0.6933594;
      auVar230._20_4_ = 0.6933594;
      auVar230._24_4_ = 0.6933594;
      auVar230._28_4_ = 0.6933594;
      auVar20 = vfnmadd213ps_fma(auVar230,auVar19,auVar287);
      auVar231._8_4_ = -0.00021219444;
      auVar231._12_4_ = -0.00021219444;
      auVar231._0_4_ = -0.00021219444;
      auVar231._4_4_ = -0.00021219444;
      auVar231._16_4_ = -0.00021219444;
      auVar231._20_4_ = -0.00021219444;
      auVar231._24_4_ = -0.00021219444;
      auVar231._28_4_ = -0.00021219444;
      auVar20 = vfnmadd213ps_fma(auVar231,auVar19,ZEXT1632(auVar20));
      auVar287 = ZEXT1632(auVar20);
      local_1d20 = auVar20._0_4_;
      fStack_1d1c = auVar20._4_4_;
      fStack_1d18 = auVar20._8_4_;
      fStack_1d14 = auVar20._12_4_;
      _local_1e40 = ZEXT1632(CONCAT412(fStack_1d14 * fStack_1d14,
                                       CONCAT48(fStack_1d18 * fStack_1d18,
                                                CONCAT44(fStack_1d1c * fStack_1d1c,
                                                         local_1d20 * local_1d20))));
      uStack_1ed8._0_4_ = 0x39506967;
      local_1ee0 = (undefined1  [8])0x3950696739506967;
      uStack_1ed8._4_4_ = 0x39506967;
      uStack_1ed0._0_4_ = 0x39506967;
      uStack_1ed0._4_4_ = 0x39506967;
      uStack_1ec8._0_4_ = 0x39506967;
      uStack_1ec8._4_4_ = 0x39506967;
      auVar215._8_4_ = 0.0013981999;
      auVar215._12_4_ = 0.0013981999;
      auVar215._0_4_ = 0.0013981999;
      auVar215._4_4_ = 0.0013981999;
      auVar215._16_4_ = 0.0013981999;
      auVar215._20_4_ = 0.0013981999;
      auVar215._24_4_ = 0.0013981999;
      auVar215._28_4_ = 0.0013981999;
      auVar20 = vfmadd213ps_fma(auVar287,_local_1ee0,auVar215);
      auVar216._8_4_ = 0.008333452;
      auVar216._12_4_ = 0.008333452;
      auVar216._0_4_ = 0.008333452;
      auVar216._4_4_ = 0.008333452;
      auVar216._16_4_ = 0.008333452;
      auVar216._20_4_ = 0.008333452;
      auVar216._24_4_ = 0.008333452;
      auVar216._28_4_ = 0.008333452;
      auVar20 = vfmadd213ps_fma(auVar287,ZEXT1632(auVar20),auVar216);
      auVar217._8_4_ = 0.041665796;
      auVar217._12_4_ = 0.041665796;
      auVar217._0_4_ = 0.041665796;
      auVar217._4_4_ = 0.041665796;
      auVar217._16_4_ = 0.041665796;
      auVar217._20_4_ = 0.041665796;
      auVar217._24_4_ = 0.041665796;
      auVar217._28_4_ = 0.041665796;
      auVar20 = vfmadd213ps_fma(auVar287,ZEXT1632(auVar20),auVar217);
      auVar218._8_4_ = 0.16666666;
      auVar218._12_4_ = 0.16666666;
      auVar218._0_4_ = 0.16666666;
      auVar218._4_4_ = 0.16666666;
      auVar218._16_4_ = 0.16666666;
      auVar218._20_4_ = 0.16666666;
      auVar218._24_4_ = 0.16666666;
      auVar218._28_4_ = 0.16666666;
      auVar20 = vfmadd213ps_fma(auVar287,ZEXT1632(auVar20),auVar218);
      auVar219._8_4_ = 0.5;
      auVar219._12_4_ = 0.5;
      auVar219._0_4_ = 0.5;
      auVar219._4_4_ = 0.5;
      auVar219._16_4_ = 0.5;
      auVar219._20_4_ = 0.5;
      auVar219._24_4_ = 0.5;
      auVar219._28_4_ = 0.5;
      auVar20 = vfmadd213ps_fma(auVar287,ZEXT1632(auVar20),auVar219);
      auVar20 = vfmadd213ps_fma(_local_1e40,ZEXT1632(auVar20),auVar287);
      local_1de0 = auVar20._0_4_;
      fStack_1ddc = auVar20._4_4_;
      fStack_1dd8 = auVar20._8_4_;
      fStack_1dd4 = auVar20._12_4_;
      local_15e0 = auVar19._0_4_;
      fStack_15dc = auVar19._4_4_;
      fStack_15d8 = auVar19._8_4_;
      fStack_15d4 = auVar19._12_4_;
      fStack_15d0 = auVar19._16_4_;
      fStack_15cc = auVar19._20_4_;
      fStack_15c8 = auVar19._24_4_;
      fStack_15c4 = auVar19._28_4_;
      local_1e80._4_4_ = (int)fStack_15dc;
      local_1e80._0_4_ = (int)local_15e0;
      local_1e80._8_4_ = (int)fStack_15d8;
      local_1e80._12_4_ = (int)fStack_15d4;
      uStack_1e70._0_4_ = (int)fStack_15d0;
      uStack_1e70._4_4_ = (int)fStack_15cc;
      uStack_1e68._0_4_ = (int)fStack_15c8;
      uStack_1e68._4_4_ = (int)fStack_15c4;
      auVar19 = _local_1e80;
      uStack_1e68 = auVar19._24_8_;
      auVar234._16_8_ = uStack_1e70;
      auVar234._0_16_ = local_1e80;
      auVar234._24_8_ = uStack_1e68;
      auVar233._8_8_ = 0x7f0000007f;
      auVar233._0_8_ = 0x7f0000007f;
      auVar233._16_8_ = 0x7f0000007f;
      auVar233._24_8_ = 0x7f0000007f;
      auVar19 = vpaddd_avx2(auVar234,auVar233);
      auVar19 = vpslld_avx2(auVar19,ZEXT416(0x17));
      local_1d80 = auVar19._0_4_;
      fStack_1d7c = auVar19._4_4_;
      fStack_1d78 = auVar19._8_4_;
      fStack_1d74 = auVar19._12_4_;
      fStack_1d70 = auVar19._16_4_;
      fStack_1d6c = auVar19._20_4_;
      fStack_1d68 = auVar19._24_4_;
      local_1ee0._4_4_ = (fStack_1ddc + 1.0) * fStack_1d7c;
      local_1ee0._0_4_ = (local_1de0 + 1.0) * local_1d80;
      uStack_1ed8._0_4_ = (fStack_1dd8 + 1.0) * fStack_1d78;
      uStack_1ed8._4_4_ = (fStack_1dd4 + 1.0) * fStack_1d74;
      uStack_1ed0._0_4_ = fStack_1d70 * 1.0;
      uStack_1ed0._4_4_ = fStack_1d6c * 1.0;
      auVar282 = _local_1ee0;
      uStack_1ec8._0_4_ = fStack_1d68 * 1.0;
      uStack_1ec8._4_4_ = 0x3f800000;
      auVar19 = _local_1ee0;
      uStack_1ed0 = auVar282._16_8_;
      uStack_1ec8 = auVar19._24_8_;
      *local_a5f0 = local_1ee0;
      local_a5f0[1] = uStack_1ed8;
      local_a5f0[2] = uStack_1ed0;
      local_a5f0[3] = uStack_1ec8;
      local_a5e0 = (undefined1 (*) [64])(*local_a5e0 + 0x20);
      local_a5e8 = local_a5e8 + 1;
      local_a5f0 = local_a5f0 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_a864 = 0; local_a864 + 3 < in_ECX; local_a864 = local_a864 + 4) {
      uVar1 = *local_a5e8;
      uVar2 = local_a5e8[1];
      uVar3 = local_a5e8[2];
      auVar29._4_4_ = uVar3;
      auVar29._0_4_ = uVar3;
      auVar29._12_4_ = uVar3;
      auVar29._8_4_ = uVar3;
      uVar3 = local_a5e8[3];
      auVar29._20_4_ = uVar3;
      auVar29._16_4_ = uVar3;
      auVar29._28_4_ = uVar3;
      auVar29._24_4_ = uVar3;
      auVar283 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(CONCAT44(uVar2,uVar2),
                                               CONCAT816(CONCAT44(uVar2,uVar2),
                                                         CONCAT88(CONCAT44(uVar1,uVar1),
                                                                  CONCAT44(uVar1,uVar1))))),auVar29,
                            1);
      uVar26 = vcmpps_avx512f(auVar283,ZEXT1664(ZEXT816(0)),2);
      auVar39._8_4_ = 0x800000;
      auVar39._12_4_ = 0x800000;
      auVar39._0_4_ = 0x800000;
      auVar39._4_4_ = 0x800000;
      auVar39._16_4_ = 0x800000;
      auVar39._20_4_ = 0x800000;
      auVar39._24_4_ = 0x800000;
      auVar39._28_4_ = 0x800000;
      auVar39._32_4_ = 0x800000;
      auVar39._36_4_ = 0x800000;
      auVar39._40_4_ = 0x800000;
      auVar39._44_4_ = 0x800000;
      auVar39._48_4_ = 0x800000;
      auVar39._52_4_ = 0x800000;
      auVar39._56_4_ = 0x800000;
      auVar39._60_4_ = 0x800000;
      auVar284 = vmaxps_avx512f(auVar283,auVar39);
      auVar283 = vmovdqa64_avx512f(auVar284);
      auVar283 = vpsrld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar77._8_4_ = -0x7f800001;
      auVar77._12_4_ = -0x7f800001;
      auVar77._0_4_ = -0x7f800001;
      auVar77._4_4_ = -0x7f800001;
      auVar77._16_4_ = -0x7f800001;
      auVar77._20_4_ = -0x7f800001;
      auVar77._24_4_ = -0x7f800001;
      auVar77._28_4_ = -0x7f800001;
      auVar77._32_4_ = -0x7f800001;
      auVar77._36_4_ = -0x7f800001;
      auVar77._40_4_ = -0x7f800001;
      auVar77._44_4_ = -0x7f800001;
      auVar77._48_4_ = -0x7f800001;
      auVar77._52_4_ = -0x7f800001;
      auVar77._56_4_ = -0x7f800001;
      auVar77._60_4_ = -0x7f800001;
      auVar285 = vmovdqa64_avx512f(auVar77);
      auVar284 = vpandd_avx512f(auVar284,auVar285);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar78._8_4_ = 0.5;
      auVar78._12_4_ = 0.5;
      auVar78._0_4_ = 0.5;
      auVar78._4_4_ = 0.5;
      auVar78._16_4_ = 0.5;
      auVar78._20_4_ = 0.5;
      auVar78._24_4_ = 0.5;
      auVar78._28_4_ = 0.5;
      auVar78._32_4_ = 0.5;
      auVar78._36_4_ = 0.5;
      auVar78._40_4_ = 0.5;
      auVar78._44_4_ = 0.5;
      auVar78._48_4_ = 0.5;
      auVar78._52_4_ = 0.5;
      auVar78._56_4_ = 0.5;
      auVar78._60_4_ = 0.5;
      auVar285 = vmovdqa64_avx512f(auVar78);
      auVar284 = vpord_avx512f(auVar284,auVar285);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar285 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar285 = vmovdqa64_avx512f(auVar285);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar285 = vmovdqa64_avx512f(auVar285);
      auVar283 = vpsubd_avx512f(auVar283,auVar285);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vcvtdq2ps_avx512f(auVar283);
      auVar34._8_4_ = 1.0;
      auVar34._12_4_ = 1.0;
      auVar34._0_4_ = 1.0;
      auVar34._4_4_ = 1.0;
      auVar34._16_4_ = 1.0;
      auVar34._20_4_ = 1.0;
      auVar34._24_4_ = 1.0;
      auVar34._28_4_ = 1.0;
      auVar34._32_4_ = 1.0;
      auVar34._36_4_ = 1.0;
      auVar34._40_4_ = 1.0;
      auVar34._44_4_ = 1.0;
      auVar34._48_4_ = 1.0;
      auVar34._52_4_ = 1.0;
      auVar34._56_4_ = 1.0;
      auVar34._60_4_ = 1.0;
      auVar283 = vaddps_avx512f(auVar283,auVar34);
      uVar27 = vcmpps_avx512f(auVar284,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar28 = (ushort)uVar27;
      auVar35._8_4_ = 1.0;
      auVar35._12_4_ = 1.0;
      auVar35._0_4_ = 1.0;
      auVar35._4_4_ = 1.0;
      auVar35._16_4_ = 1.0;
      auVar35._20_4_ = 1.0;
      auVar35._24_4_ = 1.0;
      auVar35._28_4_ = 1.0;
      auVar35._32_4_ = 1.0;
      auVar35._36_4_ = 1.0;
      auVar35._40_4_ = 1.0;
      auVar35._44_4_ = 1.0;
      auVar35._48_4_ = 1.0;
      auVar35._52_4_ = 1.0;
      auVar35._56_4_ = 1.0;
      auVar35._60_4_ = 1.0;
      auVar285 = vsubps_avx512f(auVar284,auVar35);
      auVar69._8_4_ = 1.0;
      auVar69._12_4_ = 1.0;
      auVar69._0_4_ = 1.0;
      auVar69._4_4_ = 1.0;
      auVar69._16_4_ = 1.0;
      auVar69._20_4_ = 1.0;
      auVar69._24_4_ = 1.0;
      auVar69._28_4_ = 1.0;
      auVar69._32_4_ = 1.0;
      auVar69._36_4_ = 1.0;
      auVar69._40_4_ = 1.0;
      auVar69._44_4_ = 1.0;
      auVar69._48_4_ = 1.0;
      auVar69._52_4_ = 1.0;
      auVar69._56_4_ = 1.0;
      auVar69._60_4_ = 1.0;
      local_8800 = auVar283._0_4_;
      iStack_87fc = auVar283._4_4_;
      iStack_87f8 = auVar283._8_4_;
      iStack_87f4 = auVar283._12_4_;
      iStack_87f0 = auVar283._16_4_;
      iStack_87ec = auVar283._20_4_;
      iStack_87e8 = auVar283._24_4_;
      iStack_87e4 = auVar283._28_4_;
      iStack_87e0 = auVar283._32_4_;
      iStack_87dc = auVar283._36_4_;
      iStack_87d8 = auVar283._40_4_;
      iStack_87d4 = auVar283._44_4_;
      iStack_87d0 = auVar283._48_4_;
      iStack_87cc = auVar283._52_4_;
      iStack_87c8 = auVar283._56_4_;
      iStack_87c4 = auVar283._60_4_;
      auVar283 = vsubps_avx512f(auVar283,auVar69);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar27 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_9ac0._4_4_ = (uint)bVar5 * auVar283._4_4_ | (uint)!bVar5 * iStack_87fc;
      local_9ac0._0_4_ = (uint)bVar4 * auVar283._0_4_ | (uint)!bVar4 * local_8800;
      local_9ac0._8_4_ = (uint)bVar6 * auVar283._8_4_ | (uint)!bVar6 * iStack_87f8;
      local_9ac0._12_4_ = (uint)bVar7 * auVar283._12_4_ | (uint)!bVar7 * iStack_87f4;
      uStack_9ab0._0_4_ = (uint)bVar8 * auVar283._16_4_ | (uint)!bVar8 * iStack_87f0;
      uStack_9ab0._4_4_ = (uint)bVar9 * auVar283._20_4_ | (uint)!bVar9 * iStack_87ec;
      uStack_9aa8._0_4_ = (uint)bVar10 * auVar283._24_4_ | (uint)!bVar10 * iStack_87e8;
      uStack_9aa8._4_4_ = (uint)bVar11 * auVar283._28_4_ | (uint)!bVar11 * iStack_87e4;
      auVar19 = _local_9ac0;
      uStack_9aa0._0_4_ =
           (uint)(bVar12 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_87e0;
      uStack_9aa0._4_4_ = (uint)bVar13 * auVar283._36_4_ | (uint)!bVar13 * iStack_87dc;
      auVar276 = _local_9ac0;
      uStack_9a98._0_4_ = (uint)bVar14 * auVar283._40_4_ | (uint)!bVar14 * iStack_87d8;
      uStack_9a98._4_4_ = (uint)bVar15 * auVar283._44_4_ | (uint)!bVar15 * iStack_87d4;
      auVar277 = _local_9ac0;
      uStack_9a90._0_4_ = (uint)bVar16 * auVar283._48_4_ | (uint)!bVar16 * iStack_87d0;
      uStack_9a90._4_4_ = (uint)bVar17 * auVar283._52_4_ | (uint)!bVar17 * iStack_87cc;
      auVar278 = _local_9ac0;
      uStack_9a88._0_4_ = (uint)bVar18 * auVar283._56_4_ | (uint)!bVar18 * iStack_87c8;
      uStack_9a88._4_4_ =
           (uint)(bVar12 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_87c4;
      auVar283 = _local_9ac0;
      local_7dc0 = auVar285._0_4_;
      iStack_7dbc = auVar285._4_4_;
      iStack_7db8 = auVar285._8_4_;
      iStack_7db4 = auVar285._12_4_;
      iStack_7db0 = auVar285._16_4_;
      iStack_7dac = auVar285._20_4_;
      iStack_7da8 = auVar285._24_4_;
      iStack_7da4 = auVar285._28_4_;
      iStack_7da0 = auVar285._32_4_;
      iStack_7d9c = auVar285._36_4_;
      iStack_7d98 = auVar285._40_4_;
      iStack_7d94 = auVar285._44_4_;
      iStack_7d90 = auVar285._48_4_;
      iStack_7d8c = auVar285._52_4_;
      iStack_7d88 = auVar285._56_4_;
      iStack_7d84 = auVar285._60_4_;
      auVar284 = vaddps_avx512f(auVar285,auVar284);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_99c0._4_4_ = (uint)bVar5 * auVar284._4_4_ | (uint)!bVar5 * iStack_7dbc;
      local_99c0._0_4_ = (uint)bVar4 * auVar284._0_4_ | (uint)!bVar4 * local_7dc0;
      local_99c0._8_4_ = (uint)bVar6 * auVar284._8_4_ | (uint)!bVar6 * iStack_7db8;
      local_99c0._12_4_ = (uint)bVar7 * auVar284._12_4_ | (uint)!bVar7 * iStack_7db4;
      uStack_99b0._0_4_ = (uint)bVar8 * auVar284._16_4_ | (uint)!bVar8 * iStack_7db0;
      uStack_99b0._4_4_ = (uint)bVar9 * auVar284._20_4_ | (uint)!bVar9 * iStack_7dac;
      uStack_99a8._0_4_ = (uint)bVar10 * auVar284._24_4_ | (uint)!bVar10 * iStack_7da8;
      uStack_99a8._4_4_ = (uint)bVar11 * auVar284._28_4_ | (uint)!bVar11 * iStack_7da4;
      auVar287 = _local_99c0;
      uStack_99a0._0_4_ =
           (uint)(bVar12 & 1) * auVar284._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_7da0;
      uStack_99a0._4_4_ = (uint)bVar13 * auVar284._36_4_ | (uint)!bVar13 * iStack_7d9c;
      auVar279 = _local_99c0;
      uStack_9998._0_4_ = (uint)bVar14 * auVar284._40_4_ | (uint)!bVar14 * iStack_7d98;
      uStack_9998._4_4_ = (uint)bVar15 * auVar284._44_4_ | (uint)!bVar15 * iStack_7d94;
      auVar280 = _local_99c0;
      uStack_9990._0_4_ = (uint)bVar16 * auVar284._48_4_ | (uint)!bVar16 * iStack_7d90;
      uStack_9990._4_4_ = (uint)bVar17 * auVar284._52_4_ | (uint)!bVar17 * iStack_7d8c;
      auVar281 = _local_99c0;
      uStack_9988._0_4_ = (uint)bVar18 * auVar284._56_4_ | (uint)!bVar18 * iStack_7d88;
      uStack_9988._4_4_ =
           (uint)(bVar12 >> 7) * auVar284._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_7d84;
      auVar284 = _local_99c0;
      uStack_99a8 = auVar287._24_8_;
      uStack_99a0 = auVar279._32_8_;
      uStack_9998 = auVar280._40_8_;
      uStack_9990 = auVar281._48_8_;
      uStack_9988 = auVar284._56_8_;
      auVar38._16_8_ = uStack_99b0;
      auVar38._0_16_ = local_99c0;
      auVar38._24_8_ = uStack_99a8;
      auVar38._32_8_ = uStack_99a0;
      auVar38._40_8_ = uStack_9998;
      auVar38._48_8_ = uStack_9990;
      auVar38._56_8_ = uStack_9988;
      auVar37._16_8_ = uStack_99b0;
      auVar37._0_16_ = local_99c0;
      auVar37._24_8_ = uStack_99a8;
      auVar37._32_8_ = uStack_99a0;
      auVar37._40_8_ = uStack_9998;
      auVar37._48_8_ = uStack_9990;
      auVar37._56_8_ = uStack_9988;
      auVar284 = vmulps_avx512f(auVar38,auVar37);
      local_9bc0._8_4_ = 0.070376836;
      local_9bc0._12_4_ = 0.070376836;
      local_9bc0._0_4_ = 0.070376836;
      local_9bc0._4_4_ = 0.070376836;
      auVar60._16_4_ = 0.070376836;
      auVar60._20_4_ = 0.070376836;
      auVar60._0_16_ = local_9bc0._0_16_;
      auVar60._24_4_ = 0.070376836;
      auVar60._28_4_ = 0.070376836;
      auVar60._32_4_ = 0.070376836;
      auVar60._36_4_ = 0.070376836;
      auVar60._40_4_ = 0.070376836;
      auVar60._44_4_ = 0.070376836;
      auVar60._48_4_ = 0.070376836;
      auVar60._52_4_ = 0.070376836;
      auVar60._56_4_ = 0.070376836;
      auVar60._60_4_ = 0.070376836;
      auVar59._16_8_ = uStack_99b0;
      auVar59._0_16_ = local_99c0;
      auVar59._24_8_ = uStack_99a8;
      auVar59._32_8_ = uStack_99a0;
      auVar59._40_8_ = uStack_9998;
      auVar59._48_8_ = uStack_9990;
      auVar59._56_8_ = uStack_9988;
      auVar58._8_4_ = -0.1151461;
      auVar58._12_4_ = -0.1151461;
      auVar58._0_4_ = -0.1151461;
      auVar58._4_4_ = -0.1151461;
      auVar58._16_4_ = -0.1151461;
      auVar58._20_4_ = -0.1151461;
      auVar58._24_4_ = -0.1151461;
      auVar58._28_4_ = -0.1151461;
      auVar58._32_4_ = -0.1151461;
      auVar58._36_4_ = -0.1151461;
      auVar58._40_4_ = -0.1151461;
      auVar58._44_4_ = -0.1151461;
      auVar58._48_4_ = -0.1151461;
      auVar58._52_4_ = -0.1151461;
      auVar58._56_4_ = -0.1151461;
      auVar58._60_4_ = -0.1151461;
      auVar285 = vfmadd213ps_avx512f(auVar59,auVar60,auVar58);
      auVar57._16_8_ = uStack_99b0;
      auVar57._0_16_ = local_99c0;
      auVar57._24_8_ = uStack_99a8;
      auVar57._32_8_ = uStack_99a0;
      auVar57._40_8_ = uStack_9998;
      auVar57._48_8_ = uStack_9990;
      auVar57._56_8_ = uStack_9988;
      auVar56._8_4_ = 0.116769984;
      auVar56._12_4_ = 0.116769984;
      auVar56._0_4_ = 0.116769984;
      auVar56._4_4_ = 0.116769984;
      auVar56._16_4_ = 0.116769984;
      auVar56._20_4_ = 0.116769984;
      auVar56._24_4_ = 0.116769984;
      auVar56._28_4_ = 0.116769984;
      auVar56._32_4_ = 0.116769984;
      auVar56._36_4_ = 0.116769984;
      auVar56._40_4_ = 0.116769984;
      auVar56._44_4_ = 0.116769984;
      auVar56._48_4_ = 0.116769984;
      auVar56._52_4_ = 0.116769984;
      auVar56._56_4_ = 0.116769984;
      auVar56._60_4_ = 0.116769984;
      auVar285 = vfmadd213ps_avx512f(auVar57,auVar285,auVar56);
      auVar55._16_8_ = uStack_99b0;
      auVar55._0_16_ = local_99c0;
      auVar55._24_8_ = uStack_99a8;
      auVar55._32_8_ = uStack_99a0;
      auVar55._40_8_ = uStack_9998;
      auVar55._48_8_ = uStack_9990;
      auVar55._56_8_ = uStack_9988;
      auVar54._8_4_ = -0.12420141;
      auVar54._12_4_ = -0.12420141;
      auVar54._0_4_ = -0.12420141;
      auVar54._4_4_ = -0.12420141;
      auVar54._16_4_ = -0.12420141;
      auVar54._20_4_ = -0.12420141;
      auVar54._24_4_ = -0.12420141;
      auVar54._28_4_ = -0.12420141;
      auVar54._32_4_ = -0.12420141;
      auVar54._36_4_ = -0.12420141;
      auVar54._40_4_ = -0.12420141;
      auVar54._44_4_ = -0.12420141;
      auVar54._48_4_ = -0.12420141;
      auVar54._52_4_ = -0.12420141;
      auVar54._56_4_ = -0.12420141;
      auVar54._60_4_ = -0.12420141;
      auVar285 = vfmadd213ps_avx512f(auVar55,auVar285,auVar54);
      auVar53._16_8_ = uStack_99b0;
      auVar53._0_16_ = local_99c0;
      auVar53._24_8_ = uStack_99a8;
      auVar53._32_8_ = uStack_99a0;
      auVar53._40_8_ = uStack_9998;
      auVar53._48_8_ = uStack_9990;
      auVar53._56_8_ = uStack_9988;
      auVar52._8_4_ = 0.14249323;
      auVar52._12_4_ = 0.14249323;
      auVar52._0_4_ = 0.14249323;
      auVar52._4_4_ = 0.14249323;
      auVar52._16_4_ = 0.14249323;
      auVar52._20_4_ = 0.14249323;
      auVar52._24_4_ = 0.14249323;
      auVar52._28_4_ = 0.14249323;
      auVar52._32_4_ = 0.14249323;
      auVar52._36_4_ = 0.14249323;
      auVar52._40_4_ = 0.14249323;
      auVar52._44_4_ = 0.14249323;
      auVar52._48_4_ = 0.14249323;
      auVar52._52_4_ = 0.14249323;
      auVar52._56_4_ = 0.14249323;
      auVar52._60_4_ = 0.14249323;
      auVar285 = vfmadd213ps_avx512f(auVar53,auVar285,auVar52);
      auVar51._16_8_ = uStack_99b0;
      auVar51._0_16_ = local_99c0;
      auVar51._24_8_ = uStack_99a8;
      auVar51._32_8_ = uStack_99a0;
      auVar51._40_8_ = uStack_9998;
      auVar51._48_8_ = uStack_9990;
      auVar51._56_8_ = uStack_9988;
      auVar50._8_4_ = -0.16668057;
      auVar50._12_4_ = -0.16668057;
      auVar50._0_4_ = -0.16668057;
      auVar50._4_4_ = -0.16668057;
      auVar50._16_4_ = -0.16668057;
      auVar50._20_4_ = -0.16668057;
      auVar50._24_4_ = -0.16668057;
      auVar50._28_4_ = -0.16668057;
      auVar50._32_4_ = -0.16668057;
      auVar50._36_4_ = -0.16668057;
      auVar50._40_4_ = -0.16668057;
      auVar50._44_4_ = -0.16668057;
      auVar50._48_4_ = -0.16668057;
      auVar50._52_4_ = -0.16668057;
      auVar50._56_4_ = -0.16668057;
      auVar50._60_4_ = -0.16668057;
      auVar285 = vfmadd213ps_avx512f(auVar51,auVar285,auVar50);
      auVar49._16_8_ = uStack_99b0;
      auVar49._0_16_ = local_99c0;
      auVar49._24_8_ = uStack_99a8;
      auVar49._32_8_ = uStack_99a0;
      auVar49._40_8_ = uStack_9998;
      auVar49._48_8_ = uStack_9990;
      auVar49._56_8_ = uStack_9988;
      auVar48._8_4_ = 0.20000714;
      auVar48._12_4_ = 0.20000714;
      auVar48._0_4_ = 0.20000714;
      auVar48._4_4_ = 0.20000714;
      auVar48._16_4_ = 0.20000714;
      auVar48._20_4_ = 0.20000714;
      auVar48._24_4_ = 0.20000714;
      auVar48._28_4_ = 0.20000714;
      auVar48._32_4_ = 0.20000714;
      auVar48._36_4_ = 0.20000714;
      auVar48._40_4_ = 0.20000714;
      auVar48._44_4_ = 0.20000714;
      auVar48._48_4_ = 0.20000714;
      auVar48._52_4_ = 0.20000714;
      auVar48._56_4_ = 0.20000714;
      auVar48._60_4_ = 0.20000714;
      auVar285 = vfmadd213ps_avx512f(auVar49,auVar285,auVar48);
      auVar47._16_8_ = uStack_99b0;
      auVar47._0_16_ = local_99c0;
      auVar47._24_8_ = uStack_99a8;
      auVar47._32_8_ = uStack_99a0;
      auVar47._40_8_ = uStack_9998;
      auVar47._48_8_ = uStack_9990;
      auVar47._56_8_ = uStack_9988;
      auVar46._8_4_ = -0.24999994;
      auVar46._12_4_ = -0.24999994;
      auVar46._0_4_ = -0.24999994;
      auVar46._4_4_ = -0.24999994;
      auVar46._16_4_ = -0.24999994;
      auVar46._20_4_ = -0.24999994;
      auVar46._24_4_ = -0.24999994;
      auVar46._28_4_ = -0.24999994;
      auVar46._32_4_ = -0.24999994;
      auVar46._36_4_ = -0.24999994;
      auVar46._40_4_ = -0.24999994;
      auVar46._44_4_ = -0.24999994;
      auVar46._48_4_ = -0.24999994;
      auVar46._52_4_ = -0.24999994;
      auVar46._56_4_ = -0.24999994;
      auVar46._60_4_ = -0.24999994;
      auVar285 = vfmadd213ps_avx512f(auVar47,auVar285,auVar46);
      auVar45._16_8_ = uStack_99b0;
      auVar45._0_16_ = local_99c0;
      auVar45._24_8_ = uStack_99a8;
      auVar45._32_8_ = uStack_99a0;
      auVar45._40_8_ = uStack_9998;
      auVar45._48_8_ = uStack_9990;
      auVar45._56_8_ = uStack_9988;
      auVar44._8_4_ = 0.3333333;
      auVar44._12_4_ = 0.3333333;
      auVar44._0_4_ = 0.3333333;
      auVar44._4_4_ = 0.3333333;
      auVar44._16_4_ = 0.3333333;
      auVar44._20_4_ = 0.3333333;
      auVar44._24_4_ = 0.3333333;
      auVar44._28_4_ = 0.3333333;
      auVar44._32_4_ = 0.3333333;
      auVar44._36_4_ = 0.3333333;
      auVar44._40_4_ = 0.3333333;
      auVar44._44_4_ = 0.3333333;
      auVar44._48_4_ = 0.3333333;
      auVar44._52_4_ = 0.3333333;
      auVar44._56_4_ = 0.3333333;
      auVar44._60_4_ = 0.3333333;
      auVar285 = vfmadd213ps_avx512f(auVar45,auVar285,auVar44);
      auVar36._16_8_ = uStack_99b0;
      auVar36._0_16_ = local_99c0;
      auVar36._24_8_ = uStack_99a8;
      auVar36._32_8_ = uStack_99a0;
      auVar36._40_8_ = uStack_9998;
      auVar36._48_8_ = uStack_9990;
      auVar36._56_8_ = uStack_9988;
      auVar285 = vmulps_avx512f(auVar285,auVar36);
      auVar285 = vmulps_avx512f(auVar285,auVar284);
      uStack_9aa8 = auVar19._24_8_;
      uStack_9aa0 = auVar276._32_8_;
      uStack_9a98 = auVar277._40_8_;
      uStack_9a90 = auVar278._48_8_;
      uStack_9a88 = auVar283._56_8_;
      auVar43._16_8_ = uStack_9ab0;
      auVar43._0_16_ = local_9ac0;
      auVar43._24_8_ = uStack_9aa8;
      auVar43._32_8_ = uStack_9aa0;
      auVar43._40_8_ = uStack_9a98;
      auVar43._48_8_ = uStack_9a90;
      auVar43._56_8_ = uStack_9a88;
      auVar42._8_4_ = -0.00021219444;
      auVar42._12_4_ = -0.00021219444;
      auVar42._0_4_ = -0.00021219444;
      auVar42._4_4_ = -0.00021219444;
      auVar42._16_4_ = -0.00021219444;
      auVar42._20_4_ = -0.00021219444;
      auVar42._24_4_ = -0.00021219444;
      auVar42._28_4_ = -0.00021219444;
      auVar42._32_4_ = -0.00021219444;
      auVar42._36_4_ = -0.00021219444;
      auVar42._40_4_ = -0.00021219444;
      auVar42._44_4_ = -0.00021219444;
      auVar42._48_4_ = -0.00021219444;
      auVar42._52_4_ = -0.00021219444;
      auVar42._56_4_ = -0.00021219444;
      auVar42._60_4_ = -0.00021219444;
      auVar283 = vfmadd213ps_avx512f(auVar42,auVar43,auVar285);
      auVar71._8_4_ = 0.5;
      auVar71._12_4_ = 0.5;
      auVar71._0_4_ = 0.5;
      auVar71._4_4_ = 0.5;
      auVar71._16_4_ = 0.5;
      auVar71._20_4_ = 0.5;
      auVar71._24_4_ = 0.5;
      auVar71._28_4_ = 0.5;
      auVar71._32_4_ = 0.5;
      auVar71._36_4_ = 0.5;
      auVar71._40_4_ = 0.5;
      auVar71._44_4_ = 0.5;
      auVar71._48_4_ = 0.5;
      auVar71._52_4_ = 0.5;
      auVar71._56_4_ = 0.5;
      auVar71._60_4_ = 0.5;
      auVar283 = vfnmadd213ps_avx512f(auVar71,auVar284,auVar283);
      auVar33._16_8_ = uStack_99b0;
      auVar33._0_16_ = local_99c0;
      auVar33._24_8_ = uStack_99a8;
      auVar33._32_8_ = uStack_99a0;
      auVar33._40_8_ = uStack_9998;
      auVar33._48_8_ = uStack_9990;
      auVar33._56_8_ = uStack_9988;
      auVar283 = vaddps_avx512f(auVar33,auVar283);
      auVar41._16_8_ = uStack_9ab0;
      auVar41._0_16_ = local_9ac0;
      auVar41._24_8_ = uStack_9aa8;
      auVar41._32_8_ = uStack_9aa0;
      auVar41._40_8_ = uStack_9a98;
      auVar41._48_8_ = uStack_9a90;
      auVar41._56_8_ = uStack_9a88;
      auVar40._8_4_ = 0.6933594;
      auVar40._12_4_ = 0.6933594;
      auVar40._0_4_ = 0.6933594;
      auVar40._4_4_ = 0.6933594;
      auVar40._16_4_ = 0.6933594;
      auVar40._20_4_ = 0.6933594;
      auVar40._24_4_ = 0.6933594;
      auVar40._28_4_ = 0.6933594;
      auVar40._32_4_ = 0.6933594;
      auVar40._36_4_ = 0.6933594;
      auVar40._40_4_ = 0.6933594;
      auVar40._44_4_ = 0.6933594;
      auVar40._48_4_ = 0.6933594;
      auVar40._52_4_ = 0.6933594;
      auVar40._56_4_ = 0.6933594;
      auVar40._60_4_ = 0.6933594;
      auVar284 = vfmadd213ps_avx512f(auVar40,auVar41,auVar283);
      auVar283 = vpmovm2d_avx512dq(uVar26 & 0xffff);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpord_avx512f(auVar284,auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(*local_a5e0,auVar283);
      auVar32._8_4_ = 88.37626;
      auVar32._12_4_ = 88.37626;
      auVar32._0_4_ = 88.37626;
      auVar32._4_4_ = 88.37626;
      auVar32._16_4_ = 88.37626;
      auVar32._20_4_ = 88.37626;
      auVar32._24_4_ = 88.37626;
      auVar32._28_4_ = 88.37626;
      auVar32._32_4_ = 88.37626;
      auVar32._36_4_ = 88.37626;
      auVar32._40_4_ = 88.37626;
      auVar32._44_4_ = 88.37626;
      auVar32._48_4_ = 88.37626;
      auVar32._52_4_ = 88.37626;
      auVar32._56_4_ = 88.37626;
      auVar32._60_4_ = 88.37626;
      auVar283 = vminps_avx512f(auVar283,auVar32);
      auVar31._8_4_ = -88.37626;
      auVar31._12_4_ = -88.37626;
      auVar31._0_4_ = -88.37626;
      auVar31._4_4_ = -88.37626;
      auVar31._16_4_ = -88.37626;
      auVar31._20_4_ = -88.37626;
      auVar31._24_4_ = -88.37626;
      auVar31._28_4_ = -88.37626;
      auVar31._32_4_ = -88.37626;
      auVar31._36_4_ = -88.37626;
      auVar31._40_4_ = -88.37626;
      auVar31._44_4_ = -88.37626;
      auVar31._48_4_ = -88.37626;
      auVar31._52_4_ = -88.37626;
      auVar31._56_4_ = -88.37626;
      auVar31._60_4_ = -88.37626;
      auVar284 = vmaxps_avx512f(auVar283,auVar31);
      auVar68._8_4_ = 1.442695;
      auVar68._12_4_ = 1.442695;
      auVar68._0_4_ = 1.442695;
      auVar68._4_4_ = 1.442695;
      auVar68._16_4_ = 1.442695;
      auVar68._20_4_ = 1.442695;
      auVar68._24_4_ = 1.442695;
      auVar68._28_4_ = 1.442695;
      auVar68._32_4_ = 1.442695;
      auVar68._36_4_ = 1.442695;
      auVar68._40_4_ = 1.442695;
      auVar68._44_4_ = 1.442695;
      auVar68._48_4_ = 1.442695;
      auVar68._52_4_ = 1.442695;
      auVar68._56_4_ = 1.442695;
      auVar68._60_4_ = 1.442695;
      auVar67._8_4_ = 0.5;
      auVar67._12_4_ = 0.5;
      auVar67._0_4_ = 0.5;
      auVar67._4_4_ = 0.5;
      auVar67._16_4_ = 0.5;
      auVar67._20_4_ = 0.5;
      auVar67._24_4_ = 0.5;
      auVar67._28_4_ = 0.5;
      auVar67._32_4_ = 0.5;
      auVar67._36_4_ = 0.5;
      auVar67._40_4_ = 0.5;
      auVar67._44_4_ = 0.5;
      auVar67._48_4_ = 0.5;
      auVar67._52_4_ = 0.5;
      auVar67._56_4_ = 0.5;
      auVar67._60_4_ = 0.5;
      auVar283 = vfmadd213ps_avx512f(auVar68,auVar284,auVar67);
      auVar285 = vrndscaleps_avx512f(auVar283,1);
      uVar27 = vcmpps_avx512f(auVar283,auVar285,1);
      uVar28 = (ushort)uVar27;
      auVar70._8_4_ = 1.0;
      auVar70._12_4_ = 1.0;
      auVar70._0_4_ = 1.0;
      auVar70._4_4_ = 1.0;
      auVar70._16_4_ = 1.0;
      auVar70._20_4_ = 1.0;
      auVar70._24_4_ = 1.0;
      auVar70._28_4_ = 1.0;
      auVar70._32_4_ = 1.0;
      auVar70._36_4_ = 1.0;
      auVar70._40_4_ = 1.0;
      auVar70._44_4_ = 1.0;
      auVar70._48_4_ = 1.0;
      auVar70._52_4_ = 1.0;
      auVar70._56_4_ = 1.0;
      auVar70._60_4_ = 1.0;
      local_8680 = auVar285._0_4_;
      iStack_867c = auVar285._4_4_;
      iStack_8678 = auVar285._8_4_;
      iStack_8674 = auVar285._12_4_;
      iStack_8670 = auVar285._16_4_;
      iStack_866c = auVar285._20_4_;
      iStack_8668 = auVar285._24_4_;
      iStack_8664 = auVar285._28_4_;
      iStack_8660 = auVar285._32_4_;
      iStack_865c = auVar285._36_4_;
      iStack_8658 = auVar285._40_4_;
      iStack_8654 = auVar285._44_4_;
      iStack_8650 = auVar285._48_4_;
      iStack_864c = auVar285._52_4_;
      iStack_8648 = auVar285._56_4_;
      iStack_8644 = auVar285._60_4_;
      auVar283 = vsubps_avx512f(auVar285,auVar70);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar27 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_9f00._4_4_ = (uint)bVar5 * auVar283._4_4_ | (uint)!bVar5 * iStack_867c;
      local_9f00._0_4_ = (uint)bVar4 * auVar283._0_4_ | (uint)!bVar4 * local_8680;
      local_9f00._8_4_ = (uint)bVar6 * auVar283._8_4_ | (uint)!bVar6 * iStack_8678;
      local_9f00._12_4_ = (uint)bVar7 * auVar283._12_4_ | (uint)!bVar7 * iStack_8674;
      uStack_9ef0._0_4_ = (uint)bVar8 * auVar283._16_4_ | (uint)!bVar8 * iStack_8670;
      uStack_9ef0._4_4_ = (uint)bVar9 * auVar283._20_4_ | (uint)!bVar9 * iStack_866c;
      uStack_9ee8._0_4_ = (uint)bVar10 * auVar283._24_4_ | (uint)!bVar10 * iStack_8668;
      uStack_9ee8._4_4_ = (uint)bVar11 * auVar283._28_4_ | (uint)!bVar11 * iStack_8664;
      auVar19 = _local_9f00;
      uStack_9ee0._0_4_ =
           (uint)(bVar12 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_8660;
      uStack_9ee0._4_4_ = (uint)bVar13 * auVar283._36_4_ | (uint)!bVar13 * iStack_865c;
      auVar276 = _local_9f00;
      uStack_9ed8._0_4_ = (uint)bVar14 * auVar283._40_4_ | (uint)!bVar14 * iStack_8658;
      uStack_9ed8._4_4_ = (uint)bVar15 * auVar283._44_4_ | (uint)!bVar15 * iStack_8654;
      auVar277 = _local_9f00;
      uStack_9ed0._0_4_ = (uint)bVar16 * auVar283._48_4_ | (uint)!bVar16 * iStack_8650;
      uStack_9ed0._4_4_ = (uint)bVar17 * auVar283._52_4_ | (uint)!bVar17 * iStack_864c;
      auVar278 = _local_9f00;
      uStack_9ec8._0_4_ = (uint)bVar18 * auVar283._56_4_ | (uint)!bVar18 * iStack_8648;
      uStack_9ec8._4_4_ =
           (uint)(bVar12 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_8644;
      auVar283 = _local_9f00;
      uStack_9ee8 = auVar19._24_8_;
      uStack_9ee0 = auVar276._32_8_;
      uStack_9ed8 = auVar277._40_8_;
      uStack_9ed0 = auVar278._48_8_;
      uStack_9ec8 = auVar283._56_8_;
      auVar75._16_8_ = uStack_9ef0;
      auVar75._0_16_ = local_9f00;
      auVar75._24_8_ = uStack_9ee8;
      auVar75._32_8_ = uStack_9ee0;
      auVar75._40_8_ = uStack_9ed8;
      auVar75._48_8_ = uStack_9ed0;
      auVar75._56_8_ = uStack_9ec8;
      auVar74._8_4_ = 0.6933594;
      auVar74._12_4_ = 0.6933594;
      auVar74._0_4_ = 0.6933594;
      auVar74._4_4_ = 0.6933594;
      auVar74._16_4_ = 0.6933594;
      auVar74._20_4_ = 0.6933594;
      auVar74._24_4_ = 0.6933594;
      auVar74._28_4_ = 0.6933594;
      auVar74._32_4_ = 0.6933594;
      auVar74._36_4_ = 0.6933594;
      auVar74._40_4_ = 0.6933594;
      auVar74._44_4_ = 0.6933594;
      auVar74._48_4_ = 0.6933594;
      auVar74._52_4_ = 0.6933594;
      auVar74._56_4_ = 0.6933594;
      auVar74._60_4_ = 0.6933594;
      auVar283 = vfnmadd213ps_avx512f(auVar74,auVar75,auVar284);
      auVar73._16_8_ = uStack_9ef0;
      auVar73._0_16_ = local_9f00;
      auVar73._24_8_ = uStack_9ee8;
      auVar73._32_8_ = uStack_9ee0;
      auVar73._40_8_ = uStack_9ed8;
      auVar73._48_8_ = uStack_9ed0;
      auVar73._56_8_ = uStack_9ec8;
      auVar72._8_4_ = -0.00021219444;
      auVar72._12_4_ = -0.00021219444;
      auVar72._0_4_ = -0.00021219444;
      auVar72._4_4_ = -0.00021219444;
      auVar72._16_4_ = -0.00021219444;
      auVar72._20_4_ = -0.00021219444;
      auVar72._24_4_ = -0.00021219444;
      auVar72._28_4_ = -0.00021219444;
      auVar72._32_4_ = -0.00021219444;
      auVar72._36_4_ = -0.00021219444;
      auVar72._40_4_ = -0.00021219444;
      auVar72._44_4_ = -0.00021219444;
      auVar72._48_4_ = -0.00021219444;
      auVar72._52_4_ = -0.00021219444;
      auVar72._56_4_ = -0.00021219444;
      auVar72._60_4_ = -0.00021219444;
      auVar283 = vfnmadd213ps_avx512f(auVar72,auVar73,auVar283);
      auVar284 = vmulps_avx512f(auVar283,auVar283);
      uStack_9ff8._0_4_ = 0.00019875691;
      uStack_9ff8._4_4_ = 0.00019875691;
      local_a000._0_4_ = 0.00019875691;
      local_a000._4_4_ = 0.00019875691;
      auVar66._16_4_ = 0.00019875691;
      auVar66._20_4_ = 0.00019875691;
      auVar66._0_16_ = _local_a000;
      auVar66._24_4_ = 0.00019875691;
      auVar66._28_4_ = 0.00019875691;
      auVar66._32_4_ = 0.00019875691;
      auVar66._36_4_ = 0.00019875691;
      auVar66._40_4_ = 0.00019875691;
      auVar66._44_4_ = 0.00019875691;
      auVar66._48_4_ = 0.00019875691;
      auVar66._52_4_ = 0.00019875691;
      auVar66._56_4_ = 0.00019875691;
      auVar66._60_4_ = 0.00019875691;
      auVar65._8_4_ = 0.0013981999;
      auVar65._12_4_ = 0.0013981999;
      auVar65._0_4_ = 0.0013981999;
      auVar65._4_4_ = 0.0013981999;
      auVar65._16_4_ = 0.0013981999;
      auVar65._20_4_ = 0.0013981999;
      auVar65._24_4_ = 0.0013981999;
      auVar65._28_4_ = 0.0013981999;
      auVar65._32_4_ = 0.0013981999;
      auVar65._36_4_ = 0.0013981999;
      auVar65._40_4_ = 0.0013981999;
      auVar65._44_4_ = 0.0013981999;
      auVar65._48_4_ = 0.0013981999;
      auVar65._52_4_ = 0.0013981999;
      auVar65._56_4_ = 0.0013981999;
      auVar65._60_4_ = 0.0013981999;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar66,auVar65);
      auVar64._8_4_ = 0.008333452;
      auVar64._12_4_ = 0.008333452;
      auVar64._0_4_ = 0.008333452;
      auVar64._4_4_ = 0.008333452;
      auVar64._16_4_ = 0.008333452;
      auVar64._20_4_ = 0.008333452;
      auVar64._24_4_ = 0.008333452;
      auVar64._28_4_ = 0.008333452;
      auVar64._32_4_ = 0.008333452;
      auVar64._36_4_ = 0.008333452;
      auVar64._40_4_ = 0.008333452;
      auVar64._44_4_ = 0.008333452;
      auVar64._48_4_ = 0.008333452;
      auVar64._52_4_ = 0.008333452;
      auVar64._56_4_ = 0.008333452;
      auVar64._60_4_ = 0.008333452;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar64);
      auVar63._8_4_ = 0.041665796;
      auVar63._12_4_ = 0.041665796;
      auVar63._0_4_ = 0.041665796;
      auVar63._4_4_ = 0.041665796;
      auVar63._16_4_ = 0.041665796;
      auVar63._20_4_ = 0.041665796;
      auVar63._24_4_ = 0.041665796;
      auVar63._28_4_ = 0.041665796;
      auVar63._32_4_ = 0.041665796;
      auVar63._36_4_ = 0.041665796;
      auVar63._40_4_ = 0.041665796;
      auVar63._44_4_ = 0.041665796;
      auVar63._48_4_ = 0.041665796;
      auVar63._52_4_ = 0.041665796;
      auVar63._56_4_ = 0.041665796;
      auVar63._60_4_ = 0.041665796;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar63);
      auVar62._8_4_ = 0.16666666;
      auVar62._12_4_ = 0.16666666;
      auVar62._0_4_ = 0.16666666;
      auVar62._4_4_ = 0.16666666;
      auVar62._16_4_ = 0.16666666;
      auVar62._20_4_ = 0.16666666;
      auVar62._24_4_ = 0.16666666;
      auVar62._28_4_ = 0.16666666;
      auVar62._32_4_ = 0.16666666;
      auVar62._36_4_ = 0.16666666;
      auVar62._40_4_ = 0.16666666;
      auVar62._44_4_ = 0.16666666;
      auVar62._48_4_ = 0.16666666;
      auVar62._52_4_ = 0.16666666;
      auVar62._56_4_ = 0.16666666;
      auVar62._60_4_ = 0.16666666;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar62);
      auVar61._8_4_ = 0.5;
      auVar61._12_4_ = 0.5;
      auVar61._0_4_ = 0.5;
      auVar61._4_4_ = 0.5;
      auVar61._16_4_ = 0.5;
      auVar61._20_4_ = 0.5;
      auVar61._24_4_ = 0.5;
      auVar61._28_4_ = 0.5;
      auVar61._32_4_ = 0.5;
      auVar61._36_4_ = 0.5;
      auVar61._40_4_ = 0.5;
      auVar61._44_4_ = 0.5;
      auVar61._48_4_ = 0.5;
      auVar61._52_4_ = 0.5;
      auVar61._56_4_ = 0.5;
      auVar61._60_4_ = 0.5;
      auVar285 = vfmadd213ps_avx512f(auVar283,auVar285,auVar61);
      auVar283 = vfmadd213ps_avx512f(auVar284,auVar285,auVar283);
      auVar30._8_4_ = 1.0;
      auVar30._12_4_ = 1.0;
      auVar30._0_4_ = 1.0;
      auVar30._4_4_ = 1.0;
      auVar30._16_4_ = 1.0;
      auVar30._20_4_ = 1.0;
      auVar30._24_4_ = 1.0;
      auVar30._28_4_ = 1.0;
      auVar30._32_4_ = 1.0;
      auVar30._36_4_ = 1.0;
      auVar30._40_4_ = 1.0;
      auVar30._44_4_ = 1.0;
      auVar30._48_4_ = 1.0;
      auVar30._52_4_ = 1.0;
      auVar30._56_4_ = 1.0;
      auVar30._60_4_ = 1.0;
      auVar285 = vaddps_avx512f(auVar283,auVar30);
      auVar76._16_8_ = uStack_9ef0;
      auVar76._0_16_ = local_9f00;
      auVar76._24_8_ = uStack_9ee8;
      auVar76._32_8_ = uStack_9ee0;
      auVar76._40_8_ = uStack_9ed8;
      auVar76._48_8_ = uStack_9ed0;
      auVar76._56_8_ = uStack_9ec8;
      auVar283 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar283);
      auVar283 = vcvttps2dq_avx512f(auVar76);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar284 = vmovdqa64_avx512f(auVar284);
      auVar283 = vpaddd_avx512f(auVar283,auVar284);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpslld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(auVar285,auVar283);
      local_a000 = auVar283._0_8_;
      uStack_9ff8 = auVar283._8_8_;
      uStack_9ff0 = auVar283._16_8_;
      uStack_9fe8 = auVar283._24_8_;
      uStack_9fe0 = auVar283._32_8_;
      uStack_9fd8 = auVar283._40_8_;
      uStack_9fd0 = auVar283._48_8_;
      uStack_9fc8 = auVar283._56_8_;
      *local_a5f0 = local_a000;
      local_a5f0[1] = uStack_9ff8;
      local_a5f0[2] = uStack_9ff0;
      local_a5f0[3] = uStack_9fe8;
      local_a5f0[4] = uStack_9fe0;
      local_a5f0[5] = uStack_9fd8;
      local_a5f0[6] = uStack_9fd0;
      local_a5f0[7] = uStack_9fc8;
      local_a5e0 = local_a5e0 + 1;
      local_a5e8 = local_a5e8 + 4;
      local_a5f0 = local_a5f0 + 8;
    }
    for (; local_a864 + 1 < in_ECX; local_a864 = local_a864 + 2) {
      uVar1 = *local_a5e8;
      uVar2 = local_a5e8[1];
      auVar270._8_8_ = CONCAT44(uVar1,uVar1);
      auVar270._0_8_ = CONCAT44(uVar1,uVar1);
      auVar270._16_8_ = CONCAT44(uVar2,uVar2);
      auVar270._24_8_ = CONCAT44(uVar2,uVar2);
      auVar269._8_8_ = CONCAT44(uVar1,uVar1);
      auVar269._0_8_ = CONCAT44(uVar1,uVar1);
      auVar269._16_8_ = CONCAT44(uVar2,uVar2);
      auVar269._24_8_ = CONCAT44(uVar2,uVar2);
      auVar19 = vcmpps_avx(auVar269,ZEXT1632(ZEXT816(0)),2);
      auVar179._8_4_ = 0x800000;
      auVar179._0_8_ = 0x80000000800000;
      auVar179._12_4_ = 0x800000;
      auVar179._16_4_ = 0x800000;
      auVar179._20_4_ = 0x800000;
      auVar179._24_4_ = 0x800000;
      auVar179._28_4_ = 0x800000;
      auVar287 = vmaxps_avx(auVar270,auVar179);
      auVar25 = vpsrld_avx2(auVar287,ZEXT416(0x17));
      auVar181._8_4_ = 0x807fffff;
      auVar181._0_8_ = 0x807fffff807fffff;
      auVar181._12_4_ = 0x807fffff;
      auVar181._16_4_ = 0x807fffff;
      auVar181._20_4_ = 0x807fffff;
      auVar181._24_4_ = 0x807fffff;
      auVar181._28_4_ = 0x807fffff;
      auVar287 = vpand_avx2(auVar287,auVar181);
      auVar205._8_4_ = 0x3f000000;
      auVar205._0_8_ = 0x3f0000003f000000;
      auVar205._12_4_ = 0x3f000000;
      auVar205._16_4_ = 0x3f000000;
      auVar205._20_4_ = 0x3f000000;
      auVar205._24_4_ = 0x3f000000;
      auVar205._28_4_ = 0x3f000000;
      auVar24 = vpor_avx2(auVar287,auVar205);
      auVar206._8_8_ = 0x7f0000007f;
      auVar206._0_8_ = 0x7f0000007f;
      auVar206._16_8_ = 0x7f0000007f;
      auVar206._24_8_ = 0x7f0000007f;
      auVar287 = vpsubd_avx2(auVar25,auVar206);
      auVar287 = vcvtdq2ps_avx(auVar287);
      local_2f00 = auVar287._0_4_;
      fStack_2efc = auVar287._4_4_;
      fStack_2ef8 = auVar287._8_4_;
      fStack_2ef4 = auVar287._12_4_;
      fStack_2ef0 = auVar287._16_4_;
      fStack_2eec = auVar287._20_4_;
      fStack_2ee8 = auVar287._24_4_;
      fStack_2ee4 = auVar287._28_4_;
      local_3040._4_4_ = fStack_2efc + 1.0;
      local_3040._0_4_ = local_2f00 + 1.0;
      fStack_3038 = fStack_2ef8 + 1.0;
      fStack_3034 = fStack_2ef4 + 1.0;
      uStack_3030._0_4_ = fStack_2ef0 + 1.0;
      uStack_3030._4_4_ = fStack_2eec + 1.0;
      uStack_3028._0_4_ = fStack_2ee8 + 1.0;
      uStack_3028._4_4_ = fStack_2ee4 + 1.0;
      auVar207 = _local_3040;
      auVar292._8_4_ = 0x3f3504f3;
      auVar292._0_8_ = 0x3f3504f33f3504f3;
      auVar292._12_4_ = 0x3f3504f3;
      auVar292._16_4_ = 0x3f3504f3;
      auVar292._20_4_ = 0x3f3504f3;
      auVar292._24_4_ = 0x3f3504f3;
      auVar292._28_4_ = 0x3f3504f3;
      auVar287 = vcmpps_avx(auVar24,auVar292,1);
      auVar25 = vpand_avx2(auVar24,auVar287);
      auVar178._8_8_ = 0x3f8000003f800000;
      auVar178._0_8_ = 0x3f8000003f800000;
      auVar178._16_8_ = 0x3f8000003f800000;
      auVar178._24_8_ = 0x3f8000003f800000;
      auVar24 = vsubps_avx(auVar24,auVar178);
      uStack_3028 = auVar207._24_8_;
      auVar180._8_8_ = 0x3f8000003f800000;
      auVar180._0_8_ = 0x3f8000003f800000;
      auVar180._16_8_ = 0x3f8000003f800000;
      auVar180._24_8_ = 0x3f8000003f800000;
      auVar287 = vpand_avx2(auVar180,auVar287);
      auVar177._16_8_ = uStack_3030;
      auVar177._0_16_ = _local_3040;
      auVar177._24_8_ = uStack_3028;
      auVar287 = vsubps_avx(auVar177,auVar287);
      local_2f40 = auVar24._0_4_;
      fStack_2f3c = auVar24._4_4_;
      fStack_2f38 = auVar24._8_4_;
      fStack_2f34 = auVar24._12_4_;
      fStack_2f30 = auVar24._16_4_;
      fStack_2f2c = auVar24._20_4_;
      fStack_2f28 = auVar24._24_4_;
      fStack_2f24 = auVar24._28_4_;
      local_2f60 = auVar25._0_4_;
      fStack_2f5c = auVar25._4_4_;
      fStack_2f58 = auVar25._8_4_;
      fStack_2f54 = auVar25._12_4_;
      fStack_2f50 = auVar25._16_4_;
      fStack_2f4c = auVar25._20_4_;
      fStack_2f48 = auVar25._24_4_;
      fStack_2f44 = auVar25._28_4_;
      local_2fc0._0_4_ = local_2f40 + local_2f60;
      local_2fc0._4_4_ = fStack_2f3c + fStack_2f5c;
      fStack_2fb8 = fStack_2f38 + fStack_2f58;
      fStack_2fb4 = fStack_2f34 + fStack_2f54;
      fStack_2fb0 = fStack_2f30 + fStack_2f50;
      fStack_2fac = fStack_2f2c + fStack_2f4c;
      fStack_2fa8 = fStack_2f28 + fStack_2f48;
      fStack_2fa4 = fStack_2f24 + fStack_2f44;
      fStack_30b8 = 0.070376836;
      local_30c0 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_30b4 = 0.070376836;
      fStack_30b0 = 0.070376836;
      fStack_30ac = 0.070376836;
      fStack_30a8 = 0.070376836;
      uStack_30a4 = 0x3d9021bb;
      auVar190._8_4_ = -0.1151461;
      auVar190._12_4_ = -0.1151461;
      auVar190._0_4_ = -0.1151461;
      auVar190._4_4_ = -0.1151461;
      auVar190._16_4_ = -0.1151461;
      auVar190._20_4_ = -0.1151461;
      auVar190._24_4_ = -0.1151461;
      auVar190._28_4_ = -0.1151461;
      auVar20 = vfmadd213ps_fma(_local_2fc0,_local_30c0,auVar190);
      auVar191._8_4_ = 0.116769984;
      auVar191._12_4_ = 0.116769984;
      auVar191._0_4_ = 0.116769984;
      auVar191._4_4_ = 0.116769984;
      auVar191._16_4_ = 0.116769984;
      auVar191._20_4_ = 0.116769984;
      auVar191._24_4_ = 0.116769984;
      auVar191._28_4_ = 0.116769984;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar191);
      auVar192._8_4_ = -0.12420141;
      auVar192._12_4_ = -0.12420141;
      auVar192._0_4_ = -0.12420141;
      auVar192._4_4_ = -0.12420141;
      auVar192._16_4_ = -0.12420141;
      auVar192._20_4_ = -0.12420141;
      auVar192._24_4_ = -0.12420141;
      auVar192._28_4_ = -0.12420141;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar192);
      auVar193._8_4_ = 0.14249323;
      auVar193._12_4_ = 0.14249323;
      auVar193._0_4_ = 0.14249323;
      auVar193._4_4_ = 0.14249323;
      auVar193._16_4_ = 0.14249323;
      auVar193._20_4_ = 0.14249323;
      auVar193._24_4_ = 0.14249323;
      auVar193._28_4_ = 0.14249323;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar193);
      auVar194._8_4_ = -0.16668057;
      auVar194._12_4_ = -0.16668057;
      auVar194._0_4_ = -0.16668057;
      auVar194._4_4_ = -0.16668057;
      auVar194._16_4_ = -0.16668057;
      auVar194._20_4_ = -0.16668057;
      auVar194._24_4_ = -0.16668057;
      auVar194._28_4_ = -0.16668057;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar194);
      auVar195._8_4_ = 0.20000714;
      auVar195._12_4_ = 0.20000714;
      auVar195._0_4_ = 0.20000714;
      auVar195._4_4_ = 0.20000714;
      auVar195._16_4_ = 0.20000714;
      auVar195._20_4_ = 0.20000714;
      auVar195._24_4_ = 0.20000714;
      auVar195._28_4_ = 0.20000714;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar195);
      auVar196._8_4_ = -0.24999994;
      auVar196._12_4_ = -0.24999994;
      auVar196._0_4_ = -0.24999994;
      auVar196._4_4_ = -0.24999994;
      auVar196._16_4_ = -0.24999994;
      auVar196._20_4_ = -0.24999994;
      auVar196._24_4_ = -0.24999994;
      auVar196._28_4_ = -0.24999994;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar196);
      auVar197._8_4_ = 0.3333333;
      auVar197._12_4_ = 0.3333333;
      auVar197._0_4_ = 0.3333333;
      auVar197._4_4_ = 0.3333333;
      auVar197._16_4_ = 0.3333333;
      auVar197._20_4_ = 0.3333333;
      auVar197._24_4_ = 0.3333333;
      auVar197._28_4_ = 0.3333333;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar197);
      local_2e00 = auVar20._0_4_;
      fStack_2dfc = auVar20._4_4_;
      fStack_2df8 = auVar20._8_4_;
      fStack_2df4 = auVar20._12_4_;
      local_30c0._4_4_ =
           fStack_2dfc * (float)local_2fc0._4_4_ * (float)local_2fc0._4_4_ * (float)local_2fc0._4_4_
      ;
      local_30c0._0_4_ =
           local_2e00 * (float)local_2fc0._0_4_ * (float)local_2fc0._0_4_ * (float)local_2fc0._0_4_;
      fStack_30b8 = fStack_2df8 * fStack_2fb8 * fStack_2fb8 * fStack_2fb8;
      fStack_30b4 = fStack_2df4 * fStack_2fb4 * fStack_2fb4 * fStack_2fb4;
      fStack_30b0 = fStack_2fb0 * 0.0 * fStack_2fb0 * fStack_2fb0;
      fStack_30ac = fStack_2fac * 0.0 * fStack_2fac * fStack_2fac;
      fStack_30a8 = fStack_2fa8 * 0.0 * fStack_2fa8 * fStack_2fa8;
      uStack_30a4 = 0;
      auVar198._8_4_ = -0.00021219444;
      auVar198._12_4_ = -0.00021219444;
      auVar198._0_4_ = -0.00021219444;
      auVar198._4_4_ = -0.00021219444;
      auVar198._16_4_ = -0.00021219444;
      auVar198._20_4_ = -0.00021219444;
      auVar198._24_4_ = -0.00021219444;
      auVar198._28_4_ = -0.00021219444;
      auVar20 = vfmadd213ps_fma(auVar198,auVar287,_local_30c0);
      auVar273._4_4_ = (float)local_2fc0._4_4_ * (float)local_2fc0._4_4_;
      auVar273._0_4_ = (float)local_2fc0._0_4_ * (float)local_2fc0._0_4_;
      auVar273._8_4_ = fStack_2fb8 * fStack_2fb8;
      auVar273._12_4_ = fStack_2fb4 * fStack_2fb4;
      auVar273._16_4_ = fStack_2fb0 * fStack_2fb0;
      auVar273._20_4_ = fStack_2fac * fStack_2fac;
      auVar273._24_4_ = fStack_2fa8 * fStack_2fa8;
      auVar273._28_4_ = fStack_2fa4;
      auVar202._8_4_ = 0.5;
      auVar202._12_4_ = 0.5;
      auVar202._0_4_ = 0.5;
      auVar202._4_4_ = 0.5;
      auVar202._16_4_ = 0.5;
      auVar202._20_4_ = 0.5;
      auVar202._24_4_ = 0.5;
      auVar202._28_4_ = 0.5;
      auVar20 = vfnmadd213ps_fma(auVar202,auVar273,ZEXT1632(auVar20));
      local_2fa0 = auVar20._0_4_;
      fStack_2f9c = auVar20._4_4_;
      fStack_2f98 = auVar20._8_4_;
      fStack_2f94 = auVar20._12_4_;
      local_2fc0._4_4_ = (float)local_2fc0._4_4_ + fStack_2f9c;
      local_2fc0._0_4_ = (float)local_2fc0._0_4_ + local_2fa0;
      fStack_2fb8 = fStack_2fb8 + fStack_2f98;
      fStack_2fb4 = fStack_2fb4 + fStack_2f94;
      fStack_2fb0 = fStack_2fb0 + 0.0;
      fStack_2fac = fStack_2fac + 0.0;
      fStack_2fa8 = fStack_2fa8 + 0.0;
      fStack_2fa4 = fStack_2fa4 + 0.0;
      auVar199._8_4_ = 0.6933594;
      auVar199._12_4_ = 0.6933594;
      auVar199._0_4_ = 0.6933594;
      auVar199._4_4_ = 0.6933594;
      auVar199._16_4_ = 0.6933594;
      auVar199._20_4_ = 0.6933594;
      auVar199._24_4_ = 0.6933594;
      auVar199._28_4_ = 0.6933594;
      auVar20 = vfmadd213ps_fma(auVar199,auVar287,_local_2fc0);
      auVar19 = vpor_avx2(ZEXT1632(auVar20),auVar19);
      local_3360 = (float)*(undefined8 *)*local_a5e0;
      fStack_335c = (float)((ulong)*(undefined8 *)*local_a5e0 >> 0x20);
      fStack_3358 = (float)*(undefined8 *)(*local_a5e0 + 8);
      fStack_3354 = (float)((ulong)*(undefined8 *)(*local_a5e0 + 8) >> 0x20);
      fStack_3350 = (float)*(undefined8 *)(*local_a5e0 + 0x10);
      fStack_334c = (float)((ulong)*(undefined8 *)(*local_a5e0 + 0x10) >> 0x20);
      fStack_3348 = (float)*(undefined8 *)(*local_a5e0 + 0x18);
      uStack_3344 = (undefined4)((ulong)*(undefined8 *)(*local_a5e0 + 0x18) >> 0x20);
      local_3380 = auVar19._0_4_;
      fStack_337c = auVar19._4_4_;
      fStack_3378 = auVar19._8_4_;
      fStack_3374 = auVar19._12_4_;
      fStack_3370 = auVar19._16_4_;
      fStack_336c = auVar19._20_4_;
      fStack_3368 = auVar19._24_4_;
      local_3260._4_4_ = fStack_335c * fStack_337c;
      local_3260._0_4_ = local_3360 * local_3380;
      fStack_3258 = fStack_3358 * fStack_3378;
      fStack_3254 = fStack_3354 * fStack_3374;
      uStack_3250._0_4_ = fStack_3350 * fStack_3370;
      uStack_3250._4_4_ = fStack_334c * fStack_336c;
      uStack_3248._0_4_ = fStack_3348 * fStack_3368;
      uStack_3248._4_4_ = uStack_3344;
      auVar19 = _local_3260;
      uStack_3248 = auVar19._24_8_;
      auVar176._16_8_ = uStack_3250;
      auVar176._0_16_ = _local_3260;
      auVar176._24_8_ = uStack_3248;
      auVar175._8_4_ = 0x42b0c0a5;
      auVar175._0_8_ = 0x42b0c0a542b0c0a5;
      auVar175._12_4_ = 0x42b0c0a5;
      auVar175._16_4_ = 0x42b0c0a5;
      auVar175._20_4_ = 0x42b0c0a5;
      auVar175._24_4_ = 0x42b0c0a5;
      auVar175._28_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx(auVar176,auVar175);
      auVar174._8_4_ = 0xc2b0c0a5;
      auVar174._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar174._12_4_ = 0xc2b0c0a5;
      auVar174._16_4_ = 0xc2b0c0a5;
      auVar174._20_4_ = 0xc2b0c0a5;
      auVar174._24_4_ = 0xc2b0c0a5;
      auVar174._28_4_ = 0xc2b0c0a5;
      auVar287 = vmaxps_avx(auVar19,auVar174);
      auVar184._8_4_ = 1.442695;
      auVar184._12_4_ = 1.442695;
      auVar184._0_4_ = 1.442695;
      auVar184._4_4_ = 1.442695;
      auVar184._16_4_ = 1.442695;
      auVar184._20_4_ = 1.442695;
      auVar184._24_4_ = 1.442695;
      auVar184._28_4_ = 1.442695;
      auVar183._8_4_ = 0.5;
      auVar183._12_4_ = 0.5;
      auVar183._0_4_ = 0.5;
      auVar183._4_4_ = 0.5;
      auVar183._16_4_ = 0.5;
      auVar183._20_4_ = 0.5;
      auVar183._24_4_ = 0.5;
      auVar183._28_4_ = 0.5;
      auVar20 = vfmadd213ps_fma(auVar184,auVar287,auVar183);
      auVar24 = vroundps_avx(ZEXT1632(auVar20),1);
      auVar19 = vcmpps_avx(ZEXT1632(auVar20),auVar24,1);
      auVar182._8_8_ = 0x3f8000003f800000;
      auVar182._0_8_ = 0x3f8000003f800000;
      auVar182._16_8_ = 0x3f8000003f800000;
      auVar182._24_8_ = 0x3f8000003f800000;
      auVar19 = vpand_avx2(auVar19,auVar182);
      auVar19 = vsubps_avx(auVar24,auVar19);
      auVar200._8_4_ = 0.6933594;
      auVar200._12_4_ = 0.6933594;
      auVar200._0_4_ = 0.6933594;
      auVar200._4_4_ = 0.6933594;
      auVar200._16_4_ = 0.6933594;
      auVar200._20_4_ = 0.6933594;
      auVar200._24_4_ = 0.6933594;
      auVar200._28_4_ = 0.6933594;
      auVar20 = vfnmadd213ps_fma(auVar200,auVar19,auVar287);
      auVar201._8_4_ = -0.00021219444;
      auVar201._12_4_ = -0.00021219444;
      auVar201._0_4_ = -0.00021219444;
      auVar201._4_4_ = -0.00021219444;
      auVar201._16_4_ = -0.00021219444;
      auVar201._20_4_ = -0.00021219444;
      auVar201._24_4_ = -0.00021219444;
      auVar201._28_4_ = -0.00021219444;
      auVar20 = vfnmadd213ps_fma(auVar201,auVar19,ZEXT1632(auVar20));
      auVar287 = ZEXT1632(auVar20);
      local_3160 = auVar20._0_4_;
      fStack_315c = auVar20._4_4_;
      fStack_3158 = auVar20._8_4_;
      fStack_3154 = auVar20._12_4_;
      _local_3280 = ZEXT1632(CONCAT412(fStack_3154 * fStack_3154,
                                       CONCAT48(fStack_3158 * fStack_3158,
                                                CONCAT44(fStack_315c * fStack_315c,
                                                         local_3160 * local_3160))));
      uStack_3318._0_4_ = 0x39506967;
      local_3320 = (undefined1  [8])0x3950696739506967;
      uStack_3318._4_4_ = 0x39506967;
      uStack_3310._0_4_ = 0x39506967;
      uStack_3310._4_4_ = 0x39506967;
      uStack_3308._0_4_ = 0x39506967;
      uStack_3308._4_4_ = 0x39506967;
      auVar185._8_4_ = 0.0013981999;
      auVar185._12_4_ = 0.0013981999;
      auVar185._0_4_ = 0.0013981999;
      auVar185._4_4_ = 0.0013981999;
      auVar185._16_4_ = 0.0013981999;
      auVar185._20_4_ = 0.0013981999;
      auVar185._24_4_ = 0.0013981999;
      auVar185._28_4_ = 0.0013981999;
      auVar20 = vfmadd213ps_fma(auVar287,_local_3320,auVar185);
      auVar186._8_4_ = 0.008333452;
      auVar186._12_4_ = 0.008333452;
      auVar186._0_4_ = 0.008333452;
      auVar186._4_4_ = 0.008333452;
      auVar186._16_4_ = 0.008333452;
      auVar186._20_4_ = 0.008333452;
      auVar186._24_4_ = 0.008333452;
      auVar186._28_4_ = 0.008333452;
      auVar20 = vfmadd213ps_fma(auVar287,ZEXT1632(auVar20),auVar186);
      auVar187._8_4_ = 0.041665796;
      auVar187._12_4_ = 0.041665796;
      auVar187._0_4_ = 0.041665796;
      auVar187._4_4_ = 0.041665796;
      auVar187._16_4_ = 0.041665796;
      auVar187._20_4_ = 0.041665796;
      auVar187._24_4_ = 0.041665796;
      auVar187._28_4_ = 0.041665796;
      auVar20 = vfmadd213ps_fma(auVar287,ZEXT1632(auVar20),auVar187);
      auVar188._8_4_ = 0.16666666;
      auVar188._12_4_ = 0.16666666;
      auVar188._0_4_ = 0.16666666;
      auVar188._4_4_ = 0.16666666;
      auVar188._16_4_ = 0.16666666;
      auVar188._20_4_ = 0.16666666;
      auVar188._24_4_ = 0.16666666;
      auVar188._28_4_ = 0.16666666;
      auVar20 = vfmadd213ps_fma(auVar287,ZEXT1632(auVar20),auVar188);
      auVar189._8_4_ = 0.5;
      auVar189._12_4_ = 0.5;
      auVar189._0_4_ = 0.5;
      auVar189._4_4_ = 0.5;
      auVar189._16_4_ = 0.5;
      auVar189._20_4_ = 0.5;
      auVar189._24_4_ = 0.5;
      auVar189._28_4_ = 0.5;
      auVar20 = vfmadd213ps_fma(auVar287,ZEXT1632(auVar20),auVar189);
      auVar20 = vfmadd213ps_fma(_local_3280,ZEXT1632(auVar20),auVar287);
      local_3220 = auVar20._0_4_;
      fStack_321c = auVar20._4_4_;
      fStack_3218 = auVar20._8_4_;
      fStack_3214 = auVar20._12_4_;
      local_2a20 = auVar19._0_4_;
      fStack_2a1c = auVar19._4_4_;
      fStack_2a18 = auVar19._8_4_;
      fStack_2a14 = auVar19._12_4_;
      fStack_2a10 = auVar19._16_4_;
      fStack_2a0c = auVar19._20_4_;
      fStack_2a08 = auVar19._24_4_;
      fStack_2a04 = auVar19._28_4_;
      local_32c0._4_4_ = (int)fStack_2a1c;
      local_32c0._0_4_ = (int)local_2a20;
      local_32c0._8_4_ = (int)fStack_2a18;
      local_32c0._12_4_ = (int)fStack_2a14;
      uStack_32b0._0_4_ = (int)fStack_2a10;
      uStack_32b0._4_4_ = (int)fStack_2a0c;
      uStack_32a8._0_4_ = (int)fStack_2a08;
      uStack_32a8._4_4_ = (int)fStack_2a04;
      auVar19 = _local_32c0;
      uStack_32a8 = auVar19._24_8_;
      auVar204._16_8_ = uStack_32b0;
      auVar204._0_16_ = local_32c0;
      auVar204._24_8_ = uStack_32a8;
      auVar203._8_8_ = 0x7f0000007f;
      auVar203._0_8_ = 0x7f0000007f;
      auVar203._16_8_ = 0x7f0000007f;
      auVar203._24_8_ = 0x7f0000007f;
      auVar19 = vpaddd_avx2(auVar204,auVar203);
      auVar19 = vpslld_avx2(auVar19,ZEXT416(0x17));
      local_31c0 = auVar19._0_4_;
      fStack_31bc = auVar19._4_4_;
      fStack_31b8 = auVar19._8_4_;
      fStack_31b4 = auVar19._12_4_;
      fStack_31b0 = auVar19._16_4_;
      fStack_31ac = auVar19._20_4_;
      fStack_31a8 = auVar19._24_4_;
      local_3320._4_4_ = (fStack_321c + 1.0) * fStack_31bc;
      local_3320._0_4_ = (local_3220 + 1.0) * local_31c0;
      uStack_3318._0_4_ = (fStack_3218 + 1.0) * fStack_31b8;
      uStack_3318._4_4_ = (fStack_3214 + 1.0) * fStack_31b4;
      uStack_3310._0_4_ = fStack_31b0 * 1.0;
      uStack_3310._4_4_ = fStack_31ac * 1.0;
      auVar282 = _local_3320;
      uStack_3308._0_4_ = fStack_31a8 * 1.0;
      uStack_3308._4_4_ = 0x3f800000;
      auVar19 = _local_3320;
      uStack_3310 = auVar282._16_8_;
      uStack_3308 = auVar19._24_8_;
      *local_a5f0 = local_3320;
      local_a5f0[1] = uStack_3318;
      local_a5f0[2] = uStack_3310;
      local_a5f0[3] = uStack_3308;
      local_a5e0 = (undefined1 (*) [64])(*local_a5e0 + 0x20);
      local_a5e8 = local_a5e8 + 2;
      local_a5f0 = local_a5f0 + 4;
    }
    for (; local_a864 < in_ECX; local_a864 = local_a864 + 1) {
      uVar1 = *local_a5e8;
      auVar268._8_8_ = CONCAT44(uVar1,uVar1);
      auVar268._0_8_ = CONCAT44(uVar1,uVar1);
      auVar267._8_8_ = CONCAT44(uVar1,uVar1);
      auVar267._0_8_ = CONCAT44(uVar1,uVar1);
      auVar20 = vcmpps_avx(auVar268,ZEXT816(0),2);
      auVar23._8_4_ = 0x800000;
      auVar23._0_8_ = 0x80000000800000;
      auVar23._12_4_ = 0x800000;
      auVar21 = vmaxps_avx(auVar267,auVar23);
      auVar22 = vpsrld_avx(auVar21,ZEXT416(0x17));
      auVar242._8_4_ = 0x807fffff;
      auVar242._0_8_ = 0x807fffff807fffff;
      auVar242._12_4_ = 0x807fffff;
      auVar21 = vpand_avx(auVar21,auVar242);
      auVar264._8_4_ = 0x3f000000;
      auVar264._0_8_ = 0x3f0000003f000000;
      auVar264._12_4_ = 0x3f000000;
      auVar23 = vpor_avx(auVar21,auVar264);
      auVar265._8_8_ = 0x7f0000007f;
      auVar265._0_8_ = 0x7f0000007f;
      auVar21 = vpsubd_avx(auVar22,auVar265);
      auVar21 = vcvtdq2ps_avx(auVar21);
      local_8a0 = auVar21._0_4_;
      fStack_89c = auVar21._4_4_;
      fStack_898 = auVar21._8_4_;
      fStack_894 = auVar21._12_4_;
      local_940 = CONCAT44(fStack_89c + 1.0,local_8a0 + 1.0);
      uStack_938._0_4_ = fStack_898 + 1.0;
      uStack_938._4_4_ = fStack_894 + 1.0;
      auVar266._8_4_ = 0x3f3504f3;
      auVar266._0_8_ = 0x3f3504f33f3504f3;
      auVar266._12_4_ = 0x3f3504f3;
      auVar21 = vcmpps_avx(auVar23,auVar266,1);
      auVar22 = vpand_avx(auVar23,auVar21);
      auVar238._8_8_ = 0x3f8000003f800000;
      auVar238._0_8_ = 0x3f8000003f800000;
      auVar23 = vsubps_avx(auVar23,auVar238);
      auVar241._8_8_ = 0x3f8000003f800000;
      auVar241._0_8_ = 0x3f8000003f800000;
      auVar21 = vpand_avx(auVar241,auVar21);
      auVar237._8_8_ = uStack_938;
      auVar237._0_8_ = local_940;
      auVar21 = vsubps_avx(auVar237,auVar21);
      local_8c0 = auVar23._0_4_;
      fStack_8bc = auVar23._4_4_;
      fStack_8b8 = auVar23._8_4_;
      fStack_8b4 = auVar23._12_4_;
      local_8d0 = auVar22._0_4_;
      fStack_8cc = auVar22._4_4_;
      fStack_8c8 = auVar22._8_4_;
      fStack_8c4 = auVar22._12_4_;
      local_900._0_4_ = local_8c0 + local_8d0;
      local_900._4_4_ = fStack_8bc + fStack_8cc;
      fStack_8f8 = fStack_8b8 + fStack_8c8;
      fStack_8f4 = fStack_8b4 + fStack_8c4;
      fStack_978 = 0.070376836;
      local_980 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_974 = 0.070376836;
      auVar254._8_4_ = -0.1151461;
      auVar254._12_4_ = -0.1151461;
      auVar254._0_4_ = -0.1151461;
      auVar254._4_4_ = -0.1151461;
      auVar22 = vfmadd213ps_fma(_local_900,_local_980,auVar254);
      auVar255._8_4_ = 0.116769984;
      auVar255._12_4_ = 0.116769984;
      auVar255._0_4_ = 0.116769984;
      auVar255._4_4_ = 0.116769984;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar255);
      auVar256._8_4_ = -0.12420141;
      auVar256._12_4_ = -0.12420141;
      auVar256._0_4_ = -0.12420141;
      auVar256._4_4_ = -0.12420141;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar256);
      auVar257._8_4_ = 0.14249323;
      auVar257._12_4_ = 0.14249323;
      auVar257._0_4_ = 0.14249323;
      auVar257._4_4_ = 0.14249323;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar257);
      auVar258._8_4_ = -0.16668057;
      auVar258._12_4_ = -0.16668057;
      auVar258._0_4_ = -0.16668057;
      auVar258._4_4_ = -0.16668057;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar258);
      auVar259._8_4_ = 0.20000714;
      auVar259._12_4_ = 0.20000714;
      auVar259._0_4_ = 0.20000714;
      auVar259._4_4_ = 0.20000714;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar259);
      auVar260._8_4_ = -0.24999994;
      auVar260._12_4_ = -0.24999994;
      auVar260._0_4_ = -0.24999994;
      auVar260._4_4_ = -0.24999994;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar260);
      auVar261._8_4_ = 0.3333333;
      auVar261._12_4_ = 0.3333333;
      auVar261._0_4_ = 0.3333333;
      auVar261._4_4_ = 0.3333333;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar261);
      local_820 = auVar22._0_4_;
      fStack_81c = auVar22._4_4_;
      fStack_818 = auVar22._8_4_;
      fStack_814 = auVar22._12_4_;
      local_980._4_4_ =
           fStack_81c * (float)local_900._4_4_ * (float)local_900._4_4_ * (float)local_900._4_4_;
      local_980._0_4_ =
           local_820 * (float)local_900._0_4_ * (float)local_900._0_4_ * (float)local_900._0_4_;
      fStack_978 = fStack_818 * fStack_8f8 * fStack_8f8 * fStack_8f8;
      fStack_974 = fStack_814 * fStack_8f4 * fStack_8f4 * fStack_8f4;
      auVar262._8_4_ = -0.00021219444;
      auVar262._12_4_ = -0.00021219444;
      auVar262._0_4_ = -0.00021219444;
      auVar262._4_4_ = -0.00021219444;
      auVar22 = vfmadd213ps_fma(auVar262,auVar21,_local_980);
      auVar275._4_4_ = (float)local_900._4_4_ * (float)local_900._4_4_;
      auVar275._0_4_ = (float)local_900._0_4_ * (float)local_900._0_4_;
      auVar275._8_4_ = fStack_8f8 * fStack_8f8;
      auVar275._12_4_ = fStack_8f4 * fStack_8f4;
      auVar248._8_4_ = 0.5;
      auVar248._12_4_ = 0.5;
      auVar248._0_4_ = 0.5;
      auVar248._4_4_ = 0.5;
      auVar22 = vfnmadd213ps_fma(auVar248,auVar275,auVar22);
      local_8f0 = auVar22._0_4_;
      fStack_8ec = auVar22._4_4_;
      fStack_8e8 = auVar22._8_4_;
      fStack_8e4 = auVar22._12_4_;
      local_900._4_4_ = (float)local_900._4_4_ + fStack_8ec;
      local_900._0_4_ = (float)local_900._0_4_ + local_8f0;
      fStack_8f8 = fStack_8f8 + fStack_8e8;
      fStack_8f4 = fStack_8f4 + fStack_8e4;
      auVar263._8_4_ = 0.6933594;
      auVar263._12_4_ = 0.6933594;
      auVar263._0_4_ = 0.6933594;
      auVar263._4_4_ = 0.6933594;
      auVar21 = vfmadd213ps_fma(auVar263,auVar21,_local_900);
      auVar20 = vpor_avx(auVar21,auVar20);
      local_b10 = (float)*(undefined8 *)*local_a5e0;
      fStack_b0c = (float)((ulong)*(undefined8 *)*local_a5e0 >> 0x20);
      fStack_b08 = (float)*(undefined8 *)(*local_a5e0 + 8);
      fStack_b04 = (float)((ulong)*(undefined8 *)(*local_a5e0 + 8) >> 0x20);
      local_b20 = auVar20._0_4_;
      fStack_b1c = auVar20._4_4_;
      fStack_b18 = auVar20._8_4_;
      fStack_b14 = auVar20._12_4_;
      local_a90 = CONCAT44(fStack_b0c * fStack_b1c,local_b10 * local_b20);
      uStack_a88._0_4_ = fStack_b08 * fStack_b18;
      uStack_a88._4_4_ = fStack_b04 * fStack_b14;
      auVar22._8_8_ = uStack_a88;
      auVar22._0_8_ = local_a90;
      auVar20._8_4_ = 0x42b0c0a5;
      auVar20._0_8_ = 0x42b0c0a542b0c0a5;
      auVar20._12_4_ = 0x42b0c0a5;
      auVar20 = vminps_avx(auVar22,auVar20);
      auVar21._8_4_ = 0xc2b0c0a5;
      auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar21._12_4_ = 0xc2b0c0a5;
      auVar22 = vmaxps_avx(auVar20,auVar21);
      local_9d0 = auVar22._0_4_;
      fStack_9cc = auVar22._4_4_;
      fStack_9c8 = auVar22._8_4_;
      fStack_9c4 = auVar22._12_4_;
      fVar286 = local_9d0 * 1.442695 + 0.5;
      fVar288 = fStack_9cc * 1.442695 + 0.5;
      fVar289 = fStack_9c8 * 1.442695 + 0.5;
      fVar290 = fStack_9c4 * 1.442695 + 0.5;
      local_ab0 = CONCAT44(fVar288,fVar286);
      uStack_aa8._0_4_ = fVar289;
      uStack_aa8._4_4_ = fVar290;
      local_ac0 = CONCAT44((int)fVar288,(int)fVar286);
      uStack_ab8._0_4_ = (int)fVar289;
      uStack_ab8._4_4_ = (int)fVar290;
      auVar239._8_8_ = uStack_ab8;
      auVar239._0_8_ = local_ac0;
      auVar21 = vcvtdq2ps_avx(auVar239);
      auVar240._8_8_ = uStack_aa8;
      auVar240._0_8_ = local_ab0;
      auVar20 = vcmpps_avx(auVar240,auVar21,1);
      auVar243._8_8_ = 0x3f8000003f800000;
      auVar243._0_8_ = 0x3f8000003f800000;
      auVar20 = vpand_avx(auVar20,auVar243);
      auVar20 = vsubps_avx(auVar21,auVar20);
      auVar246._8_4_ = 0.6933594;
      auVar246._12_4_ = 0.6933594;
      auVar246._0_4_ = 0.6933594;
      auVar246._4_4_ = 0.6933594;
      auVar21 = vfnmadd213ps_fma(auVar246,auVar20,auVar22);
      auVar247._8_4_ = -0.00021219444;
      auVar247._12_4_ = -0.00021219444;
      auVar247._0_4_ = -0.00021219444;
      auVar247._4_4_ = -0.00021219444;
      auVar22 = vfnmadd213ps_fma(auVar247,auVar20,auVar21);
      local_9f0 = auVar22._0_4_;
      fStack_9ec = auVar22._4_4_;
      fStack_9e8 = auVar22._8_4_;
      fStack_9e4 = auVar22._12_4_;
      local_aa0._4_4_ = fStack_9ec * fStack_9ec;
      local_aa0._0_4_ = local_9f0 * local_9f0;
      fStack_a98 = fStack_9e8 * fStack_9e8;
      fStack_a94 = fStack_9e4 * fStack_9e4;
      uStack_ae8._0_4_ = 0x39506967;
      local_af0 = (undefined1  [8])0x3950696739506967;
      uStack_ae8._4_4_ = 0x39506967;
      auVar249._8_4_ = 0.0013981999;
      auVar249._12_4_ = 0.0013981999;
      auVar249._0_4_ = 0.0013981999;
      auVar249._4_4_ = 0.0013981999;
      auVar21 = vfmadd213ps_fma(auVar22,_local_af0,auVar249);
      auVar250._8_4_ = 0.008333452;
      auVar250._12_4_ = 0.008333452;
      auVar250._0_4_ = 0.008333452;
      auVar250._4_4_ = 0.008333452;
      auVar21 = vfmadd213ps_fma(auVar22,auVar21,auVar250);
      auVar251._8_4_ = 0.041665796;
      auVar251._12_4_ = 0.041665796;
      auVar251._0_4_ = 0.041665796;
      auVar251._4_4_ = 0.041665796;
      auVar21 = vfmadd213ps_fma(auVar22,auVar21,auVar251);
      auVar252._8_4_ = 0.16666666;
      auVar252._12_4_ = 0.16666666;
      auVar252._0_4_ = 0.16666666;
      auVar252._4_4_ = 0.16666666;
      auVar21 = vfmadd213ps_fma(auVar22,auVar21,auVar252);
      auVar253._8_4_ = 0.5;
      auVar253._12_4_ = 0.5;
      auVar253._0_4_ = 0.5;
      auVar253._4_4_ = 0.5;
      auVar21 = vfmadd213ps_fma(auVar22,auVar21,auVar253);
      auVar21 = vfmadd213ps_fma(_local_aa0,auVar21,auVar22);
      local_a70 = auVar21._0_4_;
      fStack_a6c = auVar21._4_4_;
      fStack_a68 = auVar21._8_4_;
      fStack_a64 = auVar21._12_4_;
      local_7b0 = auVar20._0_4_;
      fStack_7ac = auVar20._4_4_;
      fStack_7a8 = auVar20._8_4_;
      fStack_7a4 = auVar20._12_4_;
      local_ac0 = CONCAT44((int)fStack_7ac,(int)local_7b0);
      uStack_ab8._0_4_ = (int)fStack_7a8;
      uStack_ab8._4_4_ = (int)fStack_7a4;
      auVar245._8_8_ = uStack_ab8;
      auVar245._0_8_ = local_ac0;
      auVar244._8_8_ = 0x7f0000007f;
      auVar244._0_8_ = 0x7f0000007f;
      auVar20 = vpaddd_avx(auVar245,auVar244);
      auVar20 = vpslld_avx(auVar20,ZEXT416(0x17));
      local_a20 = auVar20._0_4_;
      fStack_a1c = auVar20._4_4_;
      fStack_a18 = auVar20._8_4_;
      fStack_a14 = auVar20._12_4_;
      local_af0._4_4_ = (fStack_a6c + 1.0) * fStack_a1c;
      local_af0._0_4_ = (local_a70 + 1.0) * local_a20;
      uStack_ae8._0_4_ = (fStack_a68 + 1.0) * fStack_a18;
      uStack_ae8._4_4_ = (fStack_a64 + 1.0) * fStack_a14;
      *local_a5f0 = local_af0;
      local_a5f0[1] = uStack_ae8;
      local_a5e0 = (undefined1 (*) [64])(*local_a5e0 + 0x10);
      local_a5e8 = local_a5e8 + 1;
      local_a5f0 = local_a5f0 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}